

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_14_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  ulong uVar1;
  undefined8 uVar2;
  __m128i x;
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  __m128i x_04;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined6 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined6 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined6 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined6 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  undefined6 uVar25;
  undefined8 uVar26;
  undefined4 uVar27;
  undefined6 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined4 uVar34;
  undefined6 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined4 uVar39;
  undefined6 uVar40;
  undefined8 uVar41;
  undefined4 uVar42;
  undefined6 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined4 uVar50;
  undefined6 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined4 uVar59;
  undefined6 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong *puVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 *in_RCX;
  ulong uVar99;
  undefined8 *in_RDX;
  longlong in_RSI;
  void *in_RDI;
  void *a;
  undefined8 *in_R8;
  byte bVar101;
  short sVar102;
  short sVar103;
  ushort uVar104;
  ushort uVar105;
  ushort uVar106;
  uint uVar107;
  byte bVar114;
  byte bVar118;
  ushort uVar119;
  byte bVar123;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  undefined8 extraout_XMM0_Qa_13;
  undefined8 extraout_XMM0_Qa_14;
  ulong uVar109;
  undefined8 extraout_XMM0_Qa_15;
  undefined8 extraout_XMM0_Qa_16;
  byte bVar113;
  byte bVar117;
  byte bVar122;
  byte bVar126;
  undefined8 extraout_XMM0_Qa_17;
  undefined8 extraout_XMM0_Qa_18;
  ushort uVar115;
  ushort uVar116;
  ushort uVar120;
  ushort uVar124;
  ushort uVar125;
  longlong extraout_XMM0_Qa_19;
  undefined8 extraout_XMM0_Qa_20;
  undefined8 extraout_XMM0_Qa_21;
  uint uVar121;
  byte bVar127;
  short sVar128;
  ushort uVar129;
  ushort uVar130;
  uint uVar131;
  byte bVar135;
  byte bVar139;
  ushort uVar140;
  byte bVar144;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  ulong uVar108;
  ulong uVar132;
  undefined1 auVar112 [16];
  ulong uVar133;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  byte bVar134;
  byte bVar138;
  byte bVar143;
  byte bVar148;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  ushort uVar136;
  ushort uVar137;
  ushort uVar141;
  ushort uVar145;
  ushort uVar146;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  short sVar147;
  uint uVar142;
  __m128i alVar149;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i q3p3;
  __m128i q4p4;
  __m128i q5p5;
  __m128i q6p6;
  __m128i sum_q;
  __m128i sum_lq;
  __m128i sum_lp;
  __m128i sum_p;
  __m128i sum_p_0;
  __m128i work0_1;
  __m128i work0_0;
  __m128i work0;
  __m128i flat2_q [6];
  __m128i flat2_p [6];
  __m128i flat_q [3];
  __m128i flat_p [3];
  __m128i sum_p3;
  __m128i sum_p6;
  __m128i four;
  __m128i eight;
  __m128i pq_16 [7];
  __m128i q0_16;
  __m128i q1_16;
  __m128i q2_16;
  __m128i q3_16;
  __m128i q4_16;
  __m128i q5_16;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i work;
  __m128i ff;
  __m128i fe;
  __m128i abs_p1p0;
  __m128i ps1ps0;
  __m128i qs1qs0;
  __m128i q1q0;
  __m128i p1p0;
  __m128i qs1ps1;
  __m128i qs0ps0;
  __m128i flat_pq [3];
  __m128i flat2_pq [6];
  __m128i flat2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i one;
  __m128i zero;
  __m128i ff_1;
  __m128i t80;
  __m128i t3t4;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_1;
  __m128i filter2filter1;
  __m128i filter;
  int in_stack_ffffffffffffde38;
  int in_stack_ffffffffffffde3c;
  undefined4 in_stack_ffffffffffffde40;
  undefined2 in_stack_ffffffffffffde44;
  undefined2 in_stack_ffffffffffffde46;
  longlong in_stack_ffffffffffffde48;
  undefined1 local_20f8 [16];
  undefined1 local_20e8 [16];
  undefined1 local_20d8 [16];
  undefined4 local_20c8;
  undefined4 uStack_20c4;
  undefined4 uStack_20c0;
  undefined4 uStack_20bc;
  undefined4 local_20b8;
  undefined4 uStack_20b4;
  undefined4 uStack_20b0;
  undefined4 uStack_20ac;
  undefined4 local_20a8;
  undefined4 uStack_20a4;
  undefined4 uStack_20a0;
  undefined4 uStack_209c;
  undefined4 local_2098;
  undefined4 uStack_2094;
  undefined4 uStack_2090;
  undefined4 uStack_208c;
  undefined4 local_2088;
  undefined4 uStack_2084;
  undefined4 uStack_2080;
  undefined4 uStack_207c;
  undefined4 local_2078;
  undefined4 uStack_2074;
  undefined4 uStack_2070;
  undefined4 uStack_206c;
  undefined4 local_2068;
  undefined4 uStack_2064;
  undefined4 uStack_2060;
  undefined4 uStack_205c;
  int local_2034;
  void *local_2030;
  undefined4 local_2028;
  undefined4 uStack_2024;
  undefined4 local_2018;
  undefined4 uStack_2014;
  undefined4 local_2008;
  undefined4 uStack_2004;
  undefined4 local_1ff8;
  undefined4 uStack_1ff4;
  undefined4 local_1fe8;
  undefined4 uStack_1fe4;
  undefined4 local_1fd8;
  undefined4 uStack_1fd4;
  undefined4 local_1fc8;
  undefined4 uStack_1fc4;
  undefined4 local_1fb8;
  undefined4 uStack_1fb4;
  undefined4 local_1fa8;
  undefined4 uStack_1fa4;
  undefined4 local_1f98;
  undefined4 uStack_1f94;
  undefined4 local_1f88;
  undefined4 uStack_1f84;
  undefined4 local_1f78;
  undefined4 uStack_1f74;
  undefined4 local_1f68;
  undefined4 uStack_1f64;
  undefined4 local_1f58;
  undefined4 uStack_1f54;
  undefined8 local_1f28;
  undefined8 uStack_1f20;
  undefined8 local_1f18;
  undefined8 uStack_1f10;
  short local_1f08;
  short sStack_1f06;
  short sStack_1f04;
  short sStack_1f02;
  short sStack_1f00;
  short sStack_1efe;
  short sStack_1efc;
  short sStack_1efa;
  short local_1ef8;
  short sStack_1ef6;
  short sStack_1ef4;
  short sStack_1ef2;
  short sStack_1ef0;
  short sStack_1eee;
  short sStack_1eec;
  short sStack_1eea;
  short local_1ee8;
  short sStack_1ee6;
  short sStack_1ee4;
  short sStack_1ee2;
  short sStack_1ee0;
  short sStack_1ede;
  short sStack_1edc;
  short sStack_1eda;
  short local_1ed8;
  short sStack_1ed6;
  short sStack_1ed4;
  short sStack_1ed2;
  short sStack_1ed0;
  short sStack_1ece;
  short sStack_1ecc;
  short sStack_1eca;
  short local_1ec8;
  short sStack_1ec6;
  short sStack_1ec4;
  short sStack_1ec2;
  short sStack_1ec0;
  short sStack_1ebe;
  short sStack_1ebc;
  short sStack_1eba;
  short local_1eb8;
  short sStack_1eb6;
  short sStack_1eb4;
  short sStack_1eb2;
  short sStack_1eb0;
  short sStack_1eae;
  short sStack_1eac;
  short sStack_1eaa;
  ushort local_1ea8;
  ushort uStack_1ea6;
  ushort uStack_1ea4;
  ushort uStack_1ea2;
  short sStack_1ea0;
  short sStack_1e9e;
  short sStack_1e9c;
  short sStack_1e9a;
  ushort local_1e98;
  ushort uStack_1e96;
  ushort uStack_1e94;
  ushort uStack_1e92;
  short sStack_1e90;
  short sStack_1e8e;
  short sStack_1e8c;
  short sStack_1e8a;
  ushort local_1e88;
  ushort uStack_1e86;
  ushort uStack_1e84;
  ushort uStack_1e82;
  short sStack_1e80;
  short sStack_1e7e;
  short sStack_1e7c;
  short sStack_1e7a;
  ushort local_1e78;
  ushort uStack_1e76;
  ushort uStack_1e74;
  ushort uStack_1e72;
  short sStack_1e70;
  short sStack_1e6e;
  short sStack_1e6c;
  short sStack_1e6a;
  ushort local_1e68;
  ushort uStack_1e66;
  ushort uStack_1e64;
  ushort uStack_1e62;
  short sStack_1e60;
  short sStack_1e5e;
  short sStack_1e5c;
  short sStack_1e5a;
  ushort local_1e58;
  ushort uStack_1e56;
  ushort uStack_1e54;
  ushort uStack_1e52;
  short sStack_1e50;
  short sStack_1e4e;
  short sStack_1e4c;
  short sStack_1e4a;
  ushort local_1e48;
  ushort uStack_1e46;
  ushort uStack_1e44;
  ushort uStack_1e42;
  short sStack_1e40;
  short sStack_1e3e;
  short sStack_1e3c;
  short sStack_1e3a;
  ushort local_1e38;
  ushort uStack_1e36;
  ushort uStack_1e34;
  ushort uStack_1e32;
  short sStack_1e30;
  short sStack_1e2e;
  short sStack_1e2c;
  short sStack_1e2a;
  ushort local_1e28;
  ushort uStack_1e26;
  ushort uStack_1e24;
  ushort uStack_1e22;
  short sStack_1e20;
  short sStack_1e1e;
  short sStack_1e1c;
  short sStack_1e1a;
  ushort local_1e18;
  ushort uStack_1e16;
  ushort uStack_1e14;
  ushort uStack_1e12;
  short sStack_1e10;
  short sStack_1e0e;
  short sStack_1e0c;
  short sStack_1e0a;
  ushort local_1e08;
  ushort uStack_1e06;
  ushort uStack_1e04;
  ushort uStack_1e02;
  short sStack_1e00;
  short sStack_1dfe;
  short sStack_1dfc;
  short sStack_1dfa;
  ushort local_1df8;
  ushort uStack_1df6;
  ushort uStack_1df4;
  ushort uStack_1df2;
  short sStack_1df0;
  short sStack_1dee;
  short sStack_1dec;
  short sStack_1dea;
  ushort local_1de8;
  ushort uStack_1de6;
  ushort uStack_1de4;
  ushort uStack_1de2;
  short sStack_1de0;
  short sStack_1dde;
  short sStack_1ddc;
  short sStack_1dda;
  ushort local_1dd8;
  ushort uStack_1dd6;
  ushort uStack_1dd4;
  ushort uStack_1dd2;
  short sStack_1dd0;
  short sStack_1dce;
  short sStack_1dcc;
  short sStack_1dca;
  ushort local_1dc8;
  ushort uStack_1dc6;
  ushort uStack_1dc4;
  ushort uStack_1dc2;
  short sStack_1dc0;
  short sStack_1dbe;
  short sStack_1dbc;
  short sStack_1dba;
  ushort local_1db8;
  ushort uStack_1db6;
  ushort uStack_1db4;
  ushort uStack_1db2;
  short sStack_1db0;
  short sStack_1dae;
  short sStack_1dac;
  short sStack_1daa;
  ushort local_1da8;
  ushort uStack_1da6;
  ushort uStack_1da4;
  ushort uStack_1da2;
  short sStack_1da0;
  short sStack_1d9e;
  short sStack_1d9c;
  short sStack_1d9a;
  ushort local_1d98;
  ushort uStack_1d96;
  ushort uStack_1d94;
  ushort uStack_1d92;
  short sStack_1d90;
  short sStack_1d8e;
  short sStack_1d8c;
  short sStack_1d8a;
  short local_1d88;
  short sStack_1d86;
  short sStack_1d84;
  short sStack_1d82;
  short sStack_1d80;
  short sStack_1d7e;
  short sStack_1d7c;
  short sStack_1d7a;
  short local_1d78;
  short sStack_1d76;
  short sStack_1d74;
  short sStack_1d72;
  short sStack_1d70;
  short sStack_1d6e;
  short sStack_1d6c;
  short sStack_1d6a;
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined1 local_1d48;
  char cStack_1d47;
  undefined1 uStack_1d46;
  char cStack_1d45;
  undefined1 uStack_1d44;
  char cStack_1d43;
  undefined1 uStack_1d42;
  char cStack_1d41;
  undefined1 uStack_1d40;
  char cStack_1d3f;
  undefined1 uStack_1d3e;
  char cStack_1d3d;
  undefined1 uStack_1d3c;
  char cStack_1d3b;
  undefined1 uStack_1d3a;
  char cStack_1d39;
  undefined1 local_1d38;
  char cStack_1d37;
  undefined1 uStack_1d36;
  char cStack_1d35;
  undefined1 uStack_1d34;
  char cStack_1d33;
  undefined1 uStack_1d32;
  char cStack_1d31;
  undefined1 uStack_1d30;
  char cStack_1d2f;
  undefined1 uStack_1d2e;
  char cStack_1d2d;
  undefined1 uStack_1d2c;
  char cStack_1d2b;
  undefined1 uStack_1d2a;
  char cStack_1d29;
  undefined1 local_1d28;
  char cStack_1d27;
  undefined1 uStack_1d26;
  char cStack_1d25;
  undefined1 uStack_1d24;
  char cStack_1d23;
  undefined1 uStack_1d22;
  char cStack_1d21;
  undefined1 uStack_1d20;
  char cStack_1d1f;
  undefined1 uStack_1d1e;
  char cStack_1d1d;
  undefined1 uStack_1d1c;
  char cStack_1d1b;
  undefined1 uStack_1d1a;
  char cStack_1d19;
  undefined1 local_1d18;
  char cStack_1d17;
  undefined1 uStack_1d16;
  char cStack_1d15;
  undefined1 uStack_1d14;
  char cStack_1d13;
  undefined1 uStack_1d12;
  char cStack_1d11;
  undefined1 uStack_1d10;
  char cStack_1d0f;
  undefined1 uStack_1d0e;
  char cStack_1d0d;
  undefined1 uStack_1d0c;
  char cStack_1d0b;
  undefined1 uStack_1d0a;
  char cStack_1d09;
  undefined1 local_1d08;
  char cStack_1d07;
  undefined1 uStack_1d06;
  char cStack_1d05;
  undefined1 uStack_1d04;
  char cStack_1d03;
  undefined1 uStack_1d02;
  char cStack_1d01;
  undefined1 uStack_1d00;
  char cStack_1cff;
  undefined1 uStack_1cfe;
  char cStack_1cfd;
  undefined1 uStack_1cfc;
  char cStack_1cfb;
  undefined1 uStack_1cfa;
  char cStack_1cf9;
  undefined1 local_1cf8;
  char cStack_1cf7;
  undefined1 uStack_1cf6;
  char cStack_1cf5;
  undefined1 uStack_1cf4;
  char cStack_1cf3;
  undefined1 uStack_1cf2;
  char cStack_1cf1;
  undefined1 uStack_1cf0;
  char cStack_1cef;
  undefined1 uStack_1cee;
  char cStack_1ced;
  undefined1 uStack_1cec;
  char cStack_1ceb;
  undefined1 uStack_1cea;
  char cStack_1ce9;
  undefined1 local_1ce8;
  char cStack_1ce7;
  undefined1 uStack_1ce6;
  char cStack_1ce5;
  undefined1 uStack_1ce4;
  char cStack_1ce3;
  undefined1 uStack_1ce2;
  char cStack_1ce1;
  undefined1 uStack_1ce0;
  char cStack_1cdf;
  undefined1 uStack_1cde;
  char cStack_1cdd;
  undefined1 uStack_1cdc;
  char cStack_1cdb;
  undefined1 uStack_1cda;
  char cStack_1cd9;
  undefined8 local_1cd8;
  undefined8 uStack_1cd0;
  undefined8 local_1cc8;
  undefined8 uStack_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined1 local_1c78 [16];
  undefined1 local_1c68 [16];
  undefined1 local_1c58 [16];
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined1 local_1c38;
  undefined1 uStack_1c37;
  undefined1 uStack_1c36;
  undefined1 uStack_1c35;
  undefined1 uStack_1c34;
  undefined1 uStack_1c33;
  undefined1 uStack_1c32;
  undefined1 uStack_1c31;
  undefined1 uStack_1c30;
  undefined1 uStack_1c2f;
  undefined1 uStack_1c2e;
  undefined1 uStack_1c2d;
  undefined1 uStack_1c2c;
  undefined1 uStack_1c2b;
  undefined1 uStack_1c2a;
  undefined1 uStack_1c29;
  ulong local_1c28;
  ulong uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined1 local_1c08 [16];
  undefined1 local_1bf8 [16];
  ulong local_1be8;
  ulong uStack_1be0;
  undefined4 local_1bd8;
  undefined4 uStack_1bd4;
  undefined4 uStack_1bd0;
  undefined4 uStack_1bcc;
  ulong local_1bc8;
  ulong uStack_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  undefined8 local_1b48;
  undefined8 uStack_1b40;
  undefined8 local_1b38;
  undefined8 uStack_1b30;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  undefined1 local_1b18 [16];
  undefined1 local_1b08 [16];
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined1 local_1ae8 [16];
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined1 (*local_1ab8) [16];
  undefined1 (*local_1ab0) [16];
  undefined1 (*local_1aa8) [16];
  ulong *local_1aa0;
  ulong *local_1a98;
  ulong *local_1a90;
  ulong *local_1a88;
  ulong *local_1a80;
  ulong *local_1a78;
  undefined8 *local_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  ulong local_1a58;
  ulong uStack_1a50;
  undefined8 local_1a48;
  ulong uStack_1a40;
  ulong local_1a38;
  ulong uStack_1a30;
  undefined8 local_1a28;
  ulong uStack_1a20;
  undefined8 local_1a18;
  ulong uStack_1a10;
  undefined8 local_1a08;
  ulong uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  ulong local_19d8;
  ulong uStack_19d0;
  undefined8 local_19c8;
  ulong uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  ulong uStack_1960;
  undefined8 local_1958;
  undefined8 uStack_1950;
  undefined8 local_1948;
  ulong uStack_1940;
  undefined8 local_1938;
  undefined8 uStack_1930;
  undefined8 local_1928;
  ulong uStack_1920;
  undefined8 local_1918;
  undefined8 uStack_1910;
  undefined8 local_1908;
  ulong uStack_1900;
  undefined8 local_18f8;
  undefined8 uStack_18f0;
  undefined8 local_18e8;
  ulong uStack_18e0;
  undefined8 local_18d8;
  undefined8 uStack_18d0;
  undefined8 local_18c8;
  ulong uStack_18c0;
  undefined8 local_18b8;
  undefined8 uStack_18b0;
  undefined8 local_18a8;
  undefined8 uStack_18a0;
  undefined8 local_1898;
  undefined8 uStack_1890;
  undefined8 local_1888;
  undefined8 uStack_1880;
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined8 local_1868;
  undefined8 uStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  ulong local_1798;
  undefined8 uStack_1790;
  ulong local_1788;
  undefined8 uStack_1780;
  undefined1 local_176a;
  undefined1 local_1769;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  ulong uStack_1710;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  undefined8 local_16d8;
  undefined8 uStack_16d0;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  undefined8 local_16b8;
  undefined8 uStack_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  ulong local_1688;
  ulong uStack_1680;
  ulong local_1678;
  ulong uStack_1670;
  undefined1 local_1668 [16];
  undefined1 local_1658 [16];
  undefined8 local_1648;
  undefined8 uStack_1640;
  byte local_1638;
  byte bStack_1637;
  byte bStack_1636;
  byte bStack_1635;
  byte bStack_1634;
  byte bStack_1633;
  byte bStack_1632;
  byte bStack_1631;
  byte bStack_1630;
  byte bStack_162f;
  byte bStack_162e;
  byte bStack_162d;
  byte bStack_162c;
  byte bStack_162b;
  byte bStack_162a;
  byte bStack_1629;
  byte local_1628;
  byte bStack_1627;
  byte bStack_1626;
  byte bStack_1625;
  byte bStack_1624;
  byte bStack_1623;
  byte bStack_1622;
  byte bStack_1621;
  byte bStack_1620;
  byte bStack_161f;
  byte bStack_161e;
  byte bStack_161d;
  byte bStack_161c;
  byte bStack_161b;
  byte bStack_161a;
  byte bStack_1619;
  byte local_1618;
  byte bStack_1617;
  byte bStack_1616;
  byte bStack_1615;
  byte bStack_1614;
  byte bStack_1613;
  byte bStack_1612;
  byte bStack_1611;
  byte bStack_1610;
  byte bStack_160f;
  byte bStack_160e;
  byte bStack_160d;
  byte bStack_160c;
  byte bStack_160b;
  byte bStack_160a;
  byte bStack_1609;
  undefined1 local_1608 [16];
  undefined1 local_15f8 [16];
  undefined8 local_15e8;
  undefined8 uStack_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  byte local_15c8;
  byte bStack_15c7;
  byte bStack_15c6;
  byte bStack_15c5;
  byte bStack_15c4;
  byte bStack_15c3;
  byte bStack_15c2;
  byte bStack_15c1;
  byte bStack_15c0;
  byte bStack_15bf;
  byte bStack_15be;
  byte bStack_15bd;
  byte bStack_15bc;
  byte bStack_15bb;
  byte bStack_15ba;
  byte bStack_15b9;
  byte local_15b8;
  byte bStack_15b7;
  byte bStack_15b6;
  byte bStack_15b5;
  byte bStack_15b4;
  byte bStack_15b3;
  byte bStack_15b2;
  byte bStack_15b1;
  byte bStack_15b0;
  byte bStack_15af;
  byte bStack_15ae;
  byte bStack_15ad;
  byte bStack_15ac;
  byte bStack_15ab;
  byte bStack_15aa;
  byte bStack_15a9;
  undefined1 local_15a8 [16];
  undefined1 local_1598 [16];
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 local_1578;
  undefined8 uStack_1570;
  byte local_1568;
  byte bStack_1567;
  byte bStack_1566;
  byte bStack_1565;
  byte bStack_1564;
  byte bStack_1563;
  byte bStack_1562;
  byte bStack_1561;
  byte bStack_1560;
  byte bStack_155f;
  byte bStack_155e;
  byte bStack_155d;
  byte bStack_155c;
  byte bStack_155b;
  byte bStack_155a;
  byte bStack_1559;
  byte local_1558;
  byte bStack_1557;
  byte bStack_1556;
  byte bStack_1555;
  byte bStack_1554;
  byte bStack_1553;
  byte bStack_1552;
  byte bStack_1551;
  byte bStack_1550;
  byte bStack_154f;
  byte bStack_154e;
  byte bStack_154d;
  byte bStack_154c;
  byte bStack_154b;
  byte bStack_154a;
  byte bStack_1549;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined8 local_1528;
  undefined8 uStack_1520;
  undefined8 local_1518;
  undefined8 uStack_1510;
  undefined8 local_1508;
  ulong uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined4 local_14bc;
  undefined8 local_14b8;
  undefined8 uStack_14b0;
  undefined4 local_149c;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined4 local_147c;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined4 local_145c;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined4 local_143c;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined4 local_141c;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined4 local_13fc;
  undefined8 local_13f8;
  undefined8 uStack_13f0;
  undefined4 local_13dc;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined4 local_13bc;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined4 local_139c;
  undefined8 local_1398;
  undefined8 uStack_1390;
  ulong local_1388;
  ulong uStack_1380;
  ulong local_1378;
  ulong uStack_1370;
  ulong local_1368;
  ulong uStack_1360;
  ulong local_1358;
  ulong uStack_1350;
  ulong local_1348;
  ulong uStack_1340;
  ulong local_1338;
  ulong uStack_1330;
  ulong local_1328;
  ulong uStack_1320;
  ulong local_1318;
  ulong uStack_1310;
  ulong local_1308;
  ulong uStack_1300;
  ulong local_12f8;
  ulong uStack_12f0;
  ulong local_12e8;
  ulong uStack_12e0;
  ulong local_12d8;
  ulong uStack_12d0;
  ulong local_12c8;
  ulong uStack_12c0;
  ulong local_12b8;
  ulong uStack_12b0;
  ulong local_12a8;
  ulong uStack_12a0;
  ulong local_1298;
  ulong uStack_1290;
  ulong local_1288;
  ulong uStack_1280;
  ulong local_1278;
  ulong uStack_1270;
  ulong local_1268;
  ulong uStack_1260;
  ulong local_1258;
  ulong uStack_1250;
  ulong local_1248;
  ulong uStack_1240;
  ulong local_1238;
  ulong uStack_1230;
  ulong local_1228;
  ulong uStack_1220;
  ulong local_1218;
  ulong uStack_1210;
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined1 local_1198 [16];
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined8 local_1178;
  undefined8 uStack_1170;
  ulong local_1168;
  ulong uStack_1160;
  char local_1158;
  char cStack_1157;
  char cStack_1156;
  char cStack_1155;
  char cStack_1154;
  char cStack_1153;
  char cStack_1152;
  char cStack_1151;
  char cStack_1150;
  char cStack_114f;
  char cStack_114e;
  char cStack_114d;
  char cStack_114c;
  char cStack_114b;
  char cStack_114a;
  char cStack_1149;
  ulong local_1148;
  ulong uStack_1140;
  char local_1138;
  char cStack_1137;
  char cStack_1136;
  char cStack_1135;
  char cStack_1134;
  char cStack_1133;
  char cStack_1132;
  char cStack_1131;
  char cStack_1130;
  char cStack_112f;
  char cStack_112e;
  char cStack_112d;
  char cStack_112c;
  char cStack_112b;
  char cStack_112a;
  char cStack_1129;
  char local_1128;
  char cStack_1127;
  char cStack_1126;
  char cStack_1125;
  char cStack_1124;
  char cStack_1123;
  char cStack_1122;
  char cStack_1121;
  char cStack_1120;
  char cStack_111f;
  char cStack_111e;
  char cStack_111d;
  char cStack_111c;
  char cStack_111b;
  char cStack_111a;
  byte bStack_1119;
  char local_1118;
  char cStack_1117;
  char cStack_1116;
  char cStack_1115;
  char cStack_1114;
  char cStack_1113;
  char cStack_1112;
  char cStack_1111;
  char cStack_1110;
  char cStack_110f;
  char cStack_110e;
  char cStack_110d;
  char cStack_110c;
  char cStack_110b;
  char cStack_110a;
  byte bStack_1109;
  ulong local_1108;
  ulong uStack_1100;
  ulong local_10f8;
  ulong uStack_10f0;
  ulong local_10e8;
  ulong uStack_10e0;
  ulong local_10d8;
  ulong uStack_10d0;
  ulong local_10c8;
  ulong uStack_10c0;
  ulong local_10b8;
  ulong uStack_10b0;
  ulong local_10a8;
  ulong uStack_10a0;
  ulong local_1098;
  ulong uStack_1090;
  ulong local_1088;
  ulong uStack_1080;
  ulong local_1078;
  ulong uStack_1070;
  ulong local_1068;
  ulong uStack_1060;
  ulong local_1058;
  ulong uStack_1050;
  ulong local_1048;
  ulong uStack_1040;
  ulong local_1038;
  ulong uStack_1030;
  ulong local_1028;
  ulong uStack_1020;
  ulong local_1018;
  ulong uStack_1010;
  ulong local_1008;
  ulong uStack_1000;
  ulong local_ff8;
  ulong uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  ulong local_fc8;
  ulong uStack_fc0;
  ulong local_fb8;
  ulong uStack_fb0;
  ulong local_fa8;
  ulong uStack_fa0;
  ulong local_f98;
  ulong uStack_f90;
  ulong local_f88;
  ulong uStack_f80;
  ulong local_f78;
  ulong uStack_f70;
  ulong local_f68;
  ulong uStack_f60;
  ulong local_f58;
  ulong uStack_f50;
  ulong local_f48;
  ulong uStack_f40;
  ulong local_f38;
  ulong uStack_f30;
  ulong local_f28;
  ulong uStack_f20;
  ulong local_f18;
  ulong uStack_f10;
  ulong local_f08;
  ulong uStack_f00;
  ulong local_ef8;
  ulong uStack_ef0;
  ulong local_ee8;
  ulong uStack_ee0;
  ulong local_ed8;
  ulong uStack_ed0;
  undefined2 local_ebc;
  undefined2 local_eba;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  short local_e78;
  short sStack_e76;
  short sStack_e74;
  short sStack_e72;
  short sStack_e70;
  short sStack_e6e;
  short sStack_e6c;
  short sStack_e6a;
  undefined8 local_e68;
  undefined8 uStack_e60;
  short local_e58;
  short sStack_e56;
  short sStack_e54;
  short sStack_e52;
  short sStack_e50;
  short sStack_e4e;
  short sStack_e4c;
  short sStack_e4a;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  short local_db8;
  short sStack_db6;
  short sStack_db4;
  short sStack_db2;
  short sStack_db0;
  short sStack_dae;
  short sStack_dac;
  short sStack_daa;
  undefined8 local_da8;
  undefined8 uStack_da0;
  short local_d98;
  short sStack_d96;
  short sStack_d94;
  short sStack_d92;
  short sStack_d90;
  short sStack_d8e;
  short sStack_d8c;
  short sStack_d8a;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  short local_cf8;
  short sStack_cf6;
  short sStack_cf4;
  short sStack_cf2;
  short sStack_cf0;
  short sStack_cee;
  short sStack_cec;
  short sStack_cea;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  short local_cd8;
  short sStack_cd6;
  short sStack_cd4;
  short sStack_cd2;
  short sStack_cd0;
  short sStack_cce;
  short sStack_ccc;
  short sStack_cca;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  short local_c38;
  short sStack_c36;
  short sStack_c34;
  short sStack_c32;
  short sStack_c30;
  short sStack_c2e;
  short sStack_c2c;
  short sStack_c2a;
  undefined8 local_c28;
  undefined8 uStack_c20;
  short local_c18;
  short sStack_c16;
  short sStack_c14;
  short sStack_c12;
  short sStack_c10;
  short sStack_c0e;
  short sStack_c0c;
  short sStack_c0a;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  short local_b78;
  short sStack_b76;
  short sStack_b74;
  short sStack_b72;
  short sStack_b70;
  short sStack_b6e;
  short sStack_b6c;
  short sStack_b6a;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  short local_b38;
  short sStack_b36;
  short sStack_b34;
  short sStack_b32;
  short sStack_b30;
  short sStack_b2e;
  short sStack_b2c;
  short sStack_b2a;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  short local_a18;
  short sStack_a16;
  short sStack_a14;
  short sStack_a12;
  short sStack_a10;
  short sStack_a0e;
  short sStack_a0c;
  short sStack_a0a;
  undefined8 local_a08;
  undefined8 uStack_a00;
  short local_9f8;
  short sStack_9f6;
  short sStack_9f4;
  short sStack_9f2;
  short sStack_9f0;
  short sStack_9ee;
  short sStack_9ec;
  short sStack_9ea;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  short local_9a8;
  short sStack_9a6;
  short sStack_9a4;
  short sStack_9a2;
  short sStack_9a0;
  short sStack_99e;
  short sStack_99c;
  short sStack_99a;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  short local_938;
  short sStack_936;
  short sStack_934;
  short sStack_932;
  undefined2 uStack_930;
  undefined2 uStack_92e;
  undefined2 uStack_92c;
  undefined2 uStack_92a;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  short local_8f8;
  short sStack_8f6;
  short sStack_8f4;
  short sStack_8f2;
  short sStack_8f0;
  short sStack_8ee;
  short sStack_8ec;
  short sStack_8ea;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  short local_8b8;
  short sStack_8b6;
  short sStack_8b4;
  short sStack_8b2;
  short sStack_8b0;
  short sStack_8ae;
  short sStack_8ac;
  short sStack_8aa;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  short local_878;
  short sStack_876;
  short sStack_874;
  short sStack_872;
  short sStack_870;
  short sStack_86e;
  short sStack_86c;
  short sStack_86a;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  short local_818;
  short sStack_816;
  short sStack_814;
  short sStack_812;
  short sStack_810;
  short sStack_80e;
  short sStack_80c;
  short sStack_80a;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  short local_7d8;
  short sStack_7d6;
  short sStack_7d4;
  short sStack_7d2;
  short sStack_7d0;
  short sStack_7ce;
  short sStack_7cc;
  short sStack_7ca;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined1 local_5d8;
  undefined1 uStack_5d7;
  undefined1 uStack_5d6;
  undefined1 uStack_5d5;
  undefined1 uStack_5d4;
  undefined1 uStack_5d3;
  undefined1 uStack_5d2;
  undefined1 uStack_5d1;
  undefined1 uStack_5d0;
  undefined1 uStack_5cf;
  undefined1 uStack_5ce;
  undefined1 uStack_5cd;
  undefined1 uStack_5cc;
  undefined1 uStack_5cb;
  undefined1 uStack_5ca;
  undefined1 uStack_5c9;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  ulong local_5a8;
  undefined8 uStack_5a0;
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined1 *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  undefined8 *local_530;
  ulong *local_528;
  undefined4 *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  ulong local_4f8;
  ulong uStack_4f0;
  undefined8 local_4e8;
  ulong uStack_4e0;
  ulong local_4d8;
  ulong uStack_4d0;
  undefined8 local_4c8;
  ulong uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined1 local_469;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  ulong local_448;
  ulong uStack_440;
  ulong local_438;
  ulong uStack_430;
  ulong local_428;
  ulong uStack_420;
  undefined1 local_418 [16];
  undefined8 local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b8;
  ulong uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  ulong uStack_390;
  undefined8 local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  undefined8 uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined1 local_218;
  undefined1 local_217;
  undefined1 local_216;
  undefined1 local_215;
  undefined1 local_214;
  undefined1 local_213;
  undefined1 local_212;
  undefined1 local_211;
  undefined1 local_210;
  undefined1 local_20f;
  undefined1 local_20e;
  undefined1 local_20d;
  undefined1 local_20c;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_1f6;
  undefined1 local_1f5;
  undefined1 local_1f4;
  undefined1 local_1f3;
  undefined1 local_1f2;
  undefined1 local_1f1;
  undefined1 local_1f0;
  undefined1 local_1ef;
  undefined1 local_1ee;
  undefined1 local_1ed;
  undefined1 local_1ec;
  undefined1 local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8;
  undefined1 local_1d7;
  undefined1 local_1d6;
  undefined1 local_1d5;
  undefined1 local_1d4;
  undefined1 local_1d3;
  undefined1 local_1d2;
  undefined1 local_1d1;
  undefined1 local_1d0;
  undefined1 local_1cf;
  undefined1 local_1ce;
  undefined1 local_1cd;
  undefined1 local_1cc;
  undefined1 local_1cb;
  undefined1 local_1ca;
  undefined1 local_1c9;
  ulong local_1c8;
  ulong uStack_1c0;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  undefined1 local_1a8;
  undefined1 local_1a7;
  undefined1 local_1a6;
  undefined1 local_1a5;
  undefined1 local_1a4;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined1 local_1a0;
  undefined1 local_19f;
  undefined1 local_19e;
  undefined1 local_19d;
  undefined4 local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  ulong uVar100;
  
  local_2034 = (int)in_RSI;
  local_20d8._0_8_ = *in_RDX;
  local_20d8._8_8_ = in_RDX[1];
  local_20e8._0_8_ = *in_RCX;
  local_20e8._8_8_ = in_RCX[1];
  local_20f8._0_8_ = *in_R8;
  local_20f8._8_8_ = in_R8[1];
  local_2030 = in_RDI;
  xx_loadl_32((void *)((long)in_RDI - (long)(local_2034 * 5)));
  xx_loadl_32((void *)((long)local_2030 + (long)(local_2034 << 2)));
  local_1f58 = (undefined4)extraout_XMM0_Qa;
  uStack_1f54 = (undefined4)((ulong)extraout_XMM0_Qa >> 0x20);
  local_1f68 = (undefined4)extraout_XMM0_Qa_00;
  uStack_1f64 = (undefined4)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  local_2088 = local_1f58;
  uStack_2084 = local_1f68;
  uStack_2080 = uStack_1f54;
  uStack_207c = uStack_1f64;
  xx_loadl_32((void *)((long)local_2030 - (long)(local_2034 << 2)));
  xx_loadl_32((void *)((long)local_2030 + (long)(local_2034 * 3)));
  local_1f78 = (undefined4)extraout_XMM0_Qa_01;
  uStack_1f74 = (undefined4)((ulong)extraout_XMM0_Qa_01 >> 0x20);
  local_1f88 = (undefined4)extraout_XMM0_Qa_02;
  uStack_1f84 = (undefined4)((ulong)extraout_XMM0_Qa_02 >> 0x20);
  local_2098 = local_1f78;
  uStack_2094 = local_1f88;
  uStack_2090 = uStack_1f74;
  uStack_208c = uStack_1f84;
  xx_loadl_32((void *)((long)local_2030 - (long)(local_2034 * 3)));
  xx_loadl_32((void *)((long)local_2030 + (long)(local_2034 * 2)));
  local_1f98 = (undefined4)extraout_XMM0_Qa_03;
  uStack_1f94 = (undefined4)((ulong)extraout_XMM0_Qa_03 >> 0x20);
  local_1fa8 = (undefined4)extraout_XMM0_Qa_04;
  uStack_1fa4 = (undefined4)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  local_20a8 = local_1f98;
  uStack_20a4 = local_1fa8;
  uStack_20a0 = uStack_1f94;
  uStack_209c = uStack_1fa4;
  xx_loadl_32((void *)((long)local_2030 - (long)(local_2034 * 2)));
  xx_loadl_32((void *)((long)local_2030 + (long)local_2034));
  local_1fb8 = (undefined4)extraout_XMM0_Qa_05;
  uStack_1fb4 = (undefined4)((ulong)extraout_XMM0_Qa_05 >> 0x20);
  local_1fc8 = (undefined4)extraout_XMM0_Qa_06;
  uStack_1fc4 = (undefined4)((ulong)extraout_XMM0_Qa_06 >> 0x20);
  local_20b8 = local_1fb8;
  uStack_20b4 = local_1fc8;
  uStack_20b0 = uStack_1fb4;
  uStack_20ac = uStack_1fc4;
  xx_loadl_32((void *)((long)local_2030 - (long)local_2034));
  xx_loadl_32(local_2030);
  local_1fd8 = (undefined4)extraout_XMM0_Qa_07;
  uStack_1fd4 = (undefined4)((ulong)extraout_XMM0_Qa_07 >> 0x20);
  local_1fe8 = (undefined4)extraout_XMM0_Qa_08;
  uStack_1fe4 = (undefined4)((ulong)extraout_XMM0_Qa_08 >> 0x20);
  local_20c8 = local_1fd8;
  uStack_20c4 = local_1fe8;
  uStack_20c0 = uStack_1fd4;
  uStack_20bc = uStack_1fe4;
  xx_loadl_32((void *)((long)local_2030 - (long)(local_2034 * 6)));
  xx_loadl_32((void *)((long)local_2030 + (long)(local_2034 * 5)));
  local_1ff8 = (undefined4)extraout_XMM0_Qa_09;
  uStack_1ff4 = (undefined4)((ulong)extraout_XMM0_Qa_09 >> 0x20);
  local_2008 = (undefined4)extraout_XMM0_Qa_10;
  uStack_2004 = (undefined4)((ulong)extraout_XMM0_Qa_10 >> 0x20);
  local_2078 = local_1ff8;
  uStack_2074 = local_2008;
  uStack_2070 = uStack_1ff4;
  uStack_206c = uStack_2004;
  xx_loadl_32((void *)((long)local_2030 - (long)(local_2034 * 7)));
  uVar99 = (ulong)(uint)(local_2034 * 2);
  a = (void *)((long)local_2030 + (long)(local_2034 * 6));
  alVar149 = xx_loadl_32(a);
  alVar149[0] = alVar149[1];
  local_2018 = (undefined4)extraout_XMM0_Qa_11;
  uStack_2014 = (undefined4)((ulong)extraout_XMM0_Qa_11 >> 0x20);
  local_2028 = (undefined4)extraout_XMM0_Qa_12;
  uStack_2024 = (undefined4)((ulong)extraout_XMM0_Qa_12 >> 0x20);
  local_2068 = local_2018;
  uStack_2064 = local_2028;
  uStack_2060 = uStack_2014;
  uStack_205c = uStack_2024;
  local_1a70 = (undefined8 *)&local_2068;
  local_1a78 = (ulong *)&local_2078;
  local_1a80 = (ulong *)&local_2088;
  local_1a88 = (ulong *)&local_2098;
  local_1a90 = (ulong *)&local_20a8;
  local_1a98 = (ulong *)&local_20b8;
  local_1aa0 = (ulong *)&local_20c8;
  local_1aa8 = &local_20d8;
  local_1ab0 = &local_20e8;
  local_1ab8 = &local_20f8;
  local_1a68 = 0;
  uStack_1a60 = 0;
  local_1ac8 = 0;
  uStack_1ac0 = 0;
  local_1769 = 1;
  local_1c9 = 1;
  local_1ca = 1;
  local_1cb = 1;
  local_1cc = 1;
  local_1cd = 1;
  local_1ce = 1;
  local_1cf = 1;
  local_1d0 = 1;
  local_1d1 = 1;
  local_1d2 = 1;
  local_1d3 = 1;
  local_1d4 = 1;
  local_1d5 = 1;
  local_1d6 = 1;
  local_1d7 = 1;
  local_1d8 = 1;
  local_1ad8 = 0x101010101010101;
  uStack_1ad0 = 0x101010101010101;
  local_19a8 = CONCAT44(uStack_20c4,local_20c8);
  uStack_19a0 = CONCAT44(uStack_20bc,uStack_20c0);
  local_19b8 = CONCAT44(uStack_20b4,local_20b8);
  uStack_19b0 = CONCAT44(uStack_20ac,uStack_20b0);
  local_1bd8 = local_20c8;
  uStack_1bd4 = local_20b8;
  uStack_1bd0 = uStack_20c4;
  uStack_1bcc = uStack_20b4;
  local_1be8 = CONCAT44(uStack_20b4,uStack_20c4);
  uStack_1be0 = 0;
  alVar149[1] = uVar99;
  a_00[1] = in_RSI;
  a_00[0] = (longlong)a;
  local_1e8 = local_1ad8;
  uStack_1e0 = uStack_1ad0;
  alVar149 = abs_diff(a_00,alVar149);
  b[0] = alVar149[1];
  auVar110._8_8_ = extraout_XMM0_Qb;
  auVar110._0_8_ = extraout_XMM0_Qa_13;
  local_1c78 = auVar110 >> 0x20;
  local_176a = 0xfe;
  local_19d = 0xfe;
  local_19e = 0xfe;
  local_19f = 0xfe;
  local_1a0 = 0xfe;
  local_1a1 = 0xfe;
  local_1a2 = 0xfe;
  local_1a3 = 0xfe;
  local_1a4 = 0xfe;
  local_1a5 = 0xfe;
  local_1a6 = 0xfe;
  local_1a7 = 0xfe;
  local_1a8 = 0xfe;
  local_1a9 = 0xfe;
  local_1aa = 0xfe;
  local_1ab = 0xfe;
  local_1ac = 0xfe;
  local_1c28 = 0xfefefefefefefefe;
  uStack_1c20 = 0xfefefefefefefefe;
  local_1c38 = 0xff;
  uStack_1c37 = 0xff;
  uStack_1c36 = 0xff;
  uStack_1c35 = 0xff;
  uStack_1c34 = 0xff;
  uStack_1c33 = 0xff;
  uStack_1c32 = 0xff;
  uStack_1c31 = 0xff;
  uStack_1c30 = 0xff;
  uStack_1c2f = 0xff;
  uStack_1c2e = 0xff;
  uStack_1c2d = 0xff;
  uStack_1c2c = 0xff;
  uStack_1c2b = 0xff;
  uStack_1c2a = 0xff;
  uStack_1c29 = 0xff;
  b[1] = uVar99;
  a_01[1] = in_RSI;
  a_01[0] = (longlong)a;
  local_1c18 = extraout_XMM0_Qa_13;
  uStack_1c10 = extraout_XMM0_Qb;
  local_1688 = local_1c28;
  uStack_1680 = uStack_1c20;
  local_1678 = local_1c28;
  uStack_1670 = uStack_1c20;
  local_1c8 = local_1c28;
  uStack_1c0 = uStack_1c20;
  alVar149 = abs_diff(a_01,b);
  b_00[0] = alVar149[1];
  local_1c68._8_8_ = extraout_XMM0_Qb_00;
  local_1c68._0_8_ = extraout_XMM0_Qa_14;
  local_1518 = local_1c18;
  uVar17 = local_1518;
  uStack_1510 = uStack_1c10;
  uVar20 = uStack_1510;
  local_1528 = local_1c78._0_8_;
  uVar15 = local_1528;
  uStack_1520 = local_1c78._8_8_;
  uVar16 = uStack_1520;
  local_1518._0_1_ = (byte)local_1c18;
  local_1518._1_1_ = (byte)((ulong)local_1c18 >> 8);
  local_1518._2_1_ = (byte)((ulong)local_1c18 >> 0x10);
  local_1518._3_1_ = (byte)((ulong)local_1c18 >> 0x18);
  local_1518._4_1_ = (byte)((ulong)local_1c18 >> 0x20);
  local_1518._5_1_ = (byte)((ulong)local_1c18 >> 0x28);
  local_1518._6_1_ = (byte)((ulong)local_1c18 >> 0x30);
  local_1518._7_1_ = (byte)((ulong)local_1c18 >> 0x38);
  uStack_1510._0_1_ = (byte)uStack_1c10;
  uStack_1510._1_1_ = (byte)((ulong)uStack_1c10 >> 8);
  uStack_1510._2_1_ = (byte)((ulong)uStack_1c10 >> 0x10);
  uStack_1510._3_1_ = (byte)((ulong)uStack_1c10 >> 0x18);
  uStack_1510._4_1_ = (byte)((ulong)uStack_1c10 >> 0x20);
  uStack_1510._5_1_ = (byte)((ulong)uStack_1c10 >> 0x28);
  uStack_1510._6_1_ = (byte)((ulong)uStack_1c10 >> 0x30);
  uStack_1510._7_1_ = (byte)((ulong)uStack_1c10 >> 0x38);
  local_1528._0_1_ = local_1c78[0];
  local_1528._1_1_ = local_1c78[1];
  local_1528._2_1_ = local_1c78[2];
  local_1528._3_1_ = local_1c78[3];
  local_1528._4_1_ = local_1c78[4];
  local_1528._5_1_ = local_1c78[5];
  local_1528._6_1_ = local_1c78[6];
  local_1528._7_1_ = local_1c78[7];
  uStack_1520._0_1_ = local_1c78[8];
  uStack_1520._1_1_ = local_1c78[9];
  uStack_1520._2_1_ = local_1c78[10];
  uStack_1520._3_1_ = local_1c78[0xb];
  uStack_1520._4_1_ = local_1c78[0xc];
  uStack_1520._5_1_ = local_1c78[0xd];
  uStack_1520._6_1_ = local_1c78[0xe];
  uStack_1520._7_1_ = local_1c78[0xf];
  local_1b08[1] =
       (local_1518._1_1_ < local_1528._1_1_) * local_1528._1_1_ |
       (local_1518._1_1_ >= local_1528._1_1_) * local_1518._1_1_;
  local_1b08[0] =
       ((byte)local_1518 < (byte)local_1528) * (byte)local_1528 |
       ((byte)local_1518 >= (byte)local_1528) * (byte)local_1518;
  local_1b08[2] =
       (local_1518._2_1_ < local_1528._2_1_) * local_1528._2_1_ |
       (local_1518._2_1_ >= local_1528._2_1_) * local_1518._2_1_;
  local_1b08[3] =
       (local_1518._3_1_ < local_1528._3_1_) * local_1528._3_1_ |
       (local_1518._3_1_ >= local_1528._3_1_) * local_1518._3_1_;
  local_1b08[4] =
       (local_1518._4_1_ < local_1528._4_1_) * local_1528._4_1_ |
       (local_1518._4_1_ >= local_1528._4_1_) * local_1518._4_1_;
  local_1b08[5] =
       (local_1518._5_1_ < local_1528._5_1_) * local_1528._5_1_ |
       (local_1518._5_1_ >= local_1528._5_1_) * local_1518._5_1_;
  local_1b08[6] =
       (local_1518._6_1_ < local_1528._6_1_) * local_1528._6_1_ |
       (local_1518._6_1_ >= local_1528._6_1_) * local_1518._6_1_;
  local_1b08[7] =
       (local_1518._7_1_ < local_1528._7_1_) * local_1528._7_1_ |
       (local_1518._7_1_ >= local_1528._7_1_) * local_1518._7_1_;
  local_1b08[8] =
       ((byte)uStack_1510 < (byte)uStack_1520) * (byte)uStack_1520 |
       ((byte)uStack_1510 >= (byte)uStack_1520) * (byte)uStack_1510;
  local_1b08[9] =
       (uStack_1510._1_1_ < uStack_1520._1_1_) * uStack_1520._1_1_ |
       (uStack_1510._1_1_ >= uStack_1520._1_1_) * uStack_1510._1_1_;
  local_1b08[10] =
       (uStack_1510._2_1_ < uStack_1520._2_1_) * uStack_1520._2_1_ |
       (uStack_1510._2_1_ >= uStack_1520._2_1_) * uStack_1510._2_1_;
  local_1b08[0xb] =
       (uStack_1510._3_1_ < uStack_1520._3_1_) * uStack_1520._3_1_ |
       (uStack_1510._3_1_ >= uStack_1520._3_1_) * uStack_1510._3_1_;
  local_1b08[0xc] =
       (uStack_1510._4_1_ < uStack_1520._4_1_) * uStack_1520._4_1_ |
       (uStack_1510._4_1_ >= uStack_1520._4_1_) * uStack_1510._4_1_;
  local_1b08[0xd] =
       (uStack_1510._5_1_ < uStack_1520._5_1_) * uStack_1520._5_1_ |
       (uStack_1510._5_1_ >= uStack_1520._5_1_) * uStack_1510._5_1_;
  local_1b08[0xe] =
       (uStack_1510._6_1_ < uStack_1520._6_1_) * uStack_1520._6_1_ |
       (uStack_1510._6_1_ >= uStack_1520._6_1_) * uStack_1510._6_1_;
  local_1b08[0xf] =
       (uStack_1510._7_1_ < uStack_1520._7_1_) * uStack_1520._7_1_ |
       (uStack_1510._7_1_ >= uStack_1520._7_1_) * uStack_1510._7_1_;
  local_1188 = *(undefined8 *)*local_1ab8;
  uStack_1180 = *(undefined8 *)(*local_1ab8 + 8);
  local_1178 = local_1b08._0_8_;
  uStack_1170 = local_1b08._8_8_;
  auVar72._8_8_ = local_1b08._8_8_;
  auVar72._0_8_ = local_1b08._0_8_;
  auVar110 = psubusb(auVar72,*local_1ab8);
  local_1af8 = auVar110._0_8_;
  uStack_1af0 = auVar110._8_8_;
  local_1698 = local_1af8;
  uVar11 = local_1698;
  uStack_1690 = uStack_1af0;
  uVar14 = uStack_1690;
  local_16a8 = local_1ac8;
  uVar2 = local_16a8;
  uStack_16a0 = uStack_1ac0;
  uVar8 = uStack_16a0;
  local_1698._0_1_ = auVar110[0];
  local_1698._1_1_ = auVar110[1];
  local_1698._2_1_ = auVar110[2];
  local_1698._3_1_ = auVar110[3];
  local_1698._4_1_ = auVar110[4];
  local_1698._5_1_ = auVar110[5];
  local_1698._6_1_ = auVar110[6];
  local_1698._7_1_ = auVar110[7];
  uStack_1690._0_1_ = auVar110[8];
  uStack_1690._1_1_ = auVar110[9];
  uStack_1690._2_1_ = auVar110[10];
  uStack_1690._3_1_ = auVar110[0xb];
  uStack_1690._4_1_ = auVar110[0xc];
  uStack_1690._5_1_ = auVar110[0xd];
  uStack_1690._6_1_ = auVar110[0xe];
  uStack_1690._7_1_ = auVar110[0xf];
  local_16a8._0_1_ = (char)local_1ac8;
  local_16a8._1_1_ = (char)((ulong)local_1ac8 >> 8);
  local_16a8._2_1_ = (char)((ulong)local_1ac8 >> 0x10);
  local_16a8._3_1_ = (char)((ulong)local_1ac8 >> 0x18);
  local_16a8._4_1_ = (char)((ulong)local_1ac8 >> 0x20);
  local_16a8._5_1_ = (char)((ulong)local_1ac8 >> 0x28);
  local_16a8._6_1_ = (char)((ulong)local_1ac8 >> 0x30);
  local_16a8._7_1_ = (char)((ulong)local_1ac8 >> 0x38);
  uStack_16a0._0_1_ = (char)uStack_1ac0;
  uStack_16a0._1_1_ = (char)((ulong)uStack_1ac0 >> 8);
  uStack_16a0._2_1_ = (char)((ulong)uStack_1ac0 >> 0x10);
  uStack_16a0._3_1_ = (char)((ulong)uStack_1ac0 >> 0x18);
  uStack_16a0._4_1_ = (char)((ulong)uStack_1ac0 >> 0x20);
  uStack_16a0._5_1_ = (char)((ulong)uStack_1ac0 >> 0x28);
  uStack_16a0._6_1_ = (char)((ulong)uStack_1ac0 >> 0x30);
  uStack_16a0._7_1_ = (char)((ulong)uStack_1ac0 >> 0x38);
  local_1138 = -((char)local_1698 == (char)local_16a8);
  cStack_1137 = -(local_1698._1_1_ == local_16a8._1_1_);
  cStack_1136 = -(local_1698._2_1_ == local_16a8._2_1_);
  cStack_1135 = -(local_1698._3_1_ == local_16a8._3_1_);
  cStack_1134 = -(local_1698._4_1_ == local_16a8._4_1_);
  cStack_1133 = -(local_1698._5_1_ == local_16a8._5_1_);
  cStack_1132 = -(local_1698._6_1_ == local_16a8._6_1_);
  cStack_1131 = -(local_1698._7_1_ == local_16a8._7_1_);
  cStack_1130 = -((char)uStack_1690 == (char)uStack_16a0);
  cStack_112f = -(uStack_1690._1_1_ == uStack_16a0._1_1_);
  cStack_112e = -(uStack_1690._2_1_ == uStack_16a0._2_1_);
  cStack_112d = -(uStack_1690._3_1_ == uStack_16a0._3_1_);
  cStack_112c = -(uStack_1690._4_1_ == uStack_16a0._4_1_);
  cStack_112b = -(uStack_1690._5_1_ == uStack_16a0._5_1_);
  cStack_112a = -(uStack_1690._6_1_ == uStack_16a0._6_1_);
  cStack_1129 = -(uStack_1690._7_1_ == uStack_16a0._7_1_);
  local_1148 = CONCAT17(uStack_1c31,
                        CONCAT16(uStack_1c32,
                                 CONCAT15(uStack_1c33,
                                          CONCAT14(uStack_1c34,
                                                   CONCAT13(uStack_1c35,
                                                            CONCAT12(uStack_1c36,
                                                                     CONCAT11(uStack_1c37,local_1c38
                                                                             )))))));
  uStack_1140 = CONCAT17(uStack_1c29,
                         CONCAT16(uStack_1c2a,
                                  CONCAT15(uStack_1c2b,
                                           CONCAT14(uStack_1c2c,
                                                    CONCAT13(uStack_1c2d,
                                                             CONCAT12(uStack_1c2e,
                                                                      CONCAT11(uStack_1c2f,
                                                                               uStack_1c30)))))));
  local_19d8 = CONCAT17(cStack_1131,
                        CONCAT16(cStack_1132,
                                 CONCAT15(cStack_1133,
                                          CONCAT14(cStack_1134,
                                                   CONCAT13(cStack_1135,
                                                            CONCAT12(cStack_1136,
                                                                     CONCAT11(cStack_1137,local_1138
                                                                             ))))))) ^ local_1148;
  uStack_19d0 = CONCAT17(cStack_1129,
                         CONCAT16(cStack_112a,
                                  CONCAT15(cStack_112b,
                                           CONCAT14(cStack_112c,
                                                    CONCAT13(cStack_112d,
                                                             CONCAT12(cStack_112e,
                                                                      CONCAT11(cStack_112f,
                                                                               cStack_1130))))))) ^
                uStack_1140;
  local_19c8._0_4_ = (undefined4)local_19d8;
  local_19c8._4_4_ = (undefined4)(local_19d8 >> 0x20);
  local_1af8._4_4_ = (undefined4)local_19c8;
  local_1af8._0_4_ = (undefined4)local_19c8;
  uStack_1af0._0_4_ = local_19c8._4_4_;
  uStack_1af0._4_4_ = local_19c8._4_4_;
  auVar66._8_8_ = extraout_XMM0_Qb_00;
  auVar66._0_8_ = extraout_XMM0_Qa_14;
  auVar111._8_8_ = extraout_XMM0_Qb_00;
  auVar111._0_8_ = extraout_XMM0_Qa_14;
  auVar111 = paddusb(auVar66,auVar111);
  local_1c58._0_8_ = local_1c68._4_8_;
  uStack_1210 = extraout_XMM0_Qb_00 >> 0x20;
  local_1218 = local_1c58._0_8_;
  local_1228 = local_1c28;
  uStack_1220 = uStack_1c20;
  uVar108 = local_1c58._0_8_ & local_1c28;
  uVar132 = uStack_1210 & uStack_1c20;
  local_139c = 1;
  local_1398._0_2_ = (ushort)uVar108;
  local_1398._2_2_ = (ushort)(uVar108 >> 0x10);
  local_1398._4_2_ = (ushort)(uVar108 >> 0x20);
  uStack_1390._0_2_ = (ushort)uVar132;
  uStack_1390._2_2_ = (ushort)(uVar132 >> 0x10);
  local_1c58._2_2_ = local_1398._2_2_ >> 1;
  local_1c58._0_2_ = (ushort)local_1398 >> 1;
  local_1c58._4_2_ = local_1398._4_2_ >> 1;
  local_1c58._6_2_ = (ushort)(uVar108 >> 0x31);
  local_1c58._8_2_ = (ushort)uStack_1390 >> 1;
  local_1c58._10_2_ = uStack_1390._2_2_ >> 1;
  local_1c58._12_4_ = 0;
  auVar110 = local_1c58;
  local_1c68._0_8_ = auVar111._0_8_;
  local_1c68._8_8_ = auVar111._8_8_;
  local_1c58._12_4_ = 0;
  local_14f8 = local_1c68._0_8_;
  uStack_14f0 = local_1c68._8_8_;
  local_1508 = local_1c58._0_8_;
  uStack_1500 = local_1c58._8_8_;
  auVar112._8_4_ = local_1c58._8_4_;
  auVar112._0_8_ = local_1c58._0_8_;
  auVar112._12_4_ = 0;
  local_1198 = paddusb(auVar111,auVar112);
  local_11a8 = *(undefined8 *)*local_1aa8;
  uStack_11a0 = *(undefined8 *)(*local_1aa8 + 8);
  auVar112 = psubusb(local_1198,*local_1aa8);
  local_1ae8._0_8_ = auVar112._0_8_;
  local_1ae8._8_8_ = auVar112._8_8_;
  local_19e8 = local_1ae8._0_8_;
  uVar3 = local_19e8;
  uStack_19e0 = local_1ae8._8_8_;
  local_19f8 = local_1ac8;
  uStack_19f0 = uStack_1ac0;
  local_19e8._0_4_ = auVar112._0_4_;
  local_19e8._4_4_ = auVar112._4_4_;
  local_19f8._0_4_ = (undefined4)local_1ac8;
  local_19f8._4_4_ = (undefined4)((ulong)local_1ac8 >> 0x20);
  local_1ae8._4_4_ = (undefined4)local_19f8;
  local_1ae8._0_4_ = (undefined4)local_19e8;
  local_1ae8._8_4_ = local_19e8._4_4_;
  local_1ae8._12_4_ = local_19f8._4_4_;
  local_16b8 = local_1ae8._0_8_;
  uVar6 = local_16b8;
  uStack_16b0 = local_1ae8._8_8_;
  uVar7 = uStack_16b0;
  local_16c8 = local_1ac8;
  uStack_16c0 = uStack_1ac0;
  local_16b8._0_1_ = auVar112[0];
  local_16b8._1_1_ = auVar112[1];
  local_16b8._2_1_ = auVar112[2];
  local_16b8._3_1_ = auVar112[3];
  uStack_16b0._0_1_ = auVar112[4];
  uStack_16b0._1_1_ = auVar112[5];
  uStack_16b0._2_1_ = auVar112[6];
  uStack_16b0._3_1_ = auVar112[7];
  local_1158 = -((char)local_16b8 == (char)local_16a8);
  cStack_1157 = -(local_16b8._1_1_ == local_16a8._1_1_);
  cStack_1156 = -(local_16b8._2_1_ == local_16a8._2_1_);
  cStack_1155 = -(local_16b8._3_1_ == local_16a8._3_1_);
  cStack_1154 = -((char)local_16a8 == local_16a8._4_1_);
  cStack_1153 = -(local_16a8._1_1_ == local_16a8._5_1_);
  cStack_1152 = -(local_16a8._2_1_ == local_16a8._6_1_);
  cStack_1151 = -(local_16a8._3_1_ == local_16a8._7_1_);
  cStack_1150 = -((char)uStack_16b0 == (char)uStack_16a0);
  cStack_114f = -(uStack_16b0._1_1_ == uStack_16a0._1_1_);
  cStack_114e = -(uStack_16b0._2_1_ == uStack_16a0._2_1_);
  cStack_114d = -(uStack_16b0._3_1_ == uStack_16a0._3_1_);
  cStack_114c = -(local_16a8._4_1_ == uStack_16a0._4_1_);
  cStack_114b = -(local_16a8._5_1_ == uStack_16a0._5_1_);
  cStack_114a = -(local_16a8._6_1_ == uStack_16a0._6_1_);
  cStack_1149 = -(local_16a8._7_1_ == uStack_16a0._7_1_);
  local_1168 = CONCAT17(uStack_1c31,
                        CONCAT16(uStack_1c32,
                                 CONCAT15(uStack_1c33,
                                          CONCAT14(uStack_1c34,
                                                   CONCAT13(uStack_1c35,
                                                            CONCAT12(uStack_1c36,
                                                                     CONCAT11(uStack_1c37,local_1c38
                                                                             )))))));
  uStack_1160 = CONCAT17(uStack_1c29,
                         CONCAT16(uStack_1c2a,
                                  CONCAT15(uStack_1c2b,
                                           CONCAT14(uStack_1c2c,
                                                    CONCAT13(uStack_1c2d,
                                                             CONCAT12(uStack_1c2e,
                                                                      CONCAT11(uStack_1c2f,
                                                                               uStack_1c30)))))));
  uVar109 = CONCAT17(cStack_1151,
                     CONCAT16(cStack_1152,
                              CONCAT15(cStack_1153,
                                       CONCAT14(cStack_1154,
                                                CONCAT13(cStack_1155,
                                                         CONCAT12(cStack_1156,
                                                                  CONCAT11(cStack_1157,local_1158)))
                                               )))) ^ local_1168;
  uVar133 = CONCAT17(cStack_1149,
                     CONCAT16(cStack_114a,
                              CONCAT15(cStack_114b,
                                       CONCAT14(cStack_114c,
                                                CONCAT13(cStack_114d,
                                                         CONCAT12(cStack_114e,
                                                                  CONCAT11(cStack_114f,cStack_1150))
                                                        ))))) ^ uStack_1160;
  local_1538 = local_1c18;
  uStack_1530 = uStack_1c10;
  local_1548._0_1_ = (byte)uVar109;
  local_1548._1_1_ = (byte)(uVar109 >> 8);
  local_1548._2_1_ = (byte)(uVar109 >> 0x10);
  local_1548._3_1_ = (byte)(uVar109 >> 0x18);
  local_1548._4_1_ = (byte)(uVar109 >> 0x20);
  local_1548._5_1_ = (byte)(uVar109 >> 0x28);
  local_1548._6_1_ = (byte)(uVar109 >> 0x30);
  local_1548._7_1_ = (byte)(uVar109 >> 0x38);
  uStack_1540._0_1_ = (byte)uVar133;
  uStack_1540._1_1_ = (byte)(uVar133 >> 8);
  uStack_1540._2_1_ = (byte)(uVar133 >> 0x10);
  uStack_1540._3_1_ = (byte)(uVar133 >> 0x18);
  uStack_1540._4_1_ = (byte)(uVar133 >> 0x20);
  uStack_1540._5_1_ = (byte)(uVar133 >> 0x28);
  uStack_1540._6_1_ = (byte)(uVar133 >> 0x30);
  uStack_1540._7_1_ = (byte)(uVar133 >> 0x38);
  local_1ae8[1] =
       (local_1518._1_1_ < local_1548._1_1_) * local_1548._1_1_ |
       (local_1518._1_1_ >= local_1548._1_1_) * local_1518._1_1_;
  local_1ae8[0] =
       ((byte)local_1518 < (byte)local_1548) * (byte)local_1548 |
       ((byte)local_1518 >= (byte)local_1548) * (byte)local_1518;
  local_1ae8[2] =
       (local_1518._2_1_ < local_1548._2_1_) * local_1548._2_1_ |
       (local_1518._2_1_ >= local_1548._2_1_) * local_1518._2_1_;
  local_1ae8[3] =
       (local_1518._3_1_ < local_1548._3_1_) * local_1548._3_1_ |
       (local_1518._3_1_ >= local_1548._3_1_) * local_1518._3_1_;
  local_1ae8[4] =
       (local_1518._4_1_ < local_1548._4_1_) * local_1548._4_1_ |
       (local_1518._4_1_ >= local_1548._4_1_) * local_1518._4_1_;
  local_1ae8[5] =
       (local_1518._5_1_ < local_1548._5_1_) * local_1548._5_1_ |
       (local_1518._5_1_ >= local_1548._5_1_) * local_1518._5_1_;
  local_1ae8[6] =
       (local_1518._6_1_ < local_1548._6_1_) * local_1548._6_1_ |
       (local_1518._6_1_ >= local_1548._6_1_) * local_1518._6_1_;
  local_1ae8[7] =
       (local_1518._7_1_ < local_1548._7_1_) * local_1548._7_1_ |
       (local_1518._7_1_ >= local_1548._7_1_) * local_1518._7_1_;
  local_1ae8[8] =
       ((byte)uStack_1510 < (byte)uStack_1540) * (byte)uStack_1540 |
       ((byte)uStack_1510 >= (byte)uStack_1540) * (byte)uStack_1510;
  local_1ae8[9] =
       (uStack_1510._1_1_ < uStack_1540._1_1_) * uStack_1540._1_1_ |
       (uStack_1510._1_1_ >= uStack_1540._1_1_) * uStack_1510._1_1_;
  local_1ae8[10] =
       (uStack_1510._2_1_ < uStack_1540._2_1_) * uStack_1540._2_1_ |
       (uStack_1510._2_1_ >= uStack_1540._2_1_) * uStack_1510._2_1_;
  local_1ae8[0xb] =
       (uStack_1510._3_1_ < uStack_1540._3_1_) * uStack_1540._3_1_ |
       (uStack_1510._3_1_ >= uStack_1540._3_1_) * uStack_1510._3_1_;
  local_1ae8[0xc] =
       (uStack_1510._4_1_ < uStack_1540._4_1_) * uStack_1540._4_1_ |
       (uStack_1510._4_1_ >= uStack_1540._4_1_) * uStack_1510._4_1_;
  local_1ae8[0xd] =
       (uStack_1510._5_1_ < uStack_1540._5_1_) * uStack_1540._5_1_ |
       (uStack_1510._5_1_ >= uStack_1540._5_1_) * uStack_1510._5_1_;
  local_1ae8[0xe] =
       (uStack_1510._6_1_ < uStack_1540._6_1_) * uStack_1540._6_1_ |
       (uStack_1510._6_1_ >= uStack_1540._6_1_) * uStack_1510._6_1_;
  local_1ae8[0xf] =
       (uStack_1510._7_1_ < uStack_1540._7_1_) * uStack_1540._7_1_ |
       (uStack_1510._7_1_ >= uStack_1540._7_1_) * uStack_1510._7_1_;
  b_00[1] = uVar99;
  a_02[1] = in_RSI;
  a_02[0] = (longlong)a;
  local_1c68 = auVar111;
  local_1c58 = auVar110;
  local_19f8 = uVar2;
  local_19e8 = uVar3;
  local_19c8 = local_19d8;
  uStack_19c0 = uStack_19d0;
  local_16b8 = uVar6;
  uStack_16b0 = uVar7;
  local_16a8 = uVar2;
  uStack_16a0 = uVar8;
  local_1698 = uVar11;
  uStack_1690 = uVar14;
  local_1548 = uVar109;
  uStack_1540 = uVar133;
  local_1528 = uVar15;
  uStack_1520 = uVar16;
  local_1518 = uVar17;
  uStack_1510 = uVar20;
  local_1398 = uVar108;
  uStack_1390 = uVar132;
  alVar149 = abs_diff(a_02,b_00);
  b_01[0] = alVar149[1];
  b_01[1] = uVar99;
  a_03[1] = in_RSI;
  a_03[0] = (longlong)a;
  alVar149 = abs_diff(a_03,b_01);
  b_02[0] = alVar149[1];
  local_1558 = (byte)extraout_XMM0_Qa_15;
  bStack_1557 = (byte)((ulong)extraout_XMM0_Qa_15 >> 8);
  bStack_1556 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x10);
  bStack_1555 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x18);
  bStack_1554 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x20);
  bStack_1553 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x28);
  bStack_1552 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x30);
  bStack_1551 = (byte)((ulong)extraout_XMM0_Qa_15 >> 0x38);
  bStack_1550 = (byte)extraout_XMM0_Qb_01;
  bStack_154f = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_154e = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_154d = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_154c = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_154b = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_154a = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_1549 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_1568 = (byte)extraout_XMM0_Qa_16;
  bStack_1567 = (byte)((ulong)extraout_XMM0_Qa_16 >> 8);
  bStack_1566 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x10);
  bStack_1565 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x18);
  bStack_1564 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x20);
  bStack_1563 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x28);
  bStack_1562 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x30);
  bStack_1561 = (byte)((ulong)extraout_XMM0_Qa_16 >> 0x38);
  bStack_1560 = (byte)extraout_XMM0_Qb_02;
  bStack_155f = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_155e = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_155d = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_155c = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_155b = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_155a = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_1559 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  bVar101 = (local_1558 < local_1568) * local_1568 | (local_1558 >= local_1568) * local_1558;
  bVar113 = (bStack_1557 < bStack_1567) * bStack_1567 | (bStack_1557 >= bStack_1567) * bStack_1557;
  bVar114 = (bStack_1556 < bStack_1566) * bStack_1566 | (bStack_1556 >= bStack_1566) * bStack_1556;
  bVar117 = (bStack_1555 < bStack_1565) * bStack_1565 | (bStack_1555 >= bStack_1565) * bStack_1555;
  bVar118 = (bStack_1554 < bStack_1564) * bStack_1564 | (bStack_1554 >= bStack_1564) * bStack_1554;
  bVar122 = (bStack_1553 < bStack_1563) * bStack_1563 | (bStack_1553 >= bStack_1563) * bStack_1553;
  bVar123 = (bStack_1552 < bStack_1562) * bStack_1562 | (bStack_1552 >= bStack_1562) * bStack_1552;
  bVar126 = (bStack_1551 < bStack_1561) * bStack_1561 | (bStack_1551 >= bStack_1561) * bStack_1551;
  bVar127 = (bStack_1550 < bStack_1560) * bStack_1560 | (bStack_1550 >= bStack_1560) * bStack_1550;
  bVar134 = (bStack_154f < bStack_155f) * bStack_155f | (bStack_154f >= bStack_155f) * bStack_154f;
  bVar135 = (bStack_154e < bStack_155e) * bStack_155e | (bStack_154e >= bStack_155e) * bStack_154e;
  bVar138 = (bStack_154d < bStack_155d) * bStack_155d | (bStack_154d >= bStack_155d) * bStack_154d;
  bVar139 = (bStack_154c < bStack_155c) * bStack_155c | (bStack_154c >= bStack_155c) * bStack_154c;
  bVar143 = (bStack_154b < bStack_155b) * bStack_155b | (bStack_154b >= bStack_155b) * bStack_154b;
  bVar144 = (bStack_154a < bStack_155a) * bStack_155a | (bStack_154a >= bStack_155a) * bStack_154a;
  bVar148 = (bStack_1549 < bStack_1559) * bStack_1559 | (bStack_1549 >= bStack_1559) * bStack_1549;
  local_1c48 = CONCAT17(bVar126,CONCAT16(bVar123,CONCAT15(bVar122,CONCAT14(bVar118,CONCAT13(bVar117,
                                                  CONCAT12(bVar114,CONCAT11(bVar113,bVar101)))))));
  uStack_1c40 = CONCAT17(bVar148,CONCAT16(bVar144,CONCAT15(bVar143,CONCAT14(bVar139,CONCAT13(bVar138
                                                  ,CONCAT12(bVar135,CONCAT11(bVar134,bVar127)))))));
  local_1578 = local_1c48;
  uStack_1570 = uStack_1c40;
  local_1588 = local_1ae8._0_8_;
  uVar8 = local_1588;
  uStack_1580 = local_1ae8._8_8_;
  uVar11 = uStack_1580;
  local_1588._0_1_ = local_1ae8[0];
  local_1588._1_1_ = local_1ae8[1];
  local_1588._2_1_ = local_1ae8[2];
  local_1588._3_1_ = local_1ae8[3];
  local_1588._4_1_ = local_1ae8[4];
  local_1588._5_1_ = local_1ae8[5];
  local_1588._6_1_ = local_1ae8[6];
  local_1588._7_1_ = local_1ae8[7];
  uStack_1580._0_1_ = local_1ae8[8];
  uStack_1580._1_1_ = local_1ae8[9];
  uStack_1580._2_1_ = local_1ae8[10];
  uStack_1580._3_1_ = local_1ae8[0xb];
  uStack_1580._4_1_ = local_1ae8[0xc];
  uStack_1580._5_1_ = local_1ae8[0xd];
  uStack_1580._6_1_ = local_1ae8[0xe];
  uStack_1580._7_1_ = local_1ae8[0xf];
  local_1ae8[0] =
       (bVar101 < (byte)local_1588) * (byte)local_1588 | (bVar101 >= (byte)local_1588) * bVar101;
  local_1ae8[1] =
       (bVar113 < local_1588._1_1_) * local_1588._1_1_ | (bVar113 >= local_1588._1_1_) * bVar113;
  local_1ae8[2] =
       (bVar114 < local_1588._2_1_) * local_1588._2_1_ | (bVar114 >= local_1588._2_1_) * bVar114;
  local_1ae8[3] =
       (bVar117 < local_1588._3_1_) * local_1588._3_1_ | (bVar117 >= local_1588._3_1_) * bVar117;
  local_1ae8[4] =
       (bVar118 < local_1588._4_1_) * local_1588._4_1_ | (bVar118 >= local_1588._4_1_) * bVar118;
  local_1ae8[5] =
       (bVar122 < local_1588._5_1_) * local_1588._5_1_ | (bVar122 >= local_1588._5_1_) * bVar122;
  local_1ae8[6] =
       (bVar123 < local_1588._6_1_) * local_1588._6_1_ | (bVar123 >= local_1588._6_1_) * bVar123;
  local_1ae8[7] =
       (bVar126 < local_1588._7_1_) * local_1588._7_1_ | (bVar126 >= local_1588._7_1_) * bVar126;
  local_1ae8[8] =
       (bVar127 < (byte)uStack_1580) * (byte)uStack_1580 | (bVar127 >= (byte)uStack_1580) * bVar127;
  local_1ae8[9] =
       (bVar134 < uStack_1580._1_1_) * uStack_1580._1_1_ | (bVar134 >= uStack_1580._1_1_) * bVar134;
  local_1ae8[10] =
       (bVar135 < uStack_1580._2_1_) * uStack_1580._2_1_ | (bVar135 >= uStack_1580._2_1_) * bVar135;
  local_1ae8[0xb] =
       (bVar138 < uStack_1580._3_1_) * uStack_1580._3_1_ | (bVar138 >= uStack_1580._3_1_) * bVar138;
  local_1ae8[0xc] =
       (bVar139 < uStack_1580._4_1_) * uStack_1580._4_1_ | (bVar139 >= uStack_1580._4_1_) * bVar139;
  local_1ae8[0xd] =
       (bVar143 < uStack_1580._5_1_) * uStack_1580._5_1_ | (bVar143 >= uStack_1580._5_1_) * bVar143;
  local_1ae8[0xe] =
       (bVar144 < uStack_1580._6_1_) * uStack_1580._6_1_ | (bVar144 >= uStack_1580._6_1_) * bVar144;
  local_1ae8[0xf] =
       (bVar148 < uStack_1580._7_1_) * uStack_1580._7_1_ | (bVar148 >= uStack_1580._7_1_) * bVar148;
  local_15a8 = local_1ae8 >> 0x20;
  local_1598 = local_1ae8;
  local_1ae8[1] =
       (local_1ae8[1] < local_1ae8[5]) * local_1ae8[5] |
       (local_1ae8[1] >= local_1ae8[5]) * local_1ae8[1];
  local_1ae8[0] =
       (local_1ae8[0] < local_1ae8[4]) * local_1ae8[4] |
       (local_1ae8[0] >= local_1ae8[4]) * local_1ae8[0];
  local_1ae8[2] =
       (local_1ae8[2] < local_1ae8[6]) * local_1ae8[6] |
       (local_1ae8[2] >= local_1ae8[6]) * local_1ae8[2];
  local_1ae8[3] =
       (local_1ae8[3] < local_1ae8[7]) * local_1ae8[7] |
       (local_1ae8[3] >= local_1ae8[7]) * local_1ae8[3];
  local_1ae8[4] =
       (local_1ae8[4] < local_1ae8[8]) * local_1ae8[8] |
       (local_1ae8[4] >= local_1ae8[8]) * local_1ae8[4];
  local_1ae8[5] =
       (local_1ae8[5] < local_1ae8[9]) * local_1ae8[9] |
       (local_1ae8[5] >= local_1ae8[9]) * local_1ae8[5];
  local_1ae8[6] =
       (local_1ae8[6] < local_1ae8[10]) * local_1ae8[10] |
       (local_1ae8[6] >= local_1ae8[10]) * local_1ae8[6];
  local_1ae8[7] =
       (local_1ae8[7] < local_1ae8[0xb]) * local_1ae8[0xb] |
       (local_1ae8[7] >= local_1ae8[0xb]) * local_1ae8[7];
  local_1ae8[8] =
       (local_1ae8[8] < local_1ae8[0xc]) * local_1ae8[0xc] |
       (local_1ae8[8] >= local_1ae8[0xc]) * local_1ae8[8];
  local_1ae8[9] =
       (local_1ae8[9] < local_1ae8[0xd]) * local_1ae8[0xd] |
       (local_1ae8[9] >= local_1ae8[0xd]) * local_1ae8[9];
  local_1ae8[10] =
       (local_1ae8[10] < local_1ae8[0xe]) * local_1ae8[0xe] |
       (local_1ae8[10] >= local_1ae8[0xe]) * local_1ae8[10];
  local_1ae8[0xb] =
       (local_1ae8[0xb] < local_1ae8[0xf]) * local_1ae8[0xf] |
       (local_1ae8[0xb] >= local_1ae8[0xf]) * local_1ae8[0xb];
  local_11c8 = *(undefined8 *)*local_1ab0;
  uStack_11c0 = *(undefined8 *)(*local_1ab0 + 8);
  local_11b8 = local_1ae8._0_8_;
  uStack_11b0 = local_1ae8._8_8_;
  auVar71._8_8_ = local_1ae8._8_8_;
  auVar71._0_8_ = local_1ae8._0_8_;
  auVar110 = psubusb(auVar71,*local_1ab0);
  local_1ae8._0_8_ = auVar110._0_8_;
  local_1ae8._8_8_ = auVar110._8_8_;
  local_16d8 = local_1ae8._0_8_;
  uVar6 = local_16d8;
  uStack_16d0 = local_1ae8._8_8_;
  uVar7 = uStack_16d0;
  local_16e8 = local_1ac8;
  uVar2 = local_16e8;
  uStack_16e0 = uStack_1ac0;
  uVar3 = uStack_16e0;
  local_16d8._0_1_ = auVar110[0];
  local_16d8._1_1_ = auVar110[1];
  local_16d8._2_1_ = auVar110[2];
  local_16d8._3_1_ = auVar110[3];
  local_16d8._4_1_ = auVar110[4];
  local_16d8._5_1_ = auVar110[5];
  local_16d8._6_1_ = auVar110[6];
  local_16d8._7_1_ = auVar110[7];
  uStack_16d0._0_1_ = auVar110[8];
  uStack_16d0._1_1_ = auVar110[9];
  uStack_16d0._2_1_ = auVar110[10];
  uStack_16d0._3_1_ = auVar110[0xb];
  uStack_16d0._4_1_ = auVar110[0xc];
  uStack_16d0._5_1_ = auVar110[0xd];
  uStack_16d0._6_1_ = auVar110[0xe];
  uStack_16d0._7_1_ = auVar110[0xf];
  local_16e8._0_1_ = (char)local_1ac8;
  local_16e8._1_1_ = (char)((ulong)local_1ac8 >> 8);
  local_16e8._2_1_ = (char)((ulong)local_1ac8 >> 0x10);
  local_16e8._3_1_ = (char)((ulong)local_1ac8 >> 0x18);
  local_16e8._4_1_ = (char)((ulong)local_1ac8 >> 0x20);
  local_16e8._5_1_ = (char)((ulong)local_1ac8 >> 0x28);
  local_16e8._6_1_ = (char)((ulong)local_1ac8 >> 0x30);
  local_16e8._7_1_ = (char)((ulong)local_1ac8 >> 0x38);
  uStack_16e0._0_1_ = (char)uStack_1ac0;
  uStack_16e0._1_1_ = (char)((ulong)uStack_1ac0 >> 8);
  uStack_16e0._2_1_ = (char)((ulong)uStack_1ac0 >> 0x10);
  uStack_16e0._3_1_ = (char)((ulong)uStack_1ac0 >> 0x18);
  uStack_16e0._4_1_ = (char)((ulong)uStack_1ac0 >> 0x20);
  uStack_16e0._5_1_ = (char)((ulong)uStack_1ac0 >> 0x28);
  uStack_16e0._6_1_ = (char)((ulong)uStack_1ac0 >> 0x30);
  uStack_16e0._7_1_ = (char)((ulong)uStack_1ac0 >> 0x38);
  local_1ae8[1] = -(local_16d8._1_1_ == local_16e8._1_1_);
  local_1ae8[0] = -((char)local_16d8 == (char)local_16e8);
  local_1ae8[2] = -(local_16d8._2_1_ == local_16e8._2_1_);
  local_1ae8[3] = -(local_16d8._3_1_ == local_16e8._3_1_);
  local_1ae8[4] = -(local_16d8._4_1_ == local_16e8._4_1_);
  local_1ae8[5] = -(local_16d8._5_1_ == local_16e8._5_1_);
  local_1ae8[6] = -(local_16d8._6_1_ == local_16e8._6_1_);
  local_1ae8[7] = -(local_16d8._7_1_ == local_16e8._7_1_);
  local_1ae8[8] = -((char)uStack_16d0 == (char)uStack_16e0);
  local_1ae8[9] = -(uStack_16d0._1_1_ == uStack_16e0._1_1_);
  local_1ae8[10] = -(uStack_16d0._2_1_ == uStack_16e0._2_1_);
  local_1ae8[0xb] = -(uStack_16d0._3_1_ == uStack_16e0._3_1_);
  local_1ae8[0xc] = -(uStack_16d0._4_1_ == uStack_16e0._4_1_);
  local_1ae8[0xd] = -(uStack_16d0._5_1_ == uStack_16e0._5_1_);
  local_1ae8[0xe] = -(uStack_16d0._6_1_ == uStack_16e0._6_1_);
  local_1ae8[0xf] = -(uStack_16d0._7_1_ == uStack_16e0._7_1_);
  local_520 = &local_1bd8;
  local_528 = &local_1be8;
  local_530 = &local_1af8;
  local_538 = local_1ae8;
  local_540 = local_1bf8;
  local_548 = local_1c08;
  local_1e9 = 0;
  local_1ea = 0;
  local_1eb = 0;
  local_1ec = 0;
  local_1ed = 0;
  local_1ee = 0;
  local_1ef = 0;
  local_1f0 = 0;
  local_1f1 = 3;
  local_1f2 = 3;
  local_1f3 = 3;
  local_1f4 = 3;
  local_1f5 = 4;
  local_1f6 = 4;
  local_1f7 = 4;
  local_1f8 = 4;
  local_5b8 = 0x303030304040404;
  uStack_5b0 = 0;
  local_469 = 0x80;
  local_209 = 0x80;
  local_20a = 0x80;
  local_20b = 0x80;
  local_20c = 0x80;
  local_20d = 0x80;
  local_20e = 0x80;
  local_20f = 0x80;
  local_210 = 0x80;
  local_211 = 0x80;
  local_212 = 0x80;
  local_213 = 0x80;
  local_214 = 0x80;
  local_215 = 0x80;
  local_216 = 0x80;
  local_217 = 0x80;
  local_218 = 0x80;
  local_5c8 = 0x8080808080808080;
  uStack_5c0 = 0x8080808080808080;
  local_5d8 = 0xff;
  uStack_5d7 = 0xff;
  uStack_5d6 = 0xff;
  uStack_5d5 = 0xff;
  uStack_5d4 = 0xff;
  uStack_5d3 = 0xff;
  uStack_5d2 = 0xff;
  uStack_5d1 = 0xff;
  uStack_5d0 = 0xff;
  uStack_5cf = 0xff;
  uStack_5ce = 0xff;
  uStack_5cd = 0xff;
  uStack_5cc = 0xff;
  uStack_5cb = 0xff;
  uStack_5ca = 0xff;
  uStack_5c9 = 0xff;
  local_398 = CONCAT44(uStack_1bd4,local_1bd8);
  uStack_390 = CONCAT44(uStack_1bcc,uStack_1bd0);
  local_2d8 = local_398 ^ 0x8080808080808080;
  uStack_2d0 = uStack_390 ^ 0x8080808080808080;
  local_3b8 = local_1be8;
  uStack_3b0 = uStack_1be0;
  local_378 = local_1be8 ^ 0x8080808080808080;
  uStack_370 = uStack_1be0 ^ 0x8080808080808080;
  auVar80._8_8_ = uStack_2d0;
  auVar80._0_8_ = local_2d8;
  auVar79._8_8_ = uStack_370;
  auVar79._0_8_ = local_378;
  local_578 = psubsb(auVar80,auVar79);
  local_428 = local_1af8;
  uStack_420 = uStack_1af0;
  local_418._0_8_ = local_578._4_8_;
  local_418._12_4_ = 0;
  local_418._8_4_ = local_578._12_4_;
  local_2f8 = local_418._0_8_ & local_1af8;
  uStack_2f0 = local_418._8_8_ & uStack_1af0;
  local_308 = local_578._0_8_;
  uStack_300 = local_578._8_8_;
  auVar78._8_8_ = uStack_2f0;
  auVar78._0_8_ = local_2f8;
  auVar110 = psubsb(auVar78,local_578);
  local_558 = auVar110._0_8_;
  uStack_550 = auVar110._8_8_;
  local_318 = local_558;
  uStack_310 = uStack_550;
  local_328 = local_578._0_8_;
  uStack_320 = local_578._8_8_;
  auVar110 = psubsb(auVar110,local_578);
  local_558 = auVar110._0_8_;
  uStack_550 = auVar110._8_8_;
  local_338 = local_558;
  uStack_330 = uStack_550;
  local_348 = local_578._0_8_;
  uStack_340 = local_578._8_8_;
  auVar110 = psubsb(auVar110,local_578);
  local_558 = auVar110._0_8_;
  uStack_550 = auVar110._8_8_;
  local_448 = local_1ae8._0_8_;
  uStack_440 = local_1ae8._8_8_;
  local_438 = local_558;
  uStack_430 = uStack_550;
  local_4d8 = local_558 & local_1ae8._0_8_;
  uStack_4d0 = uStack_550 & local_1ae8._8_8_;
  local_4c8._0_4_ = (undefined4)local_4d8;
  local_4c8._4_4_ = (undefined4)(local_4d8 >> 0x20);
  local_558 = CONCAT44((undefined4)local_4c8,(undefined4)local_4c8);
  uStack_550._0_4_ = local_4c8._4_4_;
  uStack_550._4_4_ = local_4c8._4_4_;
  local_298 = local_558;
  uStack_290 = uStack_550;
  auVar83._8_8_ = uStack_550;
  auVar83._0_8_ = local_558;
  auVar110 = paddsb(auVar83,ZEXT816(0x303030304040404));
  local_568 = auVar110._0_8_;
  uStack_560 = auVar110._8_8_;
  local_488 = local_568;
  uVar16 = local_488;
  uStack_480 = uStack_560;
  local_498 = local_568;
  uStack_490 = uStack_560;
  local_488._0_1_ = auVar110[0];
  local_488._1_1_ = auVar110[1];
  local_488._2_1_ = auVar110[2];
  local_488._3_1_ = auVar110[3];
  local_488._4_1_ = auVar110[4];
  local_488._5_1_ = auVar110[5];
  local_488._6_1_ = auVar110[6];
  local_488._7_1_ = auVar110[7];
  local_568._0_2_ = CONCAT11((undefined1)local_488,(undefined1)local_488);
  local_568._0_3_ = CONCAT12(local_488._1_1_,(undefined2)local_568);
  local_568._0_4_ = CONCAT13(local_488._1_1_,(undefined3)local_568);
  local_568._0_5_ = CONCAT14(local_488._2_1_,(undefined4)local_568);
  local_568._0_6_ = CONCAT15(local_488._2_1_,(undefined5)local_568);
  local_568._0_7_ = CONCAT16(local_488._3_1_,(undefined6)local_568);
  local_568 = CONCAT17(local_488._3_1_,(undefined7)local_568);
  uStack_560._0_1_ = local_488._4_1_;
  uStack_560._1_1_ = local_488._4_1_;
  uStack_560._2_1_ = local_488._5_1_;
  uStack_560._3_1_ = local_488._5_1_;
  uStack_560._4_1_ = local_488._6_1_;
  uStack_560._5_1_ = local_488._6_1_;
  uStack_560._6_1_ = local_488._7_1_;
  uStack_560._7_1_ = local_488._7_1_;
  local_178 = local_568;
  uStack_170 = uStack_560;
  local_17c = 0xb;
  auVar85._8_8_ = uStack_560;
  auVar85._0_8_ = local_568;
  auVar110 = psraw(auVar85,ZEXT416(0xb));
  local_568 = auVar110._0_8_;
  uStack_560 = auVar110._8_8_;
  local_238 = local_568;
  uStack_230 = uStack_560;
  local_248 = local_568;
  uStack_240 = uStack_560;
  auVar110 = packsswb(auVar110,auVar110);
  local_568 = auVar110._0_8_;
  uStack_560 = auVar110._8_8_;
  local_368 = 0xffffffffffffffff;
  uStack_360 = 0xffffffffffffffff;
  local_358 = local_568;
  uStack_350 = uStack_560;
  auVar77._8_8_ = 0xffffffffffffffff;
  auVar77._0_8_ = 0xffffffffffffffff;
  auVar112 = psubsb(auVar110,auVar77);
  local_558 = auVar112._0_8_;
  uStack_550 = auVar112._8_8_;
  local_4a8 = local_558;
  uVar15 = local_4a8;
  uStack_4a0 = uStack_550;
  local_4b8 = local_558;
  uStack_4b0 = uStack_550;
  local_4a8._0_1_ = auVar112[0];
  local_4a8._1_1_ = auVar112[1];
  local_4a8._2_1_ = auVar112[2];
  local_4a8._3_1_ = auVar112[3];
  local_4a8._4_1_ = auVar112[4];
  local_4a8._5_1_ = auVar112[5];
  local_4a8._6_1_ = auVar112[6];
  local_4a8._7_1_ = auVar112[7];
  local_558._0_2_ = CONCAT11((undefined1)local_4a8,(undefined1)local_4a8);
  local_558._0_3_ = CONCAT12(local_4a8._1_1_,(undefined2)local_558);
  local_558._0_4_ = CONCAT13(local_4a8._1_1_,(undefined3)local_558);
  local_558._0_5_ = CONCAT14(local_4a8._2_1_,(undefined4)local_558);
  local_558._0_6_ = CONCAT15(local_4a8._2_1_,(undefined5)local_558);
  local_558._0_7_ = CONCAT16(local_4a8._3_1_,(undefined6)local_558);
  local_558 = CONCAT17(local_4a8._3_1_,(undefined7)local_558);
  uStack_550._0_1_ = local_4a8._4_1_;
  uStack_550._1_1_ = local_4a8._4_1_;
  uStack_550._2_1_ = local_4a8._5_1_;
  uStack_550._3_1_ = local_4a8._5_1_;
  uStack_550._4_1_ = local_4a8._6_1_;
  uStack_550._5_1_ = local_4a8._6_1_;
  uStack_550._6_1_ = local_4a8._7_1_;
  uStack_550._7_1_ = local_4a8._7_1_;
  local_198 = local_558;
  uStack_190 = uStack_550;
  local_19c = 9;
  auVar84._8_8_ = uStack_550;
  auVar84._0_8_ = local_558;
  auVar112 = psraw(auVar84,ZEXT416(9));
  local_558 = auVar112._0_8_;
  uStack_550 = auVar112._8_8_;
  local_258 = local_558;
  uStack_250 = uStack_550;
  local_268 = local_558;
  uStack_260 = uStack_550;
  auVar112 = packsswb(auVar112,auVar112);
  local_278 = local_1af8;
  uStack_270 = uStack_1af0;
  local_558 = auVar112._0_8_;
  uStack_550 = auVar112._8_8_;
  local_288 = local_558;
  uStack_280 = uStack_550;
  local_4f8 = ~local_1af8 & local_558;
  uStack_4f0 = ~uStack_1af0 & uStack_550;
  local_4e8._0_4_ = (undefined4)local_4f8;
  local_4e8._4_4_ = (undefined4)(local_4f8 >> 0x20);
  local_558 = CONCAT44((undefined4)local_4e8,(undefined4)local_4e8);
  uStack_550._0_4_ = local_4e8._4_4_;
  uStack_550._4_4_ = local_4e8._4_4_;
  local_508 = local_568;
  uVar14 = local_508;
  uStack_500 = uStack_560;
  local_518 = local_558;
  uStack_510 = uStack_550;
  local_508._0_4_ = auVar110._0_4_;
  local_508._4_4_ = auVar110._4_4_;
  local_568 = CONCAT44((undefined4)local_4e8,(undefined4)local_508);
  uStack_560._0_4_ = local_508._4_4_;
  uStack_560._4_4_ = (undefined4)local_4e8;
  local_5a8 = uStack_560;
  uStack_5a0 = 0;
  local_388 = local_568;
  uStack_380 = uStack_560;
  auVar76._8_8_ = uStack_370;
  auVar76._0_8_ = local_378;
  auVar75._8_8_ = uStack_560;
  auVar75._0_8_ = local_568;
  local_598 = psubsb(auVar76,auVar75);
  local_2c8 = uStack_560;
  uStack_2c0 = 0;
  auVar82._8_8_ = uStack_2d0;
  auVar82._0_8_ = local_2d8;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uStack_560;
  local_588 = paddsb(auVar82,auVar81);
  local_3d8 = local_598._0_8_;
  uStack_3d0 = local_598._8_8_;
  uVar108 = local_598._0_8_ ^ 0x8080808080808080;
  uStack_1a10 = local_598._8_8_ ^ 0x8080808080808080;
  local_3f8 = local_588._0_8_;
  uStack_3f0 = local_588._8_8_;
  local_408 = 0x8080808080808080;
  uStack_400 = 0x8080808080808080;
  uVar109 = local_588._0_8_ ^ 0x8080808080808080;
  uStack_1a00 = local_588._8_8_ ^ 0x8080808080808080;
  local_1a08._0_4_ = (undefined4)uVar109;
  local_1a08._4_4_ = (undefined4)(uVar109 >> 0x20);
  local_1a18._0_4_ = (undefined4)uVar108;
  local_1a18._4_4_ = (undefined4)(uVar108 >> 0x20);
  local_1bb8 = CONCAT44((undefined4)local_1a18,(undefined4)local_1a08);
  uStack_1bb0 = CONCAT44(local_1a18._4_4_,local_1a08._4_4_);
  local_1bc8 = uStack_1bb0;
  uStack_1bc0 = 0;
  b_02[1] = uVar99;
  a_04[1] = in_RSI;
  a_04[0] = (longlong)a;
  local_1a18 = uVar108;
  local_1a08 = uVar109;
  local_16e8 = uVar2;
  uStack_16e0 = uVar3;
  local_16d8 = uVar6;
  uStack_16d0 = uVar7;
  local_1588 = uVar8;
  uStack_1580 = uVar11;
  local_508 = uVar14;
  local_4e8 = local_4f8;
  uStack_4e0 = uStack_4f0;
  local_4c8 = local_4d8;
  uStack_4c0 = uStack_4d0;
  local_4a8 = uVar15;
  local_488 = uVar16;
  local_468 = local_5c8;
  uStack_460 = uStack_5c0;
  local_458 = local_5c8;
  uStack_450 = uStack_5c0;
  local_418 = local_578 >> 0x20;
  local_3e8 = local_5c8;
  uStack_3e0 = uStack_5c0;
  local_3c8 = local_5c8;
  uStack_3c0 = uStack_5c0;
  local_3a8 = local_5c8;
  uStack_3a0 = uStack_5c0;
  local_2e8 = local_378;
  uStack_2e0 = uStack_370;
  local_2b8 = local_2d8;
  uStack_2b0 = uStack_2d0;
  local_2a8 = local_5b8;
  uStack_2a0 = uStack_5b0;
  local_228 = local_5c8;
  uStack_220 = uStack_5c0;
  local_208 = local_5b8;
  uStack_200 = uStack_5b0;
  alVar149 = abs_diff(a_04,b_02);
  b_03[0] = alVar149[1];
  b_03[1] = uVar99;
  a_05[1] = in_RSI;
  a_05[0] = (longlong)a;
  alVar149 = abs_diff(a_05,b_03);
  puVar86 = local_1aa0;
  uVar99 = uStack_1bb0;
  b_04[0] = alVar149[1];
  local_15b8 = (byte)extraout_XMM0_Qa_17;
  bStack_15b7 = (byte)((ulong)extraout_XMM0_Qa_17 >> 8);
  bStack_15b6 = (byte)((ulong)extraout_XMM0_Qa_17 >> 0x10);
  bStack_15b5 = (byte)((ulong)extraout_XMM0_Qa_17 >> 0x18);
  bStack_15b4 = (byte)((ulong)extraout_XMM0_Qa_17 >> 0x20);
  bStack_15b3 = (byte)((ulong)extraout_XMM0_Qa_17 >> 0x28);
  bStack_15b2 = (byte)((ulong)extraout_XMM0_Qa_17 >> 0x30);
  bStack_15b1 = (byte)((ulong)extraout_XMM0_Qa_17 >> 0x38);
  bStack_15b0 = (byte)extraout_XMM0_Qb_03;
  bStack_15af = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_15ae = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_15ad = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_15ac = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_15ab = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_15aa = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_15a9 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_15c8 = (byte)extraout_XMM0_Qa_18;
  bStack_15c7 = (byte)((ulong)extraout_XMM0_Qa_18 >> 8);
  bStack_15c6 = (byte)((ulong)extraout_XMM0_Qa_18 >> 0x10);
  bStack_15c5 = (byte)((ulong)extraout_XMM0_Qa_18 >> 0x18);
  bStack_15c4 = (byte)((ulong)extraout_XMM0_Qa_18 >> 0x20);
  bStack_15c3 = (byte)((ulong)extraout_XMM0_Qa_18 >> 0x28);
  bStack_15c2 = (byte)((ulong)extraout_XMM0_Qa_18 >> 0x30);
  bStack_15c1 = (byte)((ulong)extraout_XMM0_Qa_18 >> 0x38);
  bStack_15c0 = (byte)extraout_XMM0_Qb_04;
  bStack_15bf = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_15be = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_15bd = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_15bc = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_15bb = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_15ba = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_15b9 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  local_1b08[0] = (local_15b8 < local_15c8) * local_15c8 | (local_15b8 >= local_15c8) * local_15b8;
  local_1b08[1] =
       (bStack_15b7 < bStack_15c7) * bStack_15c7 | (bStack_15b7 >= bStack_15c7) * bStack_15b7;
  local_1b08[2] =
       (bStack_15b6 < bStack_15c6) * bStack_15c6 | (bStack_15b6 >= bStack_15c6) * bStack_15b6;
  local_1b08[3] =
       (bStack_15b5 < bStack_15c5) * bStack_15c5 | (bStack_15b5 >= bStack_15c5) * bStack_15b5;
  local_1b08[4] =
       (bStack_15b4 < bStack_15c4) * bStack_15c4 | (bStack_15b4 >= bStack_15c4) * bStack_15b4;
  local_1b08[5] =
       (bStack_15b3 < bStack_15c3) * bStack_15c3 | (bStack_15b3 >= bStack_15c3) * bStack_15b3;
  local_1b08[6] =
       (bStack_15b2 < bStack_15c2) * bStack_15c2 | (bStack_15b2 >= bStack_15c2) * bStack_15b2;
  local_1b08[7] =
       (bStack_15b1 < bStack_15c1) * bStack_15c1 | (bStack_15b1 >= bStack_15c1) * bStack_15b1;
  bVar101 = (bStack_15b0 < bStack_15c0) * bStack_15c0 | (bStack_15b0 >= bStack_15c0) * bStack_15b0;
  bVar113 = (bStack_15af < bStack_15bf) * bStack_15bf | (bStack_15af >= bStack_15bf) * bStack_15af;
  bVar114 = (bStack_15ae < bStack_15be) * bStack_15be | (bStack_15ae >= bStack_15be) * bStack_15ae;
  bVar117 = (bStack_15ad < bStack_15bd) * bStack_15bd | (bStack_15ad >= bStack_15bd) * bStack_15ad;
  bVar118 = (bStack_15ac < bStack_15bc) * bStack_15bc | (bStack_15ac >= bStack_15bc) * bStack_15ac;
  bVar122 = (bStack_15ab < bStack_15bb) * bStack_15bb | (bStack_15ab >= bStack_15bb) * bStack_15ab;
  bVar123 = (bStack_15aa < bStack_15ba) * bStack_15ba | (bStack_15aa >= bStack_15ba) * bStack_15aa;
  bVar126 = (bStack_15a9 < bStack_15b9) * bStack_15b9 | (bStack_15a9 >= bStack_15b9) * bStack_15a9;
  local_1b08[8] = bVar101;
  local_1b08[9] = bVar113;
  local_1b08[10] = bVar114;
  local_1b08[0xb] = bVar117;
  local_1b08[0xc] = bVar118;
  local_1b08[0xd] = bVar122;
  local_1b08[0xe] = bVar123;
  local_1b08[0xf] = bVar126;
  local_15d8 = local_1c18;
  uVar8 = local_15d8;
  uStack_15d0 = uStack_1c10;
  uVar11 = uStack_15d0;
  local_15e8 = local_1b08._0_8_;
  uStack_15e0 = local_1b08._8_8_;
  local_15d8._0_1_ = (byte)local_1c18;
  local_15d8._1_1_ = (byte)((ulong)local_1c18 >> 8);
  local_15d8._2_1_ = (byte)((ulong)local_1c18 >> 0x10);
  local_15d8._3_1_ = (byte)((ulong)local_1c18 >> 0x18);
  local_15d8._4_1_ = (byte)((ulong)local_1c18 >> 0x20);
  local_15d8._5_1_ = (byte)((ulong)local_1c18 >> 0x28);
  local_15d8._6_1_ = (byte)((ulong)local_1c18 >> 0x30);
  local_15d8._7_1_ = (byte)((ulong)local_1c18 >> 0x38);
  uStack_15d0._0_1_ = (byte)uStack_1c10;
  uStack_15d0._1_1_ = (byte)((ulong)uStack_1c10 >> 8);
  uStack_15d0._2_1_ = (byte)((ulong)uStack_1c10 >> 0x10);
  uStack_15d0._3_1_ = (byte)((ulong)uStack_1c10 >> 0x18);
  uStack_15d0._4_1_ = (byte)((ulong)uStack_1c10 >> 0x20);
  uStack_15d0._5_1_ = (byte)((ulong)uStack_1c10 >> 0x28);
  uStack_15d0._6_1_ = (byte)((ulong)uStack_1c10 >> 0x30);
  uStack_15d0._7_1_ = (byte)((ulong)uStack_1c10 >> 0x38);
  local_1b08[0] =
       ((byte)local_15d8 < local_1b08[0]) * local_1b08[0] |
       ((byte)local_15d8 >= local_1b08[0]) * (byte)local_15d8;
  local_1b08[1] =
       (local_15d8._1_1_ < local_1b08[1]) * local_1b08[1] |
       (local_15d8._1_1_ >= local_1b08[1]) * local_15d8._1_1_;
  local_1b08[2] =
       (local_15d8._2_1_ < local_1b08[2]) * local_1b08[2] |
       (local_15d8._2_1_ >= local_1b08[2]) * local_15d8._2_1_;
  local_1b08[3] =
       (local_15d8._3_1_ < local_1b08[3]) * local_1b08[3] |
       (local_15d8._3_1_ >= local_1b08[3]) * local_15d8._3_1_;
  local_1b08[4] =
       (local_15d8._4_1_ < local_1b08[4]) * local_1b08[4] |
       (local_15d8._4_1_ >= local_1b08[4]) * local_15d8._4_1_;
  local_1b08[5] =
       (local_15d8._5_1_ < local_1b08[5]) * local_1b08[5] |
       (local_15d8._5_1_ >= local_1b08[5]) * local_15d8._5_1_;
  local_1b08[6] =
       (local_15d8._6_1_ < local_1b08[6]) * local_1b08[6] |
       (local_15d8._6_1_ >= local_1b08[6]) * local_15d8._6_1_;
  local_1b08[7] =
       (local_15d8._7_1_ < local_1b08[7]) * local_1b08[7] |
       (local_15d8._7_1_ >= local_1b08[7]) * local_15d8._7_1_;
  local_1b08[8] =
       ((byte)uStack_15d0 < bVar101) * bVar101 | ((byte)uStack_15d0 >= bVar101) * (byte)uStack_15d0;
  local_1b08[9] =
       (uStack_15d0._1_1_ < bVar113) * bVar113 | (uStack_15d0._1_1_ >= bVar113) * uStack_15d0._1_1_;
  local_1b08[10] =
       (uStack_15d0._2_1_ < bVar114) * bVar114 | (uStack_15d0._2_1_ >= bVar114) * uStack_15d0._2_1_;
  local_1b08[0xb] =
       (uStack_15d0._3_1_ < bVar117) * bVar117 | (uStack_15d0._3_1_ >= bVar117) * uStack_15d0._3_1_;
  local_1b08[0xc] =
       (uStack_15d0._4_1_ < bVar118) * bVar118 | (uStack_15d0._4_1_ >= bVar118) * uStack_15d0._4_1_;
  local_1b08[0xd] =
       (uStack_15d0._5_1_ < bVar122) * bVar122 | (uStack_15d0._5_1_ >= bVar122) * uStack_15d0._5_1_;
  local_1b08[0xe] =
       (uStack_15d0._6_1_ < bVar123) * bVar123 | (uStack_15d0._6_1_ >= bVar123) * uStack_15d0._6_1_;
  local_1b08[0xf] =
       (uStack_15d0._7_1_ < bVar126) * bVar126 | (uStack_15d0._7_1_ >= bVar126) * uStack_15d0._7_1_;
  local_1608 = local_1b08 >> 0x20;
  local_15f8 = local_1b08;
  local_1b08[1] =
       (local_1b08[1] < local_1b08[5]) * local_1b08[5] |
       (local_1b08[1] >= local_1b08[5]) * local_1b08[1];
  local_1b08[0] =
       (local_1b08[0] < local_1b08[4]) * local_1b08[4] |
       (local_1b08[0] >= local_1b08[4]) * local_1b08[0];
  local_1b08[2] =
       (local_1b08[2] < local_1b08[6]) * local_1b08[6] |
       (local_1b08[2] >= local_1b08[6]) * local_1b08[2];
  local_1b08[3] =
       (local_1b08[3] < local_1b08[7]) * local_1b08[7] |
       (local_1b08[3] >= local_1b08[7]) * local_1b08[3];
  local_1b08[4] =
       (local_1b08[4] < local_1b08[8]) * local_1b08[8] |
       (local_1b08[4] >= local_1b08[8]) * local_1b08[4];
  local_1b08[5] =
       (local_1b08[5] < local_1b08[9]) * local_1b08[9] |
       (local_1b08[5] >= local_1b08[9]) * local_1b08[5];
  local_1b08[6] =
       (local_1b08[6] < local_1b08[10]) * local_1b08[10] |
       (local_1b08[6] >= local_1b08[10]) * local_1b08[6];
  local_1b08[7] =
       (local_1b08[7] < local_1b08[0xb]) * local_1b08[0xb] |
       (local_1b08[7] >= local_1b08[0xb]) * local_1b08[7];
  local_1b08[8] =
       (local_1b08[8] < local_1b08[0xc]) * local_1b08[0xc] |
       (local_1b08[8] >= local_1b08[0xc]) * local_1b08[8];
  local_1b08[9] =
       (local_1b08[9] < local_1b08[0xd]) * local_1b08[0xd] |
       (local_1b08[9] >= local_1b08[0xd]) * local_1b08[9];
  local_1b08[10] =
       (local_1b08[10] < local_1b08[0xe]) * local_1b08[0xe] |
       (local_1b08[10] >= local_1b08[0xe]) * local_1b08[10];
  local_1b08[0xb] =
       (local_1b08[0xb] < local_1b08[0xf]) * local_1b08[0xf] |
       (local_1b08[0xb] >= local_1b08[0xf]) * local_1b08[0xb];
  local_11d8 = local_1b08._0_8_;
  uStack_11d0 = local_1b08._8_8_;
  local_11e8 = local_1ad8;
  uStack_11e0 = uStack_1ad0;
  auVar70._8_8_ = local_1b08._8_8_;
  auVar70._0_8_ = local_1b08._0_8_;
  auVar69._8_8_ = uStack_1ad0;
  auVar69._0_8_ = local_1ad8;
  auVar110 = psubusb(auVar70,auVar69);
  local_1b08._0_8_ = auVar110._0_8_;
  local_1b08._8_8_ = auVar110._8_8_;
  local_16f8 = local_1b08._0_8_;
  uVar6 = local_16f8;
  uStack_16f0 = local_1b08._8_8_;
  uVar7 = uStack_16f0;
  local_1708 = local_1ac8;
  uVar2 = local_1708;
  uStack_1700 = uStack_1ac0;
  uVar3 = uStack_1700;
  local_16f8._0_1_ = auVar110[0];
  local_16f8._1_1_ = auVar110[1];
  local_16f8._2_1_ = auVar110[2];
  local_16f8._3_1_ = auVar110[3];
  local_16f8._4_1_ = auVar110[4];
  local_16f8._5_1_ = auVar110[5];
  local_16f8._6_1_ = auVar110[6];
  local_16f8._7_1_ = auVar110[7];
  uStack_16f0._0_1_ = auVar110[8];
  uStack_16f0._1_1_ = auVar110[9];
  uStack_16f0._2_1_ = auVar110[10];
  uStack_16f0._3_1_ = auVar110[0xb];
  uStack_16f0._4_1_ = auVar110[0xc];
  uStack_16f0._5_1_ = auVar110[0xd];
  uStack_16f0._6_1_ = auVar110[0xe];
  uStack_16f0._7_1_ = auVar110[0xf];
  local_1708._0_1_ = (char)local_1ac8;
  local_1708._1_1_ = (char)((ulong)local_1ac8 >> 8);
  local_1708._2_1_ = (char)((ulong)local_1ac8 >> 0x10);
  local_1708._3_1_ = (char)((ulong)local_1ac8 >> 0x18);
  local_1708._4_1_ = (char)((ulong)local_1ac8 >> 0x20);
  local_1708._5_1_ = (char)((ulong)local_1ac8 >> 0x28);
  local_1708._6_1_ = (char)((ulong)local_1ac8 >> 0x30);
  local_1708._7_1_ = (char)((ulong)local_1ac8 >> 0x38);
  uStack_1700._0_1_ = (char)uStack_1ac0;
  uStack_1700._1_1_ = (char)((ulong)uStack_1ac0 >> 8);
  uStack_1700._2_1_ = (char)((ulong)uStack_1ac0 >> 0x10);
  uStack_1700._3_1_ = (char)((ulong)uStack_1ac0 >> 0x18);
  uStack_1700._4_1_ = (char)((ulong)uStack_1ac0 >> 0x20);
  uStack_1700._5_1_ = (char)((ulong)uStack_1ac0 >> 0x28);
  uStack_1700._6_1_ = (char)((ulong)uStack_1ac0 >> 0x30);
  uStack_1700._7_1_ = (char)((ulong)uStack_1ac0 >> 0x38);
  local_1b08[1] = -(local_16f8._1_1_ == local_1708._1_1_);
  local_1b08[0] = -((char)local_16f8 == (char)local_1708);
  local_1b08[2] = -(local_16f8._2_1_ == local_1708._2_1_);
  local_1b08[3] = -(local_16f8._3_1_ == local_1708._3_1_);
  local_1b08[4] = -(local_16f8._4_1_ == local_1708._4_1_);
  local_1b08[5] = -(local_16f8._5_1_ == local_1708._5_1_);
  local_1b08[6] = -(local_16f8._6_1_ == local_1708._6_1_);
  local_1b08[7] = -(local_16f8._7_1_ == local_1708._7_1_);
  local_1b08[8] = -((char)uStack_16f0 == (char)uStack_1700);
  local_1b08[9] = -(uStack_16f0._1_1_ == uStack_1700._1_1_);
  local_1b08[10] = -(uStack_16f0._2_1_ == uStack_1700._2_1_);
  local_1b08[0xb] = -(uStack_16f0._3_1_ == uStack_1700._3_1_);
  local_1b08[0xc] = -(uStack_16f0._4_1_ == uStack_1700._4_1_);
  local_1b08[0xd] = -(uStack_16f0._5_1_ == uStack_1700._5_1_);
  local_1b08[0xe] = -(uStack_16f0._6_1_ == uStack_1700._6_1_);
  local_1b08[0xf] = -(uStack_16f0._7_1_ == uStack_1700._7_1_);
  local_1238 = local_1b08._0_8_;
  uStack_1230 = local_1b08._8_8_;
  local_1248 = local_1ae8._0_8_;
  uStack_1240 = local_1ae8._8_8_;
  local_1a38 = local_1b08._0_8_ & local_1ae8._0_8_;
  uStack_1a30 = local_1b08._8_8_ & local_1ae8._8_8_;
  local_1a28._0_4_ = (undefined4)local_1a38;
  local_1a28._4_4_ = (undefined4)(local_1a38 >> 0x20);
  local_1b08._4_4_ = (undefined4)local_1a28;
  local_1b08._0_4_ = (undefined4)local_1a28;
  local_1b08._8_4_ = local_1a28._4_4_;
  local_1b08._12_4_ = local_1a28._4_4_;
  local_1788 = local_1b08._0_8_;
  uStack_1780 = local_1b08._8_8_;
  local_1798 = local_1b08._0_8_;
  uStack_1790 = local_1b08._8_8_;
  local_1b08._8_8_ = local_1b08._0_8_;
  local_1718 = local_1b08._0_8_;
  uVar108 = local_1718;
  uStack_1710 = local_1b08._0_8_;
  local_1728 = local_1ac8;
  uStack_1720 = uStack_1ac0;
  local_1718._0_1_ = (char)local_1a38;
  local_1718._1_1_ = (char)(local_1a38 >> 8);
  local_1718._2_1_ = (char)(local_1a38 >> 0x10);
  local_1718._3_1_ = (char)(local_1a38 >> 0x18);
  local_1118 = -((char)local_1718 == (char)local_1708);
  cStack_1117 = -(local_1718._1_1_ == local_1708._1_1_);
  cStack_1116 = -(local_1718._2_1_ == local_1708._2_1_);
  cStack_1115 = -(local_1718._3_1_ == local_1708._3_1_);
  cStack_1114 = -((char)local_1718 == local_1708._4_1_);
  cStack_1113 = -(local_1718._1_1_ == local_1708._5_1_);
  cStack_1112 = -(local_1718._2_1_ == local_1708._6_1_);
  cStack_1111 = -(local_1718._3_1_ == local_1708._7_1_);
  cStack_1110 = -((char)local_1718 == (char)uStack_1700);
  cStack_110f = -(local_1718._1_1_ == uStack_1700._1_1_);
  cStack_110e = -(local_1718._2_1_ == uStack_1700._2_1_);
  cStack_110d = -(local_1718._3_1_ == uStack_1700._3_1_);
  cStack_110c = -((char)local_1718 == uStack_1700._4_1_);
  cStack_110b = -(local_1718._1_1_ == uStack_1700._5_1_);
  cStack_110a = -(local_1718._2_1_ == uStack_1700._6_1_);
  bStack_1109 = -(local_1718._3_1_ == uStack_1700._7_1_);
  auVar74[1] = cStack_1117;
  auVar74[0] = local_1118;
  auVar74[2] = cStack_1116;
  auVar74[3] = cStack_1115;
  auVar74[4] = cStack_1114;
  auVar74[5] = cStack_1113;
  auVar74[6] = cStack_1112;
  auVar74[7] = cStack_1111;
  auVar74[8] = cStack_1110;
  auVar74[9] = cStack_110f;
  auVar74[10] = cStack_110e;
  auVar74[0xb] = cStack_110d;
  auVar74[0xc] = cStack_110c;
  auVar74[0xd] = cStack_110b;
  auVar74[0xe] = cStack_110a;
  auVar74[0xf] = bStack_1109;
  uVar106 = (ushort)(SUB161(auVar74 >> 7,0) & 1) | (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_1109 >> 7) << 0xf;
  local_1a28 = local_1a38;
  uStack_1a20 = uStack_1a30;
  local_1718 = uVar108;
  local_1708 = uVar2;
  uStack_1700 = uVar3;
  local_16f8 = uVar6;
  uStack_16f0 = uVar7;
  local_15d8 = uVar8;
  uStack_15d0 = uVar11;
  if (uVar106 == 0xffff) {
    *local_1aa0 = local_1bb8;
    puVar86[1] = uVar99;
    puVar86 = local_1a98;
    uVar99 = uStack_1bc0;
    *local_1a98 = local_1bc8;
    puVar86[1] = uVar99;
  }
  else {
    local_eba = 8;
    in_stack_ffffffffffffde44 = 8;
    local_2a = 8;
    local_2c = 8;
    local_2e = 8;
    local_30 = 8;
    local_32 = 8;
    local_34 = 8;
    local_36 = 8;
    local_38 = 8;
    local_1d58 = 0x8000800080008;
    uStack_1d50 = 0x8000800080008;
    local_ebc = 4;
    in_stack_ffffffffffffde46 = 4;
    local_2 = 4;
    local_4 = 4;
    local_6 = 4;
    local_8 = 4;
    local_a = 4;
    local_c = 4;
    local_e = 4;
    local_10 = 4;
    local_1d68 = 0x4000400040004;
    uStack_1d60 = 0x4000400040004;
    uVar99 = *local_1aa0;
    uStack_18c0 = local_1aa0[1];
    local_18d8 = local_1ac8;
    uStack_18d0 = uStack_1ac0;
    local_18c8._0_1_ = (undefined1)uVar99;
    local_18c8._1_1_ = (undefined1)(uVar99 >> 8);
    local_18c8._2_1_ = (undefined1)(uVar99 >> 0x10);
    local_18c8._3_1_ = (undefined1)(uVar99 >> 0x18);
    local_18c8._4_1_ = (undefined1)(uVar99 >> 0x20);
    local_18c8._5_1_ = (undefined1)(uVar99 >> 0x28);
    local_18c8._6_1_ = (undefined1)(uVar99 >> 0x30);
    local_18c8._7_1_ = (undefined1)(uVar99 >> 0x38);
    local_1d48 = (undefined1)local_18c8;
    cStack_1d47 = (char)local_1708;
    uStack_1d46 = local_18c8._1_1_;
    cStack_1d45 = local_1708._1_1_;
    uStack_1d44 = local_18c8._2_1_;
    cStack_1d43 = local_1708._2_1_;
    uStack_1d42 = local_18c8._3_1_;
    cStack_1d41 = local_1708._3_1_;
    uStack_1d40 = local_18c8._4_1_;
    cStack_1d3f = local_1708._4_1_;
    uStack_1d3e = local_18c8._5_1_;
    cStack_1d3d = local_1708._5_1_;
    uStack_1d3c = local_18c8._6_1_;
    cStack_1d3b = local_1708._6_1_;
    uStack_1d3a = local_18c8._7_1_;
    cStack_1d39 = local_1708._7_1_;
    uVar108 = *local_1a98;
    uStack_18e0 = local_1a98[1];
    local_18f8 = local_1ac8;
    uStack_18f0 = uStack_1ac0;
    local_18e8._0_1_ = (undefined1)uVar108;
    local_18e8._1_1_ = (undefined1)(uVar108 >> 8);
    local_18e8._2_1_ = (undefined1)(uVar108 >> 0x10);
    local_18e8._3_1_ = (undefined1)(uVar108 >> 0x18);
    local_18e8._4_1_ = (undefined1)(uVar108 >> 0x20);
    local_18e8._5_1_ = (undefined1)(uVar108 >> 0x28);
    local_18e8._6_1_ = (undefined1)(uVar108 >> 0x30);
    local_18e8._7_1_ = (undefined1)(uVar108 >> 0x38);
    local_1d38 = (undefined1)local_18e8;
    cStack_1d37 = (char)local_1708;
    uStack_1d36 = local_18e8._1_1_;
    cStack_1d35 = local_1708._1_1_;
    uStack_1d34 = local_18e8._2_1_;
    cStack_1d33 = local_1708._2_1_;
    uStack_1d32 = local_18e8._3_1_;
    cStack_1d31 = local_1708._3_1_;
    uStack_1d30 = local_18e8._4_1_;
    cStack_1d2f = local_1708._4_1_;
    uStack_1d2e = local_18e8._5_1_;
    cStack_1d2d = local_1708._5_1_;
    uStack_1d2c = local_18e8._6_1_;
    cStack_1d2b = local_1708._6_1_;
    uStack_1d2a = local_18e8._7_1_;
    cStack_1d29 = local_1708._7_1_;
    uVar109 = *local_1a90;
    uStack_1900 = local_1a90[1];
    local_1918 = local_1ac8;
    uStack_1910 = uStack_1ac0;
    local_1908._0_1_ = (undefined1)uVar109;
    local_1908._1_1_ = (undefined1)(uVar109 >> 8);
    local_1908._2_1_ = (undefined1)(uVar109 >> 0x10);
    local_1908._3_1_ = (undefined1)(uVar109 >> 0x18);
    local_1908._4_1_ = (undefined1)(uVar109 >> 0x20);
    local_1908._5_1_ = (undefined1)(uVar109 >> 0x28);
    local_1908._6_1_ = (undefined1)(uVar109 >> 0x30);
    local_1908._7_1_ = (undefined1)(uVar109 >> 0x38);
    local_1d28 = (undefined1)local_1908;
    cStack_1d27 = (char)local_1708;
    uStack_1d26 = local_1908._1_1_;
    cStack_1d25 = local_1708._1_1_;
    uStack_1d24 = local_1908._2_1_;
    cStack_1d23 = local_1708._2_1_;
    uStack_1d22 = local_1908._3_1_;
    cStack_1d21 = local_1708._3_1_;
    uStack_1d20 = local_1908._4_1_;
    cStack_1d1f = local_1708._4_1_;
    uStack_1d1e = local_1908._5_1_;
    cStack_1d1d = local_1708._5_1_;
    uStack_1d1c = local_1908._6_1_;
    cStack_1d1b = local_1708._6_1_;
    uStack_1d1a = local_1908._7_1_;
    cStack_1d19 = local_1708._7_1_;
    uVar132 = *local_1a88;
    uStack_1920 = local_1a88[1];
    local_1938 = local_1ac8;
    uStack_1930 = uStack_1ac0;
    local_1928._0_1_ = (undefined1)uVar132;
    local_1928._1_1_ = (undefined1)(uVar132 >> 8);
    local_1928._2_1_ = (undefined1)(uVar132 >> 0x10);
    local_1928._3_1_ = (undefined1)(uVar132 >> 0x18);
    local_1928._4_1_ = (undefined1)(uVar132 >> 0x20);
    local_1928._5_1_ = (undefined1)(uVar132 >> 0x28);
    local_1928._6_1_ = (undefined1)(uVar132 >> 0x30);
    local_1928._7_1_ = (undefined1)(uVar132 >> 0x38);
    local_1d18 = (undefined1)local_1928;
    cStack_1d17 = (char)local_1708;
    uStack_1d16 = local_1928._1_1_;
    cStack_1d15 = local_1708._1_1_;
    uStack_1d14 = local_1928._2_1_;
    cStack_1d13 = local_1708._2_1_;
    uStack_1d12 = local_1928._3_1_;
    cStack_1d11 = local_1708._3_1_;
    uStack_1d10 = local_1928._4_1_;
    cStack_1d0f = local_1708._4_1_;
    uStack_1d0e = local_1928._5_1_;
    cStack_1d0d = local_1708._5_1_;
    uStack_1d0c = local_1928._6_1_;
    cStack_1d0b = local_1708._6_1_;
    uStack_1d0a = local_1928._7_1_;
    cStack_1d09 = local_1708._7_1_;
    uVar133 = *local_1a80;
    uStack_1940 = local_1a80[1];
    local_1958 = local_1ac8;
    uStack_1950 = uStack_1ac0;
    local_1948._0_1_ = (undefined1)uVar133;
    local_1948._1_1_ = (undefined1)(uVar133 >> 8);
    local_1948._2_1_ = (undefined1)(uVar133 >> 0x10);
    local_1948._3_1_ = (undefined1)(uVar133 >> 0x18);
    local_1948._4_1_ = (undefined1)(uVar133 >> 0x20);
    local_1948._5_1_ = (undefined1)(uVar133 >> 0x28);
    local_1948._6_1_ = (undefined1)(uVar133 >> 0x30);
    local_1948._7_1_ = (undefined1)(uVar133 >> 0x38);
    local_1d08 = (undefined1)local_1948;
    cStack_1d07 = (char)local_1708;
    uStack_1d06 = local_1948._1_1_;
    cStack_1d05 = local_1708._1_1_;
    uStack_1d04 = local_1948._2_1_;
    cStack_1d03 = local_1708._2_1_;
    uStack_1d02 = local_1948._3_1_;
    cStack_1d01 = local_1708._3_1_;
    uStack_1d00 = local_1948._4_1_;
    cStack_1cff = local_1708._4_1_;
    uStack_1cfe = local_1948._5_1_;
    cStack_1cfd = local_1708._5_1_;
    uStack_1cfc = local_1948._6_1_;
    cStack_1cfb = local_1708._6_1_;
    uStack_1cfa = local_1948._7_1_;
    cStack_1cf9 = local_1708._7_1_;
    uVar1 = *local_1a78;
    uStack_1960 = local_1a78[1];
    local_1978 = local_1ac8;
    uStack_1970 = uStack_1ac0;
    local_1968._0_1_ = (undefined1)uVar1;
    local_1968._1_1_ = (undefined1)(uVar1 >> 8);
    local_1968._2_1_ = (undefined1)(uVar1 >> 0x10);
    local_1968._3_1_ = (undefined1)(uVar1 >> 0x18);
    local_1968._4_1_ = (undefined1)(uVar1 >> 0x20);
    local_1968._5_1_ = (undefined1)(uVar1 >> 0x28);
    local_1968._6_1_ = (undefined1)(uVar1 >> 0x30);
    local_1968._7_1_ = (undefined1)(uVar1 >> 0x38);
    local_1cf8 = (undefined1)local_1968;
    cStack_1cf7 = (char)local_1708;
    uStack_1cf6 = local_1968._1_1_;
    cStack_1cf5 = local_1708._1_1_;
    uStack_1cf4 = local_1968._2_1_;
    cStack_1cf3 = local_1708._2_1_;
    uStack_1cf2 = local_1968._3_1_;
    cStack_1cf1 = local_1708._3_1_;
    uStack_1cf0 = local_1968._4_1_;
    cStack_1cef = local_1708._4_1_;
    uStack_1cee = local_1968._5_1_;
    cStack_1ced = local_1708._5_1_;
    uStack_1cec = local_1968._6_1_;
    cStack_1ceb = local_1708._6_1_;
    uStack_1cea = local_1968._7_1_;
    cStack_1ce9 = local_1708._7_1_;
    uVar2 = *local_1a70;
    uStack_1980 = local_1a70[1];
    local_1998 = local_1ac8;
    uStack_1990 = uStack_1ac0;
    local_1988._0_1_ = (undefined1)uVar2;
    local_1988._1_1_ = (undefined1)((ulong)uVar2 >> 8);
    local_1988._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
    local_1988._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
    local_1988._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
    local_1988._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
    local_1988._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
    local_1988._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
    local_1ce8 = (undefined1)local_1988;
    cStack_1ce7 = (char)local_1708;
    uStack_1ce6 = local_1988._1_1_;
    cStack_1ce5 = local_1708._1_1_;
    uStack_1ce4 = local_1988._2_1_;
    cStack_1ce3 = local_1708._2_1_;
    uStack_1ce2 = local_1988._3_1_;
    cStack_1ce1 = local_1708._3_1_;
    uStack_1ce0 = local_1988._4_1_;
    cStack_1cdf = local_1708._4_1_;
    uStack_1cde = local_1988._5_1_;
    cStack_1cdd = local_1708._5_1_;
    uStack_1cdc = local_1988._6_1_;
    cStack_1cdb = local_1708._6_1_;
    uStack_1cda = local_1988._7_1_;
    cStack_1cd9 = local_1708._7_1_;
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_18c8._5_1_,CONCAT11(local_1708._4_1_,local_18c8._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_18c8._6_1_,uVar9));
    local_1cd8 = CONCAT17(local_1708._7_1_,CONCAT16(local_18c8._7_1_,uVar10));
    uStack_1cd0 = 0;
    uVar24 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_18e8._5_1_,CONCAT11(local_1708._4_1_,local_18e8._4_1_)));
    uVar25 = CONCAT15(local_1708._6_1_,CONCAT14(local_18e8._6_1_,uVar24));
    local_1cc8 = CONCAT17(local_1708._7_1_,CONCAT16(local_18e8._7_1_,uVar25));
    uStack_1cc0 = 0;
    uVar39 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1908._5_1_,CONCAT11(local_1708._4_1_,local_1908._4_1_)));
    uVar40 = CONCAT15(local_1708._6_1_,CONCAT14(local_1908._6_1_,uVar39));
    local_1cb8 = CONCAT17(local_1708._7_1_,CONCAT16(local_1908._7_1_,uVar40));
    uStack_1cb0 = 0;
    uVar50 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1928._5_1_,CONCAT11(local_1708._4_1_,local_1928._4_1_)));
    uVar51 = CONCAT15(local_1708._6_1_,CONCAT14(local_1928._6_1_,uVar50));
    local_1ca8 = CONCAT17(local_1708._7_1_,CONCAT16(local_1928._7_1_,uVar51));
    uStack_1ca0 = 0;
    local_1c98 = CONCAT17(local_1708._7_1_,
                          CONCAT16(local_1948._7_1_,
                                   CONCAT15(local_1708._6_1_,
                                            CONCAT14(local_1948._6_1_,
                                                     CONCAT13(local_1708._5_1_,
                                                              CONCAT12(local_1948._5_1_,
                                                                       CONCAT11(local_1708._4_1_,
                                                                                local_1948._4_1_))))
                                           )));
    uStack_1c90 = 0;
    uVar59 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1968._5_1_,CONCAT11(local_1708._4_1_,local_1968._4_1_)));
    uVar60 = CONCAT15(local_1708._6_1_,CONCAT14(local_1968._6_1_,uVar59));
    local_1c88 = CONCAT17(local_1708._7_1_,CONCAT16(local_1968._7_1_,uVar60));
    uStack_1c80 = 0;
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_1928._1_1_,CONCAT11((char)local_1708,(undefined1)local_1928)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_1928._2_1_,uVar4));
    uVar47 = CONCAT17(local_1708._3_1_,CONCAT16(local_1928._3_1_,uVar5));
    uVar12 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1928._5_1_,CONCAT11(local_1708._4_1_,local_1928._4_1_)));
    uVar13 = CONCAT15(local_1708._6_1_,CONCAT14(local_1928._6_1_,uVar12));
    uVar52 = CONCAT17(local_1708._7_1_,CONCAT16(local_1928._7_1_,uVar13));
    uVar18 = CONCAT13(local_1708._1_1_,
                      CONCAT12(local_1948._1_1_,CONCAT11((char)local_1708,(undefined1)local_1948)));
    uVar19 = CONCAT15(local_1708._2_1_,CONCAT14(local_1948._2_1_,uVar18));
    uVar55 = CONCAT17(local_1708._3_1_,CONCAT16(local_1948._3_1_,uVar19));
    uVar27 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1948._5_1_,CONCAT11(local_1708._4_1_,local_1948._4_1_)));
    uVar28 = CONCAT15(local_1708._6_1_,CONCAT14(local_1948._6_1_,uVar27));
    uVar56 = CONCAT17(local_1708._7_1_,CONCAT16(local_1948._7_1_,uVar28));
    uVar34 = CONCAT13(local_1708._1_1_,
                      CONCAT12(local_1968._1_1_,CONCAT11((char)local_1708,(undefined1)local_1968)));
    uVar35 = CONCAT15(local_1708._2_1_,CONCAT14(local_1968._2_1_,uVar34));
    uVar57 = CONCAT17(local_1708._3_1_,CONCAT16(local_1968._3_1_,uVar35));
    uVar42 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1968._5_1_,CONCAT11(local_1708._4_1_,local_1968._4_1_)));
    uVar43 = CONCAT15(local_1708._6_1_,CONCAT14(local_1968._6_1_,uVar42));
    uVar61 = CONCAT17(local_1708._7_1_,CONCAT16(local_1968._7_1_,uVar43));
    local_7a8._2_2_ = (short)((uint)uVar18 >> 0x10);
    local_7a8._4_2_ = (short)((uint6)uVar19 >> 0x20);
    local_7a8._6_2_ = (short)((ulong)uVar55 >> 0x30);
    uStack_7a0._2_2_ = (short)((uint)uVar27 >> 0x10);
    uStack_7a0._4_2_ = (short)((uint6)uVar28 >> 0x20);
    uStack_7a0._6_2_ = (short)((ulong)uVar56 >> 0x30);
    local_7b8._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_7b8._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_7b8._6_2_ = (short)((ulong)uVar47 >> 0x30);
    uStack_7b0._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_7b0._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_7b0._6_2_ = (short)((ulong)uVar52 >> 0x30);
    local_7d8 = CONCAT11((char)local_1708,(undefined1)local_1948) +
                CONCAT11((char)local_1708,(undefined1)local_1928);
    sStack_7d6 = local_7a8._2_2_ + local_7b8._2_2_;
    sStack_7d4 = local_7a8._4_2_ + local_7b8._4_2_;
    sStack_7d2 = local_7a8._6_2_ + local_7b8._6_2_;
    sStack_7d0 = CONCAT11(local_1708._4_1_,local_1948._4_1_) +
                 CONCAT11(local_1708._4_1_,local_1928._4_1_);
    sStack_7ce = uStack_7a0._2_2_ + uStack_7b0._2_2_;
    sStack_7cc = uStack_7a0._4_2_ + uStack_7b0._4_2_;
    sStack_7ca = uStack_7a0._6_2_ + uStack_7b0._6_2_;
    local_7c8._2_2_ = (short)((uint)uVar34 >> 0x10);
    local_7c8._4_2_ = (short)((uint6)uVar35 >> 0x20);
    local_7c8._6_2_ = (short)((ulong)uVar57 >> 0x30);
    uStack_7c0._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_7c0._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_7c0._6_2_ = (short)((ulong)uVar61 >> 0x30);
    local_878 = CONCAT11((char)local_1708,(undefined1)local_1968) + local_7d8;
    sStack_870 = CONCAT11(local_1708._4_1_,local_1968._4_1_) + sStack_7d0;
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_18c8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18c8)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_18c8._2_1_,uVar4));
    uVar3 = CONCAT17(local_1708._3_1_,CONCAT16(local_18c8._3_1_,uVar5));
    uVar12 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_18c8._5_1_,CONCAT11(local_1708._4_1_,local_18c8._4_1_)));
    uVar13 = CONCAT15(local_1708._6_1_,CONCAT14(local_18c8._6_1_,uVar12));
    uVar11 = CONCAT17(local_1708._7_1_,CONCAT16(local_18c8._7_1_,uVar13));
    uVar18 = CONCAT13(local_1708._1_1_,
                      CONCAT12(local_18e8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18e8)));
    uVar19 = CONCAT15(local_1708._2_1_,CONCAT14(local_18e8._2_1_,uVar18));
    uVar17 = CONCAT17(local_1708._3_1_,CONCAT16(local_18e8._3_1_,uVar19));
    uVar27 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_18e8._5_1_,CONCAT11(local_1708._4_1_,local_18e8._4_1_)));
    uVar28 = CONCAT15(local_1708._6_1_,CONCAT14(local_18e8._6_1_,uVar27));
    uVar26 = CONCAT17(local_1708._7_1_,CONCAT16(local_18e8._7_1_,uVar28));
    uVar34 = CONCAT13(local_1708._1_1_,
                      CONCAT12(local_1908._1_1_,CONCAT11((char)local_1708,(undefined1)local_1908)));
    uVar35 = CONCAT15(local_1708._2_1_,CONCAT14(local_1908._2_1_,uVar34));
    uVar33 = CONCAT17(local_1708._3_1_,CONCAT16(local_1908._3_1_,uVar35));
    uVar42 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1908._5_1_,CONCAT11(local_1708._4_1_,local_1908._4_1_)));
    uVar43 = CONCAT15(local_1708._6_1_,CONCAT14(local_1908._6_1_,uVar42));
    uVar41 = CONCAT17(local_1708._7_1_,CONCAT16(local_1908._7_1_,uVar43));
    local_7e8._2_2_ = (short)((uint)uVar34 >> 0x10);
    local_7e8._4_2_ = (short)((uint6)uVar35 >> 0x20);
    local_7e8._6_2_ = (short)((ulong)uVar33 >> 0x30);
    uStack_7e0._2_2_ = (short)((uint)uVar42 >> 0x10);
    uStack_7e0._4_2_ = (short)((uint6)uVar43 >> 0x20);
    uStack_7e0._6_2_ = (short)((ulong)uVar41 >> 0x30);
    local_7f8._2_2_ = (short)((uint)uVar18 >> 0x10);
    local_7f8._4_2_ = (short)((uint6)uVar19 >> 0x20);
    local_7f8._6_2_ = (short)((ulong)uVar17 >> 0x30);
    uStack_7f0._2_2_ = (short)((uint)uVar27 >> 0x10);
    uStack_7f0._4_2_ = (short)((uint6)uVar28 >> 0x20);
    uStack_7f0._6_2_ = (short)((ulong)uVar26 >> 0x30);
    local_818 = CONCAT11((char)local_1708,(undefined1)local_1908) +
                CONCAT11((char)local_1708,(undefined1)local_18e8);
    sStack_816 = local_7e8._2_2_ + local_7f8._2_2_;
    sStack_814 = local_7e8._4_2_ + local_7f8._4_2_;
    sStack_812 = local_7e8._6_2_ + local_7f8._6_2_;
    sStack_810 = CONCAT11(local_1708._4_1_,local_1908._4_1_) +
                 CONCAT11(local_1708._4_1_,local_18e8._4_1_);
    sStack_80e = uStack_7e0._2_2_ + uStack_7f0._2_2_;
    sStack_80c = uStack_7e0._4_2_ + uStack_7f0._4_2_;
    sStack_80a = uStack_7e0._6_2_ + uStack_7f0._6_2_;
    local_808._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_808._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_808._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_800._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_800._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_800._6_2_ = (short)((ulong)uVar11 >> 0x30);
    local_8b8 = CONCAT11((char)local_1708,(undefined1)local_18c8) + local_818;
    local_808._2_2_ = local_808._2_2_ + sStack_816;
    local_808._4_2_ = local_808._4_2_ + sStack_814;
    local_808._6_2_ = local_808._6_2_ + sStack_812;
    sStack_8b0 = CONCAT11(local_1708._4_1_,local_18c8._4_1_) + sStack_810;
    sStack_8ae = uStack_800._2_2_ + sStack_80e;
    sStack_8ac = uStack_800._4_2_ + sStack_80c;
    sStack_8aa = uStack_800._6_2_ + sStack_80a;
    local_828 = CONCAT26(local_7c8._6_2_ + sStack_7d2,
                         CONCAT24(local_7c8._4_2_ + sStack_7d4,
                                  CONCAT22(local_7c8._2_2_ + sStack_7d6,local_878)));
    uStack_820 = CONCAT26(uStack_7c0._6_2_ + sStack_7ca,
                          CONCAT24(uStack_7c0._4_2_ + sStack_7cc,
                                   CONCAT22(uStack_7c0._2_2_ + sStack_7ce,sStack_870)));
    local_838 = CONCAT26(local_808._6_2_,
                         CONCAT24(local_808._4_2_,CONCAT22(local_808._2_2_,local_8b8)));
    uStack_830 = CONCAT26(sStack_8aa,CONCAT24(sStack_8ac,CONCAT22(sStack_8ae,sStack_8b0)));
    local_878 = local_878 + local_8b8;
    sStack_876 = local_7c8._2_2_ + sStack_7d6 + local_808._2_2_;
    sStack_874 = local_7c8._4_2_ + sStack_7d4 + local_808._4_2_;
    sStack_872 = local_7c8._6_2_ + sStack_7d2 + local_808._6_2_;
    sStack_870 = sStack_870 + sStack_8b0;
    sStack_86e = uStack_7c0._2_2_ + sStack_7ce + sStack_8ae;
    sStack_86c = uStack_7c0._4_2_ + sStack_7cc + sStack_8ac;
    sStack_86a = uStack_7c0._6_2_ + sStack_7ca + sStack_8aa;
    local_898 = CONCAT26(sStack_8aa,CONCAT24(sStack_8ac,CONCAT22(sStack_8ae,sStack_8b0)));
    local_858 = CONCAT26(sStack_86a,CONCAT24(sStack_86c,CONCAT22(sStack_86e,sStack_870)));
    local_848 = CONCAT26(sStack_872,CONCAT24(sStack_874,CONCAT22(sStack_876,local_878)));
    uStack_840 = CONCAT26(sStack_86a,CONCAT24(sStack_86c,CONCAT22(sStack_86e,sStack_870)));
    uStack_850 = 0;
    local_878 = local_878 + sStack_870;
    sStack_876 = sStack_876 + sStack_86e;
    sStack_874 = sStack_874 + sStack_86c;
    sStack_872 = sStack_872 + sStack_86a;
    local_1ee8 = local_878 + 8;
    sStack_1ee6 = sStack_876 + 8;
    sStack_1ee4 = sStack_874 + 8;
    sStack_1ee2 = sStack_872 + 8;
    sStack_1ef0 = sStack_870 + 8;
    sStack_1eee = sStack_86e + 8;
    sStack_1eec = sStack_86c + 8;
    sStack_1eea = sStack_86a + 8;
    local_888 = CONCAT26(local_808._6_2_,
                         CONCAT24(local_808._4_2_,CONCAT22(local_808._2_2_,local_8b8)));
    uStack_880 = CONCAT26(sStack_8aa,CONCAT24(sStack_8ac,CONCAT22(sStack_8ae,sStack_8b0)));
    uStack_890 = 0;
    local_8b8 = local_8b8 + sStack_8b0;
    sStack_8b6 = local_808._2_2_ + sStack_8ae;
    sStack_8b4 = local_808._4_2_ + sStack_8ac;
    sStack_8b2 = local_808._6_2_ + sStack_8aa;
    local_1f08 = local_8b8 + 4;
    sStack_1f06 = sStack_8b6 + 4;
    sStack_1f04 = sStack_8b4 + 4;
    sStack_1f02 = sStack_8b2 + 4;
    sStack_1f00 = sStack_8b0 + 4;
    sStack_1efe = sStack_8ae + 4;
    sStack_1efc = sStack_8ac + 4;
    sStack_1efa = sStack_8aa + 4;
    local_8e8 = CONCAT26(sStack_1f02,CONCAT24(sStack_1f04,CONCAT22(sStack_1f06,local_1f08)));
    uStack_8e0 = CONCAT26(sStack_1efa,CONCAT24(sStack_1efc,CONCAT22(sStack_1efe,sStack_1f00)));
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_18c8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18c8)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_18c8._2_1_,uVar4));
    uVar6 = CONCAT17(local_1708._3_1_,CONCAT16(local_18c8._3_1_,uVar5));
    uVar12 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_18c8._5_1_,CONCAT11(local_1708._4_1_,local_18c8._4_1_)));
    uVar13 = CONCAT15(local_1708._6_1_,CONCAT14(local_18c8._6_1_,uVar12));
    uVar14 = CONCAT17(local_1708._7_1_,CONCAT16(local_18c8._7_1_,uVar13));
    uVar18 = CONCAT13(local_1708._1_1_,
                      CONCAT12(local_1928._1_1_,CONCAT11((char)local_1708,(undefined1)local_1928)));
    uVar19 = CONCAT15(local_1708._2_1_,CONCAT14(local_1928._2_1_,uVar18));
    uVar48 = CONCAT17(local_1708._3_1_,CONCAT16(local_1928._3_1_,uVar19));
    uVar27 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1928._5_1_,CONCAT11(local_1708._4_1_,local_1928._4_1_)));
    uVar28 = CONCAT15(local_1708._6_1_,CONCAT14(local_1928._6_1_,uVar27));
    uVar53 = CONCAT17(local_1708._7_1_,CONCAT16(local_1928._7_1_,uVar28));
    local_8c8._2_2_ = (short)((uint)uVar18 >> 0x10);
    local_8c8._4_2_ = (short)((uint6)uVar19 >> 0x20);
    local_8c8._6_2_ = (short)((ulong)uVar48 >> 0x30);
    uStack_8c0._2_2_ = (short)((uint)uVar27 >> 0x10);
    uStack_8c0._4_2_ = (short)((uint6)uVar28 >> 0x20);
    uStack_8c0._6_2_ = (short)((ulong)uVar53 >> 0x30);
    local_8d8._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_8d8._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_8d8._6_2_ = (short)((ulong)uVar6 >> 0x30);
    uStack_8d0._2_2_ = (short)((uint)uVar12 >> 0x10);
    uStack_8d0._4_2_ = (short)((uint6)uVar13 >> 0x20);
    uStack_8d0._6_2_ = (short)((ulong)uVar14 >> 0x30);
    local_8f8 = CONCAT11((char)local_1708,(undefined1)local_1928) +
                CONCAT11((char)local_1708,(undefined1)local_18c8);
    sStack_8f6 = local_8c8._2_2_ + local_8d8._2_2_;
    sStack_8f4 = local_8c8._4_2_ + local_8d8._4_2_;
    sStack_8f2 = local_8c8._6_2_ + local_8d8._6_2_;
    sStack_8f0 = CONCAT11(local_1708._4_1_,local_1928._4_1_) +
                 CONCAT11(local_1708._4_1_,local_18c8._4_1_);
    sStack_8ee = uStack_8c0._2_2_ + uStack_8d0._2_2_;
    sStack_8ec = uStack_8c0._4_2_ + uStack_8d0._4_2_;
    sStack_8ea = uStack_8c0._6_2_ + uStack_8d0._6_2_;
    local_1db8 = local_1f08 + local_8f8;
    uStack_1db6 = sStack_1f06 + sStack_8f6;
    uStack_1db4 = sStack_1f04 + sStack_8f4;
    uStack_1db2 = sStack_1f02 + sStack_8f2;
    sStack_1db0 = sStack_1f00 + sStack_8f0;
    sStack_1dae = sStack_1efe + sStack_8ee;
    sStack_1dac = sStack_1efc + sStack_8ec;
    sStack_1daa = sStack_1efa + sStack_8ea;
    local_928 = CONCAT26(sStack_1f02,CONCAT24(sStack_1f04,CONCAT22(sStack_1f06,local_1f08)));
    uStack_920 = CONCAT26(sStack_1efa,CONCAT24(sStack_1efc,CONCAT22(sStack_1efe,sStack_1f00)));
    uStack_900 = 0;
    uStack_910 = 0;
    local_908._2_2_ = (short)((uint)uVar50 >> 0x10);
    local_908._4_2_ = (short)((uint6)uVar51 >> 0x20);
    local_908._6_2_ = (short)((ulong)local_1ca8 >> 0x30);
    local_918._2_2_ = (short)((uint)uVar9 >> 0x10);
    local_918._4_2_ = (short)((uint6)uVar10 >> 0x20);
    local_918._6_2_ = (short)((ulong)local_1cd8 >> 0x30);
    local_938 = CONCAT11(local_1708._4_1_,local_1928._4_1_) +
                CONCAT11(local_1708._4_1_,local_18c8._4_1_);
    sStack_936 = local_908._2_2_ + local_918._2_2_;
    sStack_934 = local_908._4_2_ + local_918._4_2_;
    sStack_932 = local_908._6_2_ + local_918._6_2_;
    uStack_930 = 0;
    uStack_92e = 0;
    uStack_92c = 0;
    uStack_92a = 0;
    local_1de8 = local_1f08 + local_938;
    uStack_1de6 = sStack_1f06 + sStack_936;
    uStack_1de4 = sStack_1f04 + sStack_934;
    uStack_1de2 = sStack_1f02 + sStack_932;
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_1988._1_1_,CONCAT11((char)local_1708,(undefined1)local_1988)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_1988._2_1_,uVar4));
    local_958 = CONCAT17(local_1708._3_1_,CONCAT16(local_1988._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_1988._5_1_,CONCAT11(local_1708._4_1_,local_1988._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_1988._6_1_,uVar9));
    uStack_950 = CONCAT17(local_1708._7_1_,CONCAT16(local_1988._7_1_,uVar10));
    local_948._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_948._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_948._6_2_ = (short)((ulong)local_958 >> 0x30);
    uStack_940._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_940._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_940._6_2_ = (short)((ulong)uStack_950 >> 0x30);
    local_1d78 = CONCAT11((char)local_1708,(undefined1)local_1988) * 2;
    sStack_1d76 = local_948._2_2_ * 2;
    sStack_1d74 = local_948._4_2_ * 2;
    sStack_1d72 = local_948._6_2_ * 2;
    sStack_1d70 = CONCAT11(local_1708._4_1_,local_1988._4_1_) * 2;
    sStack_1d6e = uStack_940._2_2_ * 2;
    sStack_1d6c = uStack_940._4_2_ * 2;
    sStack_1d6a = uStack_940._6_2_ * 2;
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_1928._1_1_,CONCAT11((char)local_1708,(undefined1)local_1928)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_1928._2_1_,uVar4));
    local_978 = CONCAT17(local_1708._3_1_,CONCAT16(local_1928._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_1928._5_1_,CONCAT11(local_1708._4_1_,local_1928._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_1928._6_1_,uVar9));
    uStack_970 = CONCAT17(local_1708._7_1_,CONCAT16(local_1928._7_1_,uVar10));
    local_968._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_968._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_968._6_2_ = (short)((ulong)local_978 >> 0x30);
    uStack_960._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_960._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_960._6_2_ = (short)((ulong)uStack_970 >> 0x30);
    local_1d88 = CONCAT11((char)local_1708,(undefined1)local_1928) * 2;
    sStack_1d86 = local_968._2_2_ * 2;
    sStack_1d84 = local_968._4_2_ * 2;
    sStack_1d82 = local_968._6_2_ * 2;
    sStack_1d80 = CONCAT11(local_1708._4_1_,local_1928._4_1_) * 2;
    sStack_1d7e = uStack_960._2_2_ * 2;
    sStack_1d7c = uStack_960._4_2_ * 2;
    sStack_1d7a = uStack_960._6_2_ * 2;
    local_5e8 = CONCAT26(sStack_1ee2,CONCAT24(sStack_1ee4,CONCAT22(sStack_1ee6,local_1ee8)));
    uStack_5e0 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_1968._1_1_,CONCAT11((char)local_1708,(undefined1)local_1968)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_1968._2_1_,uVar4));
    uVar58 = CONCAT17(local_1708._3_1_,CONCAT16(local_1968._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_1968._5_1_,CONCAT11(local_1708._4_1_,local_1968._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_1968._6_1_,uVar9));
    uVar62 = CONCAT17(local_1708._7_1_,CONCAT16(local_1968._7_1_,uVar10));
    local_5f8._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_5f8._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_5f8._6_2_ = (short)((ulong)uVar58 >> 0x30);
    uStack_5f0._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_5f0._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_5f0._6_2_ = (short)((ulong)uVar62 >> 0x30);
    local_1f28._0_4_ =
         CONCAT22(sStack_1ee6 - local_5f8._2_2_,
                  local_1ee8 - CONCAT11((char)local_1708,(undefined1)local_1968));
    local_1f28._0_6_ = CONCAT24(sStack_1ee4 - local_5f8._4_2_,(undefined4)local_1f28);
    local_1f28 = CONCAT26(sStack_1ee2 - local_5f8._6_2_,(undefined6)local_1f28);
    uStack_1f20._0_4_ =
         CONCAT22(sStack_1eee - uStack_5f0._2_2_,
                  sStack_1ef0 - CONCAT11(local_1708._4_1_,local_1968._4_1_));
    uStack_1f20._0_6_ = CONCAT24(sStack_1eec - uStack_5f0._4_2_,(undefined4)uStack_1f20);
    uStack_1f20 = CONCAT26(sStack_1eea - uStack_5f0._6_2_,(undefined6)uStack_1f20);
    local_608 = CONCAT26(sStack_1ee2,CONCAT24(sStack_1ee4,CONCAT22(sStack_1ee6,local_1ee8)));
    uStack_600 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
    uStack_610 = 0;
    local_618._2_2_ = (short)((uint)uVar59 >> 0x10);
    local_618._4_2_ = (short)((uint6)uVar60 >> 0x20);
    local_618._6_2_ = (short)((ulong)local_1c88 >> 0x30);
    local_1ef8 = local_1ee8 - CONCAT11(local_1708._4_1_,local_1968._4_1_);
    sStack_1ef6 = sStack_1ee6 - local_618._2_2_;
    sStack_1ef4 = sStack_1ee4 - local_618._4_2_;
    sStack_1ef2 = sStack_1ee2 - local_618._6_2_;
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_18c8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18c8)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_18c8._2_1_,uVar4));
    uVar7 = CONCAT17(local_1708._3_1_,CONCAT16(local_18c8._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_18c8._5_1_,CONCAT11(local_1708._4_1_,local_18c8._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_18c8._6_1_,uVar9));
    uVar15 = CONCAT17(local_1708._7_1_,CONCAT16(local_18c8._7_1_,uVar10));
    uVar12 = CONCAT13(local_1708._1_1_,
                      CONCAT12(local_1988._1_1_,CONCAT11((char)local_1708,(undefined1)local_1988)));
    uVar13 = CONCAT15(local_1708._2_1_,CONCAT14(local_1988._2_1_,uVar12));
    uVar63 = CONCAT17(local_1708._3_1_,CONCAT16(local_1988._3_1_,uVar13));
    uVar18 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1988._5_1_,CONCAT11(local_1708._4_1_,local_1988._4_1_)));
    uVar19 = CONCAT15(local_1708._6_1_,CONCAT14(local_1988._6_1_,uVar18));
    uVar64 = CONCAT17(local_1708._7_1_,CONCAT16(local_1988._7_1_,uVar19));
    local_988._2_2_ = (short)((uint)uVar12 >> 0x10);
    local_988._4_2_ = (short)((uint6)uVar13 >> 0x20);
    local_988._6_2_ = (short)((ulong)uVar63 >> 0x30);
    uStack_980._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_980._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_980._6_2_ = (short)((ulong)uVar64 >> 0x30);
    local_998._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_998._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_998._6_2_ = (short)((ulong)uVar7 >> 0x30);
    uStack_990._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_990._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_990._6_2_ = (short)((ulong)uVar15 >> 0x30);
    local_9a8 = CONCAT11((char)local_1708,(undefined1)local_1988) +
                CONCAT11((char)local_1708,(undefined1)local_18c8);
    sStack_9a6 = local_988._2_2_ + local_998._2_2_;
    sStack_9a4 = local_988._4_2_ + local_998._4_2_;
    sStack_9a2 = local_988._6_2_ + local_998._6_2_;
    sStack_9a0 = CONCAT11(local_1708._4_1_,local_1988._4_1_) +
                 CONCAT11(local_1708._4_1_,local_18c8._4_1_);
    sStack_99e = uStack_980._2_2_ + uStack_990._2_2_;
    sStack_99c = uStack_980._4_2_ + uStack_990._4_2_;
    sStack_99a = uStack_980._6_2_ + uStack_990._6_2_;
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_18e8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18e8)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_18e8._2_1_,uVar4));
    uVar20 = CONCAT17(local_1708._3_1_,CONCAT16(local_18e8._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_18e8._5_1_,CONCAT11(local_1708._4_1_,local_18e8._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_18e8._6_1_,uVar9));
    uVar29 = CONCAT17(local_1708._7_1_,CONCAT16(local_18e8._7_1_,uVar10));
    local_9b8._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_9b8._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_9b8._6_2_ = (short)((ulong)uVar20 >> 0x30);
    uStack_9b0._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_9b0._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_9b0._6_2_ = (short)((ulong)uVar29 >> 0x30);
    local_1ec8 = local_9a8 + CONCAT11((char)local_1708,(undefined1)local_18e8);
    sStack_1ec6 = sStack_9a6 + local_9b8._2_2_;
    sStack_1ec4 = sStack_9a4 + local_9b8._4_2_;
    sStack_1ec2 = sStack_9a2 + local_9b8._6_2_;
    sStack_1ec0 = sStack_9a0 + CONCAT11(local_1708._4_1_,local_18e8._4_1_);
    sStack_1ebe = sStack_99e + uStack_9b0._2_2_;
    sStack_1ebc = sStack_99c + uStack_9b0._4_2_;
    sStack_1eba = sStack_99a + uStack_9b0._6_2_;
    local_a08 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
    uStack_a00 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_18c8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18c8)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_18c8._2_1_,uVar4));
    uVar8 = CONCAT17(local_1708._3_1_,CONCAT16(local_18c8._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_18c8._5_1_,CONCAT11(local_1708._4_1_,local_18c8._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_18c8._6_1_,uVar9));
    uVar16 = CONCAT17(local_1708._7_1_,CONCAT16(local_18c8._7_1_,uVar10));
    uVar12 = CONCAT13(local_1708._1_1_,
                      CONCAT12(local_18e8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18e8)));
    uVar13 = CONCAT15(local_1708._2_1_,CONCAT14(local_18e8._2_1_,uVar12));
    uVar21 = CONCAT17(local_1708._3_1_,CONCAT16(local_18e8._3_1_,uVar13));
    uVar18 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_18e8._5_1_,CONCAT11(local_1708._4_1_,local_18e8._4_1_)));
    uVar19 = CONCAT15(local_1708._6_1_,CONCAT14(local_18e8._6_1_,uVar18));
    uVar30 = CONCAT17(local_1708._7_1_,CONCAT16(local_18e8._7_1_,uVar19));
    uVar27 = CONCAT13(local_1708._1_1_,
                      CONCAT12(local_1908._1_1_,CONCAT11((char)local_1708,(undefined1)local_1908)));
    uVar28 = CONCAT15(local_1708._2_1_,CONCAT14(local_1908._2_1_,uVar27));
    uVar36 = CONCAT17(local_1708._3_1_,CONCAT16(local_1908._3_1_,uVar28));
    uVar34 = CONCAT13(local_1708._5_1_,
                      CONCAT12(local_1908._5_1_,CONCAT11(local_1708._4_1_,local_1908._4_1_)));
    uVar35 = CONCAT15(local_1708._6_1_,CONCAT14(local_1908._6_1_,uVar34));
    uVar44 = CONCAT17(local_1708._7_1_,CONCAT16(local_1908._7_1_,uVar35));
    local_9c8._2_2_ = (short)((uint)uVar27 >> 0x10);
    local_9c8._4_2_ = (short)((uint6)uVar28 >> 0x20);
    local_9c8._6_2_ = (short)((ulong)uVar36 >> 0x30);
    uStack_9c0._2_2_ = (short)((uint)uVar34 >> 0x10);
    uStack_9c0._4_2_ = (short)((uint6)uVar35 >> 0x20);
    uStack_9c0._6_2_ = (short)((ulong)uVar44 >> 0x30);
    local_9d8._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_9d8._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_9d8._6_2_ = (short)((ulong)uVar8 >> 0x30);
    uStack_9d0._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_9d0._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_9d0._6_2_ = (short)((ulong)uVar16 >> 0x30);
    local_9f8 = CONCAT11((char)local_1708,(undefined1)local_1908) +
                CONCAT11((char)local_1708,(undefined1)local_18c8);
    sStack_9f6 = local_9c8._2_2_ + local_9d8._2_2_;
    sStack_9f4 = local_9c8._4_2_ + local_9d8._4_2_;
    sStack_9f2 = local_9c8._6_2_ + local_9d8._6_2_;
    sStack_9f0 = CONCAT11(local_1708._4_1_,local_1908._4_1_) +
                 CONCAT11(local_1708._4_1_,local_18c8._4_1_);
    sStack_9ee = uStack_9c0._2_2_ + uStack_9d0._2_2_;
    sStack_9ec = uStack_9c0._4_2_ + uStack_9d0._4_2_;
    sStack_9ea = uStack_9c0._6_2_ + uStack_9d0._6_2_;
    local_9e8._2_2_ = (short)((uint)uVar12 >> 0x10);
    local_9e8._4_2_ = (short)((uint6)uVar13 >> 0x20);
    local_9e8._6_2_ = (short)((ulong)uVar21 >> 0x30);
    uStack_9e0._2_2_ = (short)((uint)uVar18 >> 0x10);
    uStack_9e0._4_2_ = (short)((uint6)uVar19 >> 0x20);
    uStack_9e0._6_2_ = (short)((ulong)uVar30 >> 0x30);
    local_a18 = CONCAT11((char)local_1708,(undefined1)local_18e8) + local_9f8;
    sStack_a16 = local_9e8._2_2_ + sStack_9f6;
    sStack_a14 = local_9e8._4_2_ + sStack_9f4;
    sStack_a12 = local_9e8._6_2_ + sStack_9f2;
    sStack_a10 = CONCAT11(local_1708._4_1_,local_18e8._4_1_) + sStack_9f0;
    sStack_a0e = uStack_9e0._2_2_ + sStack_9ee;
    sStack_a0c = uStack_9e0._4_2_ + sStack_9ec;
    sStack_a0a = uStack_9e0._6_2_ + sStack_9ea;
    local_1ed8 = local_1d78 + local_a18;
    sStack_1ed6 = sStack_1d76 + sStack_a16;
    sStack_1ed4 = sStack_1d74 + sStack_a14;
    sStack_1ed2 = sStack_1d72 + sStack_a12;
    sStack_1ed0 = sStack_1d70 + sStack_a10;
    sStack_1ece = sStack_1d6e + sStack_a0e;
    sStack_1ecc = sStack_1d6c + sStack_a0c;
    sStack_1eca = sStack_1d6a + sStack_a0a;
    local_628 = CONCAT26(sStack_1f02,CONCAT24(sStack_1f04,CONCAT22(sStack_1f06,local_1f08)));
    uStack_620 = CONCAT26(sStack_1efa,CONCAT24(sStack_1efc,CONCAT22(sStack_1efe,sStack_1f00)));
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_1908._1_1_,CONCAT11((char)local_1708,(undefined1)local_1908)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_1908._2_1_,uVar4));
    uVar37 = CONCAT17(local_1708._3_1_,CONCAT16(local_1908._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_1908._5_1_,CONCAT11(local_1708._4_1_,local_1908._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_1908._6_1_,uVar9));
    uVar45 = CONCAT17(local_1708._7_1_,CONCAT16(local_1908._7_1_,uVar10));
    local_638._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_638._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_638._6_2_ = (short)((ulong)uVar37 >> 0x30);
    uStack_630._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_630._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_630._6_2_ = (short)((ulong)uVar45 >> 0x30);
    sVar102 = local_1f08 - CONCAT11((char)local_1708,(undefined1)local_1908);
    local_638._2_2_ = sStack_1f06 - local_638._2_2_;
    local_638._4_2_ = sStack_1f04 - local_638._4_2_;
    local_638._6_2_ = sStack_1f02 - local_638._6_2_;
    sStack_1dd0 = sStack_1f00 - CONCAT11(local_1708._4_1_,local_1908._4_1_);
    sStack_1dce = sStack_1efe - uStack_630._2_2_;
    sStack_1dcc = sStack_1efc - uStack_630._4_2_;
    sStack_1dca = sStack_1efa - uStack_630._6_2_;
    local_1f18._0_4_ = CONCAT22(local_638._2_2_,sVar102);
    local_1f18._0_6_ = CONCAT24(local_638._4_2_,(undefined4)local_1f18);
    local_1f18 = CONCAT26(local_638._6_2_,(undefined6)local_1f18);
    uStack_1f10._0_4_ = CONCAT22(sStack_1dce,sStack_1dd0);
    uStack_1f10._0_6_ = CONCAT24(sStack_1dcc,(undefined4)uStack_1f10);
    uStack_1f10 = CONCAT26(sStack_1dca,(undefined6)uStack_1f10);
    local_648 = CONCAT26(sStack_1f02,CONCAT24(sStack_1f04,CONCAT22(sStack_1f06,local_1f08)));
    uStack_640 = CONCAT26(sStack_1efa,CONCAT24(sStack_1efc,CONCAT22(sStack_1efe,sStack_1f00)));
    uStack_650 = 0;
    local_658._2_2_ = (short)((uint)uVar39 >> 0x10);
    local_658._4_2_ = (short)((uint6)uVar40 >> 0x20);
    local_658._6_2_ = (short)((ulong)local_1cb8 >> 0x30);
    local_1f08 = local_1f08 - CONCAT11(local_1708._4_1_,local_1908._4_1_);
    sStack_1f06 = sStack_1f06 - local_658._2_2_;
    sStack_1f04 = sStack_1f04 - local_658._4_2_;
    sStack_1f02 = sStack_1f02 - local_658._6_2_;
    local_a28 = CONCAT26(sStack_1d82,CONCAT24(sStack_1d84,CONCAT22(sStack_1d86,local_1d88)));
    uStack_a20 = CONCAT26(sStack_1d7a,CONCAT24(sStack_1d7c,CONCAT22(sStack_1d7e,sStack_1d80)));
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_18e8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18e8)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_18e8._2_1_,uVar4));
    uVar22 = CONCAT17(local_1708._3_1_,CONCAT16(local_18e8._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_18e8._5_1_,CONCAT11(local_1708._4_1_,local_18e8._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_18e8._6_1_,uVar9));
    uVar31 = CONCAT17(local_1708._7_1_,CONCAT16(local_18e8._7_1_,uVar10));
    local_a38._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_a38._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_a38._6_2_ = (short)((ulong)uVar22 >> 0x30);
    uStack_a30._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_a30._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_a30._6_2_ = (short)((ulong)uVar31 >> 0x30);
    sVar103 = local_1d88 + CONCAT11((char)local_1708,(undefined1)local_18e8);
    sVar128 = sStack_1d80 + CONCAT11(local_1708._4_1_,local_18e8._4_1_);
    uStack_a30._2_2_ = sStack_1d7e + uStack_a30._2_2_;
    uStack_a30._4_2_ = sStack_1d7c + uStack_a30._4_2_;
    uStack_a30._6_2_ = sStack_1d7a + uStack_a30._6_2_;
    local_a48 = CONCAT26(sStack_1f02,CONCAT24(sStack_1f04,CONCAT22(sStack_1f06,local_1f08)));
    uStack_a40 = CONCAT26(sStack_1efa,CONCAT24(sStack_1efc,CONCAT22(sStack_1efe,sStack_1f00)));
    local_a58 = CONCAT26(sStack_1d82 + local_a38._6_2_,
                         CONCAT24(sStack_1d84 + local_a38._4_2_,
                                  CONCAT22(sStack_1d86 + local_a38._2_2_,sVar103)));
    uStack_a50 = CONCAT26(uStack_a30._6_2_,
                          CONCAT24(uStack_a30._4_2_,CONCAT22(uStack_a30._2_2_,sVar128)));
    local_1da8 = local_1f08 + sVar103;
    uStack_1da6 = sStack_1f06 + sStack_1d86 + local_a38._2_2_;
    uStack_1da4 = sStack_1f04 + sStack_1d84 + local_a38._4_2_;
    uStack_1da2 = sStack_1f02 + sStack_1d82 + local_a38._6_2_;
    sStack_1da0 = sStack_1f00 + sVar128;
    sStack_1d9e = sStack_1efe + uStack_a30._2_2_;
    sStack_1d9c = sStack_1efc + uStack_a30._4_2_;
    sStack_1d9a = sStack_1efa + uStack_a30._6_2_;
    local_a78 = CONCAT26(uStack_a30._6_2_,
                         CONCAT24(uStack_a30._4_2_,CONCAT22(uStack_a30._2_2_,sVar128)));
    local_a68 = local_1f18;
    uStack_a60 = uStack_1f10;
    uStack_a70 = 0;
    local_1dd8 = sVar102 + sVar128;
    uStack_1dd6 = local_638._2_2_ + uStack_a30._2_2_;
    uStack_1dd4 = local_638._4_2_ + uStack_a30._4_2_;
    uStack_1dd2 = local_638._6_2_ + uStack_a30._6_2_;
    local_17a8 = CONCAT26(uStack_1db2,CONCAT24(uStack_1db4,CONCAT22(uStack_1db6,local_1db8)));
    uStack_17a0 = CONCAT26(sStack_1daa,CONCAT24(sStack_1dac,CONCAT22(sStack_1dae,sStack_1db0)));
    local_17b8 = CONCAT26(uStack_1de2,CONCAT24(uStack_1de4,CONCAT22(uStack_1de6,local_1de8)));
    uStack_17b0 = CONCAT26(sStack_1efa,CONCAT24(sStack_1efc,CONCAT22(sStack_1efe,sStack_1f00)));
    local_13bc = 3;
    uVar104 = local_1db8 >> 3;
    uVar115 = uStack_1db6 >> 3;
    uVar119 = uStack_1db4 >> 3;
    uVar124 = uStack_1db2 >> 3;
    uVar129 = local_1de8 >> 3;
    uVar136 = uStack_1de6 >> 3;
    uVar140 = uStack_1de4 >> 3;
    uVar145 = uStack_1de2 >> 3;
    local_1ba8._0_4_ = CONCAT22(uVar115,uVar104);
    local_1ba8._0_6_ = CONCAT24(uVar119,(undefined4)local_1ba8);
    local_1ba8 = CONCAT26(uVar124,(undefined6)local_1ba8);
    uStack_1ba0._0_4_ = CONCAT22(uVar136,uVar129);
    uStack_1ba0._0_6_ = CONCAT24(uVar140,(undefined4)uStack_1ba0);
    uStack_1ba0 = CONCAT26(uVar145,(undefined6)uStack_1ba0);
    local_17c8 = CONCAT26(uStack_1da2,CONCAT24(uStack_1da4,CONCAT22(uStack_1da6,local_1da8)));
    uStack_17c0 = CONCAT26(sStack_1d9a,CONCAT24(sStack_1d9c,CONCAT22(sStack_1d9e,sStack_1da0)));
    local_17d8 = CONCAT26(uStack_1dd2,CONCAT24(uStack_1dd4,CONCAT22(uStack_1dd6,local_1dd8)));
    uStack_17d0 = CONCAT26(sStack_1dca,CONCAT24(sStack_1dcc,CONCAT22(sStack_1dce,sStack_1dd0)));
    local_13dc = 3;
    uVar105 = local_1da8 >> 3;
    uVar116 = uStack_1da6 >> 3;
    uVar120 = uStack_1da4 >> 3;
    uVar125 = uStack_1da2 >> 3;
    uVar130 = local_1dd8 >> 3;
    uVar137 = uStack_1dd6 >> 3;
    uVar141 = uStack_1dd4 >> 3;
    uVar146 = uStack_1dd2 >> 3;
    local_1b98._0_4_ = CONCAT22(uVar116,uVar105);
    local_1b98._0_6_ = CONCAT24(uVar120,(undefined4)local_1b98);
    local_1b98 = CONCAT26(uVar125,(undefined6)local_1b98);
    uStack_1b90._0_4_ = CONCAT22(uVar137,uVar130);
    uStack_1b90._0_6_ = CONCAT24(uVar141,(undefined4)uStack_1b90);
    uStack_1b90 = CONCAT26(uVar146,(undefined6)uStack_1b90);
    local_58 = local_1ba8;
    uStack_50 = uStack_1ba0;
    local_68 = local_1ba8;
    uStack_60 = uStack_1ba0;
    local_1ba8._0_4_ =
         CONCAT13((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                  CONCAT12((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                           CONCAT11((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 -
                                    (0xff < uVar115),
                                    (uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                    (0xff < uVar104))));
    local_1ba8._0_6_ =
         CONCAT15((uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136),
                  CONCAT14((uVar129 != 0) * (uVar129 < 0x100) * (char)uVar129 - (0xff < uVar129),
                           (undefined4)local_1ba8));
    local_1ba8 = CONCAT17((uVar145 != 0) * (uVar145 < 0x100) * (char)uVar145 - (0xff < uVar145),
                          CONCAT16((uVar140 != 0) * (uVar140 < 0x100) * (char)uVar140 -
                                   (0xff < uVar140),(undefined6)local_1ba8));
    uStack_1ba0._0_4_ =
         CONCAT13((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                  CONCAT12((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                           CONCAT11((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 -
                                    (0xff < uVar115),
                                    (uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                    (0xff < uVar104))));
    uStack_1ba0._0_6_ =
         CONCAT15((uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136),
                  CONCAT14((uVar129 != 0) * (uVar129 < 0x100) * (char)uVar129 - (0xff < uVar129),
                           (undefined4)uStack_1ba0));
    uStack_1ba0 = CONCAT17((uVar145 != 0) * (uVar145 < 0x100) * (char)uVar145 - (0xff < uVar145),
                           CONCAT16((uVar140 != 0) * (uVar140 < 0x100) * (char)uVar140 -
                                    (0xff < uVar140),(undefined6)uStack_1ba0));
    local_78 = local_1b98;
    uStack_70 = uStack_1b90;
    local_88 = local_1b98;
    uStack_80 = uStack_1b90;
    local_1b98._0_4_ =
         CONCAT13((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar125 - (0xff < uVar125),
                  CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120),
                           CONCAT11((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 -
                                    (0xff < uVar116),
                                    (uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 -
                                    (0xff < uVar105))));
    local_1b98._0_6_ =
         CONCAT15((uVar137 != 0) * (uVar137 < 0x100) * (char)uVar137 - (0xff < uVar137),
                  CONCAT14((uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130),
                           (undefined4)local_1b98));
    local_1b98 = CONCAT17((uVar146 != 0) * (uVar146 < 0x100) * (char)uVar146 - (0xff < uVar146),
                          CONCAT16((uVar141 != 0) * (uVar141 < 0x100) * (char)uVar141 -
                                   (0xff < uVar141),(undefined6)local_1b98));
    uStack_1b90._0_4_ =
         CONCAT13((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar125 - (0xff < uVar125),
                  CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120),
                           CONCAT11((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 -
                                    (0xff < uVar116),
                                    (uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 -
                                    (0xff < uVar105))));
    uStack_1b90._0_6_ =
         CONCAT15((uVar137 != 0) * (uVar137 < 0x100) * (char)uVar137 - (0xff < uVar137),
                  CONCAT14((uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130),
                           (undefined4)uStack_1b90));
    uStack_1b90 = CONCAT17((uVar146 != 0) * (uVar146 < 0x100) * (char)uVar146 - (0xff < uVar146),
                           CONCAT16((uVar141 != 0) * (uVar141 < 0x100) * (char)uVar141 -
                                    (0xff < uVar141),(undefined6)uStack_1b90));
    local_668 = CONCAT26(sStack_1f02,CONCAT24(sStack_1f04,CONCAT22(sStack_1f06,local_1f08)));
    uStack_660 = CONCAT26(sStack_1efa,CONCAT24(sStack_1efc,CONCAT22(sStack_1efe,sStack_1f00)));
    uStack_670 = 0;
    local_678._2_2_ = (short)((uint)uVar24 >> 0x10);
    local_678._4_2_ = (short)((uint6)uVar25 >> 0x20);
    local_678._6_2_ = (short)((ulong)local_1cc8 >> 0x30);
    local_1f08 = local_1f08 - CONCAT11(local_1708._4_1_,local_18e8._4_1_);
    sStack_1f06 = sStack_1f06 - local_678._2_2_;
    sStack_1f04 = sStack_1f04 - local_678._4_2_;
    sStack_1f02 = sStack_1f02 - local_678._6_2_;
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_18e8._1_1_,CONCAT11((char)local_1708,(undefined1)local_18e8)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_18e8._2_1_,uVar4));
    uVar23 = CONCAT17(local_1708._3_1_,CONCAT16(local_18e8._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_18e8._5_1_,CONCAT11(local_1708._4_1_,local_18e8._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_18e8._6_1_,uVar9));
    uVar32 = CONCAT17(local_1708._7_1_,CONCAT16(local_18e8._7_1_,uVar10));
    local_688 = local_1f18;
    uStack_680 = uStack_1f10;
    local_698._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_698._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_698._6_2_ = (short)((ulong)uVar23 >> 0x30);
    uStack_690._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_690._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_690._6_2_ = (short)((ulong)uVar32 >> 0x30);
    sVar102 = sVar102 - CONCAT11((char)local_1708,(undefined1)local_18e8);
    sStack_1dc0 = sStack_1dd0 - CONCAT11(local_1708._4_1_,local_18e8._4_1_);
    sStack_1dbe = sStack_1dce - uStack_690._2_2_;
    sStack_1dbc = sStack_1dcc - uStack_690._4_2_;
    sStack_1dba = sStack_1dca - uStack_690._6_2_;
    local_1f18._0_4_ = CONCAT22(local_638._2_2_ - local_698._2_2_,sVar102);
    local_1f18._0_6_ = CONCAT24(local_638._4_2_ - local_698._4_2_,(undefined4)local_1f18);
    local_1f18 = CONCAT26(local_638._6_2_ - local_698._6_2_,(undefined6)local_1f18);
    uStack_1f10._0_4_ = CONCAT22(sStack_1dbe,sStack_1dc0);
    uStack_1f10._0_6_ = CONCAT24(sStack_1dbc,(undefined4)uStack_1f10);
    uStack_1f10 = CONCAT26(sStack_1dba,(undefined6)uStack_1f10);
    local_a88 = CONCAT26(sStack_1d82,CONCAT24(sStack_1d84,CONCAT22(sStack_1d86,local_1d88)));
    uStack_a80 = CONCAT26(sStack_1d7a,CONCAT24(sStack_1d7c,CONCAT22(sStack_1d7e,sStack_1d80)));
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_1928._1_1_,CONCAT11((char)local_1708,(undefined1)local_1928)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_1928._2_1_,uVar4));
    uVar49 = CONCAT17(local_1708._3_1_,CONCAT16(local_1928._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_1928._5_1_,CONCAT11(local_1708._4_1_,local_1928._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_1928._6_1_,uVar9));
    uVar54 = CONCAT17(local_1708._7_1_,CONCAT16(local_1928._7_1_,uVar10));
    local_a98._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_a98._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_a98._6_2_ = (short)((ulong)uVar49 >> 0x30);
    uStack_a90._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_a90._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_a90._6_2_ = (short)((ulong)uVar54 >> 0x30);
    local_1d88 = local_1d88 + CONCAT11((char)local_1708,(undefined1)local_1928);
    sStack_1d86 = sStack_1d86 + local_a98._2_2_;
    sStack_1d84 = sStack_1d84 + local_a98._4_2_;
    sStack_1d82 = sStack_1d82 + local_a98._6_2_;
    sStack_1d80 = sStack_1d80 + CONCAT11(local_1708._4_1_,local_1928._4_1_);
    sStack_1d7e = sStack_1d7e + uStack_a90._2_2_;
    sStack_1d7c = sStack_1d7c + uStack_a90._4_2_;
    sStack_1d7a = sStack_1d7a + uStack_a90._6_2_;
    local_aa8 = CONCAT26(sStack_1d82,CONCAT24(sStack_1d84,CONCAT22(sStack_1d86,local_1d88)));
    uStack_aa0 = CONCAT26(sStack_1d7a,CONCAT24(sStack_1d7c,CONCAT22(sStack_1d7e,sStack_1d80)));
    uVar4 = CONCAT13(local_1708._1_1_,
                     CONCAT12(local_1908._1_1_,CONCAT11((char)local_1708,(undefined1)local_1908)));
    uVar5 = CONCAT15(local_1708._2_1_,CONCAT14(local_1908._2_1_,uVar4));
    uVar38 = CONCAT17(local_1708._3_1_,CONCAT16(local_1908._3_1_,uVar5));
    uVar9 = CONCAT13(local_1708._5_1_,
                     CONCAT12(local_1908._5_1_,CONCAT11(local_1708._4_1_,local_1908._4_1_)));
    uVar10 = CONCAT15(local_1708._6_1_,CONCAT14(local_1908._6_1_,uVar9));
    uVar46 = CONCAT17(local_1708._7_1_,CONCAT16(local_1908._7_1_,uVar10));
    local_ab8._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_ab8._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_ab8._6_2_ = (short)((ulong)uVar38 >> 0x30);
    uStack_ab0._2_2_ = (short)((uint)uVar9 >> 0x10);
    uStack_ab0._4_2_ = (short)((uint6)uVar10 >> 0x20);
    uStack_ab0._6_2_ = (short)((ulong)uVar46 >> 0x30);
    local_1eb8 = local_1d88 + CONCAT11((char)local_1708,(undefined1)local_1908);
    sStack_1eb6 = sStack_1d86 + local_ab8._2_2_;
    sStack_1eb4 = sStack_1d84 + local_ab8._4_2_;
    sStack_1eb2 = sStack_1d82 + local_ab8._6_2_;
    sStack_1eb0 = sStack_1d80 + CONCAT11(local_1708._4_1_,local_1908._4_1_);
    sStack_1eae = sStack_1d7e + uStack_ab0._2_2_;
    sStack_1eac = sStack_1d7c + uStack_ab0._4_2_;
    sStack_1eaa = sStack_1d7a + uStack_ab0._6_2_;
    local_ac8 = CONCAT26(sStack_1f02,CONCAT24(sStack_1f04,CONCAT22(sStack_1f06,local_1f08)));
    uStack_ac0 = CONCAT26(sStack_1efa,CONCAT24(sStack_1efc,CONCAT22(sStack_1efe,sStack_1f00)));
    local_ad8 = CONCAT26(sStack_1eb2,CONCAT24(sStack_1eb4,CONCAT22(sStack_1eb6,local_1eb8)));
    uStack_ad0 = CONCAT26(sStack_1eaa,CONCAT24(sStack_1eac,CONCAT22(sStack_1eae,sStack_1eb0)));
    local_1d98 = local_1f08 + local_1eb8;
    uStack_1d96 = sStack_1f06 + sStack_1eb6;
    uStack_1d94 = sStack_1f04 + sStack_1eb4;
    uStack_1d92 = sStack_1f02 + sStack_1eb2;
    sStack_1d90 = sStack_1f00 + sStack_1eb0;
    sStack_1d8e = sStack_1efe + sStack_1eae;
    sStack_1d8c = sStack_1efc + sStack_1eac;
    sStack_1d8a = sStack_1efa + sStack_1eaa;
    local_af8 = CONCAT26(sStack_1eaa,CONCAT24(sStack_1eac,CONCAT22(sStack_1eae,sStack_1eb0)));
    local_ae8 = local_1f18;
    uStack_ae0 = uStack_1f10;
    uStack_af0 = 0;
    local_1dc8 = sVar102 + sStack_1eb0;
    uStack_1dc6 = (local_638._2_2_ - local_698._2_2_) + sStack_1eae;
    uStack_1dc4 = (local_638._4_2_ - local_698._4_2_) + sStack_1eac;
    uStack_1dc2 = (local_638._6_2_ - local_698._6_2_) + sStack_1eaa;
    local_17e8 = CONCAT26(uStack_1d92,CONCAT24(uStack_1d94,CONCAT22(uStack_1d96,local_1d98)));
    uStack_17e0 = CONCAT26(sStack_1d8a,CONCAT24(sStack_1d8c,CONCAT22(sStack_1d8e,sStack_1d90)));
    local_17f8 = CONCAT26(uStack_1dc2,CONCAT24(uStack_1dc4,CONCAT22(uStack_1dc6,local_1dc8)));
    uStack_17f0 = CONCAT26(sStack_1dba,CONCAT24(sStack_1dbc,CONCAT22(sStack_1dbe,sStack_1dc0)));
    local_13fc = 3;
    uVar104 = local_1d98 >> 3;
    uVar105 = uStack_1d96 >> 3;
    uVar115 = uStack_1d94 >> 3;
    uVar116 = uStack_1d92 >> 3;
    uVar119 = local_1dc8 >> 3;
    uVar120 = uStack_1dc6 >> 3;
    uVar124 = uStack_1dc4 >> 3;
    uVar125 = uStack_1dc2 >> 3;
    local_1b88._0_4_ = CONCAT22(uVar105,uVar104);
    local_1b88._0_6_ = CONCAT24(uVar115,(undefined4)local_1b88);
    local_1b88 = CONCAT26(uVar116,(undefined6)local_1b88);
    uStack_1b80._0_4_ = CONCAT22(uVar120,uVar119);
    uStack_1b80._0_6_ = CONCAT24(uVar124,(undefined4)uStack_1b80);
    uStack_1b80 = CONCAT26(uVar125,(undefined6)uStack_1b80);
    local_98 = local_1b88;
    uStack_90 = uStack_1b80;
    local_a8 = local_1b88;
    uStack_a0 = uStack_1b80;
    local_1b88._0_4_ =
         CONCAT13((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                  CONCAT12((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                           CONCAT11((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 -
                                    (0xff < uVar105),
                                    (uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                    (0xff < uVar104))));
    local_1b88._0_6_ =
         CONCAT15((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120),
                  CONCAT14((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                           (undefined4)local_1b88));
    local_1b88 = CONCAT17((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar125 - (0xff < uVar125),
                          CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 -
                                   (0xff < uVar124),(undefined6)local_1b88));
    uStack_1b80._0_4_ =
         CONCAT13((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                  CONCAT12((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                           CONCAT11((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 -
                                    (0xff < uVar105),
                                    (uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                    (0xff < uVar104))));
    uStack_1b80._0_6_ =
         CONCAT15((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120),
                  CONCAT14((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                           (undefined4)uStack_1b80));
    uStack_1b80 = CONCAT17((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar125 - (0xff < uVar125),
                           CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 -
                                    (0xff < uVar124),(undefined6)uStack_1b80));
    b_04[1]._0_2_ = uVar106;
    b_04[1]._2_6_ = 0;
    uVar100 = (ulong)uVar106;
    a_06[1] = in_RSI;
    a_06[0] = (longlong)a;
    sStack_1ee0 = sStack_1ef0;
    sStack_1ede = sStack_1eee;
    sStack_1edc = sStack_1eec;
    sStack_1eda = sStack_1eea;
    sStack_1de0 = sStack_1f00;
    sStack_1dde = sStack_1efe;
    sStack_1ddc = sStack_1efc;
    sStack_1dda = sStack_1efa;
    local_1988 = uVar2;
    local_1968 = uVar1;
    local_1948 = uVar133;
    local_1928 = uVar132;
    local_1908 = uVar109;
    local_18e8 = uVar108;
    local_18c8 = uVar99;
    local_13f8 = local_17e8;
    uStack_13f0 = local_17f8;
    local_13d8 = local_17c8;
    uStack_13d0 = local_17d8;
    local_13b8 = local_17a8;
    uStack_13b0 = local_17b8;
    local_ab8 = uVar38;
    uStack_ab0 = uVar46;
    local_a98 = uVar49;
    uStack_a90 = uVar54;
    local_a38 = uVar22;
    uStack_a30 = uVar31;
    local_9e8 = uVar21;
    uStack_9e0 = uVar30;
    local_9d8 = uVar8;
    uStack_9d0 = uVar16;
    local_9c8 = uVar36;
    uStack_9c0 = uVar44;
    local_9b8 = uVar20;
    uStack_9b0 = uVar29;
    local_998 = uVar7;
    uStack_990 = uVar15;
    local_988 = uVar63;
    uStack_980 = uVar64;
    local_968 = local_978;
    uStack_960 = uStack_970;
    local_948 = local_958;
    uStack_940 = uStack_950;
    local_918 = local_1cd8;
    local_908 = local_1ca8;
    local_8d8 = uVar6;
    uStack_8d0 = uVar14;
    local_8c8 = uVar48;
    uStack_8c0 = uVar53;
    local_8a8 = local_1d68;
    uStack_8a0 = uStack_1d60;
    local_868 = local_1d58;
    uStack_860 = uStack_1d50;
    local_808 = uVar3;
    uStack_800 = uVar11;
    local_7f8 = uVar17;
    uStack_7f0 = uVar26;
    local_7e8 = uVar33;
    uStack_7e0 = uVar41;
    local_7c8 = uVar57;
    uStack_7c0 = uVar61;
    local_7b8 = uVar47;
    uStack_7b0 = uVar52;
    local_7a8 = uVar55;
    uStack_7a0 = uVar56;
    local_698 = uVar23;
    uStack_690 = uVar32;
    local_678 = local_1cc8;
    local_658 = local_1cb8;
    local_638 = uVar37;
    uStack_630 = uVar45;
    local_618 = local_1c88;
    local_5f8 = uVar58;
    uStack_5f0 = uVar62;
    local_48 = local_1d58;
    uStack_40 = uStack_1d50;
    local_28 = local_1d68;
    uStack_20 = uStack_1d60;
    alVar149 = abs_diff(a_06,b_04);
    b_05[0] = alVar149[1];
    b_05[1] = uVar100;
    a_07[1] = in_RSI;
    a_07[0] = (longlong)a;
    in_stack_ffffffffffffde48 = extraout_XMM0_Qa_19;
    alVar149 = abs_diff(a_07,b_05);
    b_06[0] = alVar149[1];
    local_1618 = (byte)in_stack_ffffffffffffde48;
    bStack_1617 = (byte)((ulong)in_stack_ffffffffffffde48 >> 8);
    bStack_1616 = (byte)((ulong)in_stack_ffffffffffffde48 >> 0x10);
    bStack_1615 = (byte)((ulong)in_stack_ffffffffffffde48 >> 0x18);
    bStack_1614 = (byte)((ulong)in_stack_ffffffffffffde48 >> 0x20);
    bStack_1613 = (byte)((ulong)in_stack_ffffffffffffde48 >> 0x28);
    bStack_1612 = (byte)((ulong)in_stack_ffffffffffffde48 >> 0x30);
    bStack_1611 = (byte)((ulong)in_stack_ffffffffffffde48 >> 0x38);
    bStack_1610 = (byte)extraout_XMM0_Qb_05;
    bStack_160f = (byte)((ulong)extraout_XMM0_Qb_05 >> 8);
    bStack_160e = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x10);
    bStack_160d = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x18);
    bStack_160c = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x20);
    bStack_160b = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x28);
    bStack_160a = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x30);
    bStack_1609 = (byte)((ulong)extraout_XMM0_Qb_05 >> 0x38);
    local_1628 = (byte)extraout_XMM0_Qa_20;
    bStack_1627 = (byte)((ulong)extraout_XMM0_Qa_20 >> 8);
    bStack_1626 = (byte)((ulong)extraout_XMM0_Qa_20 >> 0x10);
    bStack_1625 = (byte)((ulong)extraout_XMM0_Qa_20 >> 0x18);
    bStack_1624 = (byte)((ulong)extraout_XMM0_Qa_20 >> 0x20);
    bStack_1623 = (byte)((ulong)extraout_XMM0_Qa_20 >> 0x28);
    bStack_1622 = (byte)((ulong)extraout_XMM0_Qa_20 >> 0x30);
    bStack_1621 = (byte)((ulong)extraout_XMM0_Qa_20 >> 0x38);
    bStack_1620 = (byte)extraout_XMM0_Qb_06;
    bStack_161f = (byte)((ulong)extraout_XMM0_Qb_06 >> 8);
    bStack_161e = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x10);
    bStack_161d = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x18);
    bStack_161c = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x20);
    bStack_161b = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x28);
    bStack_161a = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x30);
    bStack_1619 = (byte)((ulong)extraout_XMM0_Qb_06 >> 0x38);
    local_1b18[1] =
         (bStack_1617 < bStack_1627) * bStack_1627 | (bStack_1617 >= bStack_1627) * bStack_1617;
    local_1b18[0] = (local_1618 < local_1628) * local_1628 | (local_1618 >= local_1628) * local_1618
    ;
    local_1b18[2] =
         (bStack_1616 < bStack_1626) * bStack_1626 | (bStack_1616 >= bStack_1626) * bStack_1616;
    local_1b18[3] =
         (bStack_1615 < bStack_1625) * bStack_1625 | (bStack_1615 >= bStack_1625) * bStack_1615;
    local_1b18[4] =
         (bStack_1614 < bStack_1624) * bStack_1624 | (bStack_1614 >= bStack_1624) * bStack_1614;
    local_1b18[5] =
         (bStack_1613 < bStack_1623) * bStack_1623 | (bStack_1613 >= bStack_1623) * bStack_1613;
    local_1b18[6] =
         (bStack_1612 < bStack_1622) * bStack_1622 | (bStack_1612 >= bStack_1622) * bStack_1612;
    local_1b18[7] =
         (bStack_1611 < bStack_1621) * bStack_1621 | (bStack_1611 >= bStack_1621) * bStack_1611;
    local_1b18[8] =
         (bStack_1610 < bStack_1620) * bStack_1620 | (bStack_1610 >= bStack_1620) * bStack_1610;
    local_1b18[9] =
         (bStack_160f < bStack_161f) * bStack_161f | (bStack_160f >= bStack_161f) * bStack_160f;
    local_1b18[10] =
         (bStack_160e < bStack_161e) * bStack_161e | (bStack_160e >= bStack_161e) * bStack_160e;
    local_1b18[0xb] =
         (bStack_160d < bStack_161d) * bStack_161d | (bStack_160d >= bStack_161d) * bStack_160d;
    local_1b18[0xc] =
         (bStack_160c < bStack_161c) * bStack_161c | (bStack_160c >= bStack_161c) * bStack_160c;
    local_1b18[0xd] =
         (bStack_160b < bStack_161b) * bStack_161b | (bStack_160b >= bStack_161b) * bStack_160b;
    local_1b18[0xe] =
         (bStack_160a < bStack_161a) * bStack_161a | (bStack_160a >= bStack_161a) * bStack_160a;
    local_1b18[0xf] =
         (bStack_1609 < bStack_1619) * bStack_1619 | (bStack_1609 >= bStack_1619) * bStack_1609;
    b_06[1] = uVar100;
    a_08[1] = in_RSI;
    a_08[0] = (longlong)a;
    abs_diff(a_08,b_06);
    puVar86 = local_1aa0;
    local_1648 = local_1b18._0_8_;
    uVar8 = local_1648;
    uStack_1640 = local_1b18._8_8_;
    uVar11 = uStack_1640;
    local_1638 = (byte)extraout_XMM0_Qa_21;
    bStack_1637 = (byte)((ulong)extraout_XMM0_Qa_21 >> 8);
    bStack_1636 = (byte)((ulong)extraout_XMM0_Qa_21 >> 0x10);
    bStack_1635 = (byte)((ulong)extraout_XMM0_Qa_21 >> 0x18);
    bStack_1634 = (byte)((ulong)extraout_XMM0_Qa_21 >> 0x20);
    bStack_1633 = (byte)((ulong)extraout_XMM0_Qa_21 >> 0x28);
    bStack_1632 = (byte)((ulong)extraout_XMM0_Qa_21 >> 0x30);
    bStack_1631 = (byte)((ulong)extraout_XMM0_Qa_21 >> 0x38);
    bStack_1630 = (byte)extraout_XMM0_Qb_07;
    bStack_162f = (byte)((ulong)extraout_XMM0_Qb_07 >> 8);
    bStack_162e = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x10);
    bStack_162d = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x18);
    bStack_162c = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x20);
    bStack_162b = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x28);
    bStack_162a = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x30);
    bStack_1629 = (byte)((ulong)extraout_XMM0_Qb_07 >> 0x38);
    local_1648._0_1_ = local_1b18[0];
    local_1648._1_1_ = local_1b18[1];
    local_1648._2_1_ = local_1b18[2];
    local_1648._3_1_ = local_1b18[3];
    local_1648._4_1_ = local_1b18[4];
    local_1648._5_1_ = local_1b18[5];
    local_1648._6_1_ = local_1b18[6];
    local_1648._7_1_ = local_1b18[7];
    uStack_1640._0_1_ = local_1b18[8];
    uStack_1640._1_1_ = local_1b18[9];
    uStack_1640._2_1_ = local_1b18[10];
    uStack_1640._3_1_ = local_1b18[0xb];
    uStack_1640._4_1_ = local_1b18[0xc];
    uStack_1640._5_1_ = local_1b18[0xd];
    uStack_1640._6_1_ = local_1b18[0xe];
    uStack_1640._7_1_ = local_1b18[0xf];
    local_1b18[0] =
         (local_1638 < (byte)local_1648) * (byte)local_1648 |
         (local_1638 >= (byte)local_1648) * local_1638;
    local_1b18[1] =
         (bStack_1637 < local_1648._1_1_) * local_1648._1_1_ |
         (bStack_1637 >= local_1648._1_1_) * bStack_1637;
    local_1b18[2] =
         (bStack_1636 < local_1648._2_1_) * local_1648._2_1_ |
         (bStack_1636 >= local_1648._2_1_) * bStack_1636;
    local_1b18[3] =
         (bStack_1635 < local_1648._3_1_) * local_1648._3_1_ |
         (bStack_1635 >= local_1648._3_1_) * bStack_1635;
    local_1b18[4] =
         (bStack_1634 < local_1648._4_1_) * local_1648._4_1_ |
         (bStack_1634 >= local_1648._4_1_) * bStack_1634;
    local_1b18[5] =
         (bStack_1633 < local_1648._5_1_) * local_1648._5_1_ |
         (bStack_1633 >= local_1648._5_1_) * bStack_1633;
    local_1b18[6] =
         (bStack_1632 < local_1648._6_1_) * local_1648._6_1_ |
         (bStack_1632 >= local_1648._6_1_) * bStack_1632;
    local_1b18[7] =
         (bStack_1631 < local_1648._7_1_) * local_1648._7_1_ |
         (bStack_1631 >= local_1648._7_1_) * bStack_1631;
    local_1b18[8] =
         (bStack_1630 < (byte)uStack_1640) * (byte)uStack_1640 |
         (bStack_1630 >= (byte)uStack_1640) * bStack_1630;
    local_1b18[9] =
         (bStack_162f < uStack_1640._1_1_) * uStack_1640._1_1_ |
         (bStack_162f >= uStack_1640._1_1_) * bStack_162f;
    local_1b18[10] =
         (bStack_162e < uStack_1640._2_1_) * uStack_1640._2_1_ |
         (bStack_162e >= uStack_1640._2_1_) * bStack_162e;
    local_1b18[0xb] =
         (bStack_162d < uStack_1640._3_1_) * uStack_1640._3_1_ |
         (bStack_162d >= uStack_1640._3_1_) * bStack_162d;
    local_1b18[0xc] =
         (bStack_162c < uStack_1640._4_1_) * uStack_1640._4_1_ |
         (bStack_162c >= uStack_1640._4_1_) * bStack_162c;
    local_1b18[0xd] =
         (bStack_162b < uStack_1640._5_1_) * uStack_1640._5_1_ |
         (bStack_162b >= uStack_1640._5_1_) * bStack_162b;
    local_1b18[0xe] =
         (bStack_162a < uStack_1640._6_1_) * uStack_1640._6_1_ |
         (bStack_162a >= uStack_1640._6_1_) * bStack_162a;
    local_1b18[0xf] =
         (bStack_1629 < uStack_1640._7_1_) * uStack_1640._7_1_ |
         (bStack_1629 >= uStack_1640._7_1_) * bStack_1629;
    local_1668 = local_1b18 >> 0x20;
    local_1658 = local_1b18;
    local_1b18[1] =
         (local_1b18[1] < local_1b18[5]) * local_1b18[5] |
         (local_1b18[1] >= local_1b18[5]) * local_1b18[1];
    local_1b18[0] =
         (local_1b18[0] < local_1b18[4]) * local_1b18[4] |
         (local_1b18[0] >= local_1b18[4]) * local_1b18[0];
    local_1b18[2] =
         (local_1b18[2] < local_1b18[6]) * local_1b18[6] |
         (local_1b18[2] >= local_1b18[6]) * local_1b18[2];
    local_1b18[3] =
         (local_1b18[3] < local_1b18[7]) * local_1b18[7] |
         (local_1b18[3] >= local_1b18[7]) * local_1b18[3];
    local_1b18[4] =
         (local_1b18[4] < local_1b18[8]) * local_1b18[8] |
         (local_1b18[4] >= local_1b18[8]) * local_1b18[4];
    local_1b18[5] =
         (local_1b18[5] < local_1b18[9]) * local_1b18[9] |
         (local_1b18[5] >= local_1b18[9]) * local_1b18[5];
    local_1b18[6] =
         (local_1b18[6] < local_1b18[10]) * local_1b18[10] |
         (local_1b18[6] >= local_1b18[10]) * local_1b18[6];
    local_1b18[7] =
         (local_1b18[7] < local_1b18[0xb]) * local_1b18[0xb] |
         (local_1b18[7] >= local_1b18[0xb]) * local_1b18[7];
    local_1b18[8] =
         (local_1b18[8] < local_1b18[0xc]) * local_1b18[0xc] |
         (local_1b18[8] >= local_1b18[0xc]) * local_1b18[8];
    local_1b18[9] =
         (local_1b18[9] < local_1b18[0xd]) * local_1b18[0xd] |
         (local_1b18[9] >= local_1b18[0xd]) * local_1b18[9];
    local_1b18[10] =
         (local_1b18[10] < local_1b18[0xe]) * local_1b18[0xe] |
         (local_1b18[10] >= local_1b18[0xe]) * local_1b18[10];
    local_1b18[0xb] =
         (local_1b18[0xb] < local_1b18[0xf]) * local_1b18[0xf] |
         (local_1b18[0xb] >= local_1b18[0xf]) * local_1b18[0xb];
    local_11f8 = local_1b18._0_8_;
    uStack_11f0 = local_1b18._8_8_;
    local_1208 = local_1ad8;
    uStack_1200 = uStack_1ad0;
    auVar68._8_8_ = local_1b18._8_8_;
    auVar68._0_8_ = local_1b18._0_8_;
    auVar67._8_8_ = uStack_1ad0;
    auVar67._0_8_ = local_1ad8;
    auVar110 = psubusb(auVar68,auVar67);
    local_1b18._0_8_ = auVar110._0_8_;
    local_1b18._8_8_ = auVar110._8_8_;
    local_1738 = local_1b18._0_8_;
    uVar6 = local_1738;
    uStack_1730 = local_1b18._8_8_;
    uVar7 = uStack_1730;
    local_1748 = local_1ac8;
    uVar2 = local_1748;
    uStack_1740 = uStack_1ac0;
    uVar3 = uStack_1740;
    local_1738._0_1_ = auVar110[0];
    local_1738._1_1_ = auVar110[1];
    local_1738._2_1_ = auVar110[2];
    local_1738._3_1_ = auVar110[3];
    local_1738._4_1_ = auVar110[4];
    local_1738._5_1_ = auVar110[5];
    local_1738._6_1_ = auVar110[6];
    local_1738._7_1_ = auVar110[7];
    uStack_1730._0_1_ = auVar110[8];
    uStack_1730._1_1_ = auVar110[9];
    uStack_1730._2_1_ = auVar110[10];
    uStack_1730._3_1_ = auVar110[0xb];
    uStack_1730._4_1_ = auVar110[0xc];
    uStack_1730._5_1_ = auVar110[0xd];
    uStack_1730._6_1_ = auVar110[0xe];
    uStack_1730._7_1_ = auVar110[0xf];
    local_1748._0_1_ = (char)local_1ac8;
    local_1748._1_1_ = (char)((ulong)local_1ac8 >> 8);
    local_1748._2_1_ = (char)((ulong)local_1ac8 >> 0x10);
    local_1748._3_1_ = (char)((ulong)local_1ac8 >> 0x18);
    local_1748._4_1_ = (char)((ulong)local_1ac8 >> 0x20);
    local_1748._5_1_ = (char)((ulong)local_1ac8 >> 0x28);
    local_1748._6_1_ = (char)((ulong)local_1ac8 >> 0x30);
    local_1748._7_1_ = (char)((ulong)local_1ac8 >> 0x38);
    uStack_1740._0_1_ = (char)uStack_1ac0;
    uStack_1740._1_1_ = (char)((ulong)uStack_1ac0 >> 8);
    uStack_1740._2_1_ = (char)((ulong)uStack_1ac0 >> 0x10);
    uStack_1740._3_1_ = (char)((ulong)uStack_1ac0 >> 0x18);
    uStack_1740._4_1_ = (char)((ulong)uStack_1ac0 >> 0x20);
    uStack_1740._5_1_ = (char)((ulong)uStack_1ac0 >> 0x28);
    uStack_1740._6_1_ = (char)((ulong)uStack_1ac0 >> 0x30);
    uStack_1740._7_1_ = (char)((ulong)uStack_1ac0 >> 0x38);
    local_1b18[1] = -(local_1738._1_1_ == local_1748._1_1_);
    local_1b18[0] = -((char)local_1738 == (char)local_1748);
    local_1b18[2] = -(local_1738._2_1_ == local_1748._2_1_);
    local_1b18[3] = -(local_1738._3_1_ == local_1748._3_1_);
    local_1b18[4] = -(local_1738._4_1_ == local_1748._4_1_);
    local_1b18[5] = -(local_1738._5_1_ == local_1748._5_1_);
    local_1b18[6] = -(local_1738._6_1_ == local_1748._6_1_);
    local_1b18[7] = -(local_1738._7_1_ == local_1748._7_1_);
    local_1b18[8] = -((char)uStack_1730 == (char)uStack_1740);
    local_1b18[9] = -(uStack_1730._1_1_ == uStack_1740._1_1_);
    local_1b18[10] = -(uStack_1730._2_1_ == uStack_1740._2_1_);
    local_1b18[0xb] = -(uStack_1730._3_1_ == uStack_1740._3_1_);
    local_1b18[0xc] = -(uStack_1730._4_1_ == uStack_1740._4_1_);
    local_1b18[0xd] = -(uStack_1730._5_1_ == uStack_1740._5_1_);
    local_1b18[0xe] = -(uStack_1730._6_1_ == uStack_1740._6_1_);
    local_1b18[0xf] = -(uStack_1730._7_1_ == uStack_1740._7_1_);
    local_1258 = local_1b18._0_8_;
    uStack_1250 = local_1b18._8_8_;
    local_1268 = local_1b08._0_8_;
    uStack_1260 = local_1b08._8_8_;
    local_1a58 = local_1b18._0_8_ & local_1b08._0_8_;
    uStack_1a50 = local_1b18._8_8_ & local_1b08._8_8_;
    local_1a48._0_4_ = (undefined4)local_1a58;
    local_1a48._4_4_ = (undefined4)(local_1a58 >> 0x20);
    local_1b18._4_4_ = (undefined4)local_1a48;
    local_1b18._0_4_ = (undefined4)local_1a48;
    local_1b18._8_4_ = local_1a48._4_4_;
    local_1b18._12_4_ = local_1a48._4_4_;
    local_ed8 = local_1b08._0_8_;
    uStack_ed0 = local_1b08._8_8_;
    local_ee8 = local_1bb8;
    uStack_ee0 = uStack_1bb0;
    local_1bb8 = ~local_1b08._0_8_ & local_1bb8;
    uStack_1bb0 = ~local_1b08._8_8_ & uStack_1bb0;
    local_1278 = local_1b08._0_8_;
    uStack_1270 = local_1b08._8_8_;
    local_1288 = local_1ba8;
    uStack_1280 = uStack_1ba0;
    local_1ba8 = local_1b08._0_8_ & local_1ba8;
    uStack_1ba0 = local_1b08._8_8_ & uStack_1ba0;
    uVar99 = uStack_1bb0 | uStack_1ba0;
    local_1c48 = extraout_XMM0_Qa_21;
    uStack_1c40 = extraout_XMM0_Qb_07;
    local_1a48 = local_1a58;
    uStack_1a40 = uStack_1a50;
    local_1748 = uVar2;
    uStack_1740 = uVar3;
    local_1738 = uVar6;
    uStack_1730 = uVar7;
    local_1648 = uVar8;
    uStack_1640 = uVar11;
    local_1008 = local_1ba8;
    uStack_1000 = uStack_1ba0;
    local_ff8 = local_1bb8;
    uStack_ff0 = uStack_1bb0;
    *local_1aa0 = local_1bb8 | local_1ba8;
    puVar86[1] = uVar99;
    puVar86 = local_1a98;
    local_ef8 = local_1b08._0_8_;
    uStack_ef0 = local_1b08._8_8_;
    local_f08 = local_1bc8;
    uStack_f00 = uStack_1bc0;
    local_1bc8 = ~local_1b08._0_8_ & local_1bc8;
    uStack_1bc0 = ~local_1b08._8_8_ & uStack_1bc0;
    local_1298 = local_1b08._0_8_;
    uStack_1290 = local_1b08._8_8_;
    local_12a8 = local_1b98;
    uStack_12a0 = uStack_1b90;
    local_1b98 = local_1b08._0_8_ & local_1b98;
    uStack_1b90 = local_1b08._8_8_ & uStack_1b90;
    uVar99 = uStack_1bc0 | uStack_1b90;
    local_1028 = local_1b98;
    uStack_1020 = uStack_1b90;
    local_1018 = local_1bc8;
    uStack_1010 = uStack_1bc0;
    *local_1a98 = local_1bc8 | local_1b98;
    puVar86[1] = uVar99;
    puVar86 = local_1a90;
    local_f28 = *local_1a90;
    uStack_f20 = local_1a90[1];
    local_f18 = local_1b08._0_8_;
    uStack_f10 = local_1b08._8_8_;
    uVar99 = ~local_1b08._8_8_ & uStack_f20;
    *local_1a90 = ~local_1b08._0_8_ & local_f28;
    puVar86[1] = uVar99;
    puVar86 = local_1a90;
    local_12b8 = local_1b08._0_8_;
    uStack_12b0 = local_1b08._8_8_;
    local_12c8 = local_1b88;
    uStack_12c0 = uStack_1b80;
    local_1b88 = local_1b08._0_8_ & local_1b88;
    uStack_1b80 = local_1b08._8_8_ & uStack_1b80;
    local_1038 = *local_1a90;
    uStack_1030 = local_1a90[1];
    uVar99 = uStack_1030 | uStack_1b80;
    local_1048 = local_1b88;
    uStack_1040 = uStack_1b80;
    *local_1a90 = local_1038 | local_1b88;
    puVar86[1] = uVar99;
    puVar86 = local_1aa0;
    local_1758 = local_1b18._0_8_;
    uVar99 = local_1758;
    uStack_1750 = local_1b18._8_8_;
    uVar108 = uStack_1750;
    local_1768 = local_1ac8;
    uVar2 = local_1768;
    uStack_1760 = uStack_1ac0;
    uVar3 = uStack_1760;
    local_1758._0_1_ = local_1b18[0];
    local_1758._1_1_ = local_1b18[1];
    local_1758._2_1_ = local_1b18[2];
    local_1758._3_1_ = local_1b18[3];
    local_1758._4_1_ = local_1b18[4];
    local_1758._5_1_ = local_1b18[5];
    local_1758._6_1_ = local_1b18[6];
    local_1758._7_1_ = local_1b18[7];
    uStack_1750._0_1_ = local_1b18[8];
    uStack_1750._1_1_ = local_1b18[9];
    uStack_1750._2_1_ = local_1b18[10];
    uStack_1750._3_1_ = local_1b18[0xb];
    uStack_1750._4_1_ = local_1b18[0xc];
    uStack_1750._5_1_ = local_1b18[0xd];
    uStack_1750._6_1_ = local_1b18[0xe];
    uStack_1750._7_1_ = local_1b18[0xf];
    local_1768._0_1_ = (char)local_1ac8;
    local_1768._1_1_ = (char)((ulong)local_1ac8 >> 8);
    local_1768._2_1_ = (char)((ulong)local_1ac8 >> 0x10);
    local_1768._3_1_ = (char)((ulong)local_1ac8 >> 0x18);
    local_1768._4_1_ = (char)((ulong)local_1ac8 >> 0x20);
    local_1768._5_1_ = (char)((ulong)local_1ac8 >> 0x28);
    local_1768._6_1_ = (char)((ulong)local_1ac8 >> 0x30);
    local_1768._7_1_ = (char)((ulong)local_1ac8 >> 0x38);
    uStack_1760._0_1_ = (char)uStack_1ac0;
    uStack_1760._1_1_ = (char)((ulong)uStack_1ac0 >> 8);
    uStack_1760._2_1_ = (char)((ulong)uStack_1ac0 >> 0x10);
    uStack_1760._3_1_ = (char)((ulong)uStack_1ac0 >> 0x18);
    uStack_1760._4_1_ = (char)((ulong)uStack_1ac0 >> 0x20);
    uStack_1760._5_1_ = (char)((ulong)uStack_1ac0 >> 0x28);
    uStack_1760._6_1_ = (char)((ulong)uStack_1ac0 >> 0x30);
    uStack_1760._7_1_ = (char)((ulong)uStack_1ac0 >> 0x38);
    local_1128 = -((char)local_1758 == (char)local_1768);
    cStack_1127 = -(local_1758._1_1_ == local_1768._1_1_);
    cStack_1126 = -(local_1758._2_1_ == local_1768._2_1_);
    cStack_1125 = -(local_1758._3_1_ == local_1768._3_1_);
    cStack_1124 = -(local_1758._4_1_ == local_1768._4_1_);
    cStack_1123 = -(local_1758._5_1_ == local_1768._5_1_);
    cStack_1122 = -(local_1758._6_1_ == local_1768._6_1_);
    cStack_1121 = -(local_1758._7_1_ == local_1768._7_1_);
    cStack_1120 = -((char)uStack_1750 == (char)uStack_1760);
    cStack_111f = -(uStack_1750._1_1_ == uStack_1760._1_1_);
    cStack_111e = -(uStack_1750._2_1_ == uStack_1760._2_1_);
    cStack_111d = -(uStack_1750._3_1_ == uStack_1760._3_1_);
    cStack_111c = -(uStack_1750._4_1_ == uStack_1760._4_1_);
    cStack_111b = -(uStack_1750._5_1_ == uStack_1760._5_1_);
    cStack_111a = -(uStack_1750._6_1_ == uStack_1760._6_1_);
    bStack_1119 = -(uStack_1750._7_1_ == uStack_1760._7_1_);
    auVar73[1] = cStack_1127;
    auVar73[0] = local_1128;
    auVar73[2] = cStack_1126;
    auVar73[3] = cStack_1125;
    auVar73[4] = cStack_1124;
    auVar73[5] = cStack_1123;
    auVar73[6] = cStack_1122;
    auVar73[7] = cStack_1121;
    auVar73[8] = cStack_1120;
    auVar73[9] = cStack_111f;
    auVar73[10] = cStack_111e;
    auVar73[0xb] = cStack_111d;
    auVar73[0xc] = cStack_111c;
    auVar73[0xd] = cStack_111b;
    auVar73[0xe] = cStack_111a;
    auVar73[0xf] = bStack_1119;
    local_1768 = uVar2;
    uStack_1760 = uVar3;
    local_1758 = uVar99;
    uStack_1750 = uVar108;
    if ((ushort)((ushort)(SUB161(auVar73 >> 7,0) & 1) | (ushort)(SUB161(auVar73 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar73 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar73 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar73 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar73 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar73 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar73 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar73 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar73 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_1119 >> 7) << 0xf)
        != 0xffff) {
      local_b28 = CONCAT26(sStack_1ee2,CONCAT24(sStack_1ee4,CONCAT22(sStack_1ee6,local_1ee8)));
      uStack_b20 = CONCAT26(sStack_1eda,CONCAT24(sStack_1edc,CONCAT22(sStack_1ede,sStack_1ee0)));
      local_b08 = CONCAT26(sStack_1ec2,CONCAT24(sStack_1ec4,CONCAT22(sStack_1ec6,local_1ec8)));
      uStack_b00 = CONCAT26(sStack_1eba,CONCAT24(sStack_1ebc,CONCAT22(sStack_1ebe,sStack_1ec0)));
      local_b18 = local_1cd8;
      uVar89 = local_b18;
      uStack_b10 = uStack_1cd0;
      uVar90 = uStack_b10;
      local_b18._0_2_ = (short)local_1cd8;
      local_b18._2_2_ = (short)((ulong)local_1cd8 >> 0x10);
      local_b18._4_2_ = (short)((ulong)local_1cd8 >> 0x20);
      local_b18._6_2_ = (short)((ulong)local_1cd8 >> 0x30);
      uStack_b10._0_2_ = (short)uStack_1cd0;
      uStack_b10._2_2_ = (short)((ulong)uStack_1cd0 >> 0x10);
      uStack_b10._4_2_ = (short)((ulong)uStack_1cd0 >> 0x20);
      uStack_b10._6_2_ = (short)((ulong)uStack_1cd0 >> 0x30);
      local_b38 = local_1ec8 + (short)local_b18;
      sStack_b36 = sStack_1ec6 + local_b18._2_2_;
      sStack_b34 = sStack_1ec4 + local_b18._4_2_;
      sStack_b32 = sStack_1ec2 + local_b18._6_2_;
      sStack_b30 = sStack_1ec0 + (short)uStack_b10;
      sStack_b2e = sStack_1ebe + uStack_b10._2_2_;
      sStack_b2c = sStack_1ebc + uStack_b10._4_2_;
      sStack_b2a = sStack_1eba + uStack_b10._6_2_;
      local_1e48 = local_1ee8 + local_b38;
      uStack_1e46 = sStack_1ee6 + sStack_b36;
      uStack_1e44 = sStack_1ee4 + sStack_b34;
      uStack_1e42 = sStack_1ee2 + sStack_b32;
      sStack_1e40 = sStack_1ee0 + sStack_b30;
      sStack_1e3e = sStack_1ede + sStack_b2e;
      sStack_1e3c = sStack_1edc + sStack_b2c;
      sStack_1e3a = sStack_1eda + sStack_b2a;
      local_b68 = CONCAT26(sStack_1ee2,CONCAT24(sStack_1ee4,CONCAT22(sStack_1ee6,local_1ee8)));
      uStack_b60 = CONCAT26(sStack_1eda,CONCAT24(sStack_1edc,CONCAT22(sStack_1ede,sStack_1ee0)));
      local_b48 = CONCAT26(sStack_1eba,CONCAT24(sStack_1ebc,CONCAT22(sStack_1ebe,sStack_1ec0)));
      uVar4 = CONCAT13(cStack_1d45,CONCAT12(uStack_1d46,CONCAT11(cStack_1d47,local_1d48)));
      uVar5 = CONCAT15(cStack_1d43,CONCAT14(uStack_1d44,uVar4));
      uVar2 = CONCAT17(cStack_1d41,CONCAT16(uStack_1d42,uVar5));
      sStack_b70 = CONCAT11(cStack_1d3f,uStack_1d40);
      uVar9 = CONCAT13(cStack_1d3d,CONCAT12(uStack_1d3e,sStack_b70));
      uVar10 = CONCAT15(cStack_1d3b,CONCAT14(uStack_1d3c,uVar9));
      uVar3 = CONCAT17(cStack_1d39,CONCAT16(uStack_1d3a,uVar10));
      uStack_b40 = 0;
      local_b58._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_b58._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_b58._6_2_ = (short)((ulong)uVar2 >> 0x30);
      uStack_b50._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_b50._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_b50._6_2_ = (short)((ulong)uVar3 >> 0x30);
      local_b78 = sStack_1ec0 + CONCAT11(cStack_1d47,local_1d48);
      sStack_b76 = sStack_1ebe + local_b58._2_2_;
      sStack_b74 = sStack_1ebc + local_b58._4_2_;
      sStack_b72 = sStack_1eba + local_b58._6_2_;
      sStack_b6e = uStack_b50._2_2_;
      sStack_b6c = uStack_b50._4_2_;
      sStack_b6a = uStack_b50._6_2_;
      local_1ea8 = local_1ee8 + local_b78;
      uStack_1ea6 = sStack_1ee6 + sStack_b76;
      uStack_1ea4 = sStack_1ee4 + sStack_b74;
      uStack_1ea2 = sStack_1ee2 + sStack_b72;
      sStack_1ea0 = sStack_1ee0 + sStack_b70;
      sStack_1e9e = sStack_1ede + uStack_b50._2_2_;
      sStack_1e9c = sStack_1edc + uStack_b50._4_2_;
      sStack_1e9a = sStack_1eda + uStack_b50._6_2_;
      local_b88 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_b80 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_b98 = CONCAT26(sStack_1ed2,CONCAT24(sStack_1ed4,CONCAT22(sStack_1ed6,local_1ed8)));
      uStack_b90 = CONCAT26(sStack_1eca,CONCAT24(sStack_1ecc,CONCAT22(sStack_1ece,sStack_1ed0)));
      local_1e38 = local_1ef8 + local_1ed8;
      uStack_1e36 = sStack_1ef6 + sStack_1ed6;
      uStack_1e34 = sStack_1ef4 + sStack_1ed4;
      uStack_1e32 = sStack_1ef2 + sStack_1ed2;
      sStack_1e30 = sStack_1ef0 + sStack_1ed0;
      sStack_1e2e = sStack_1eee + sStack_1ece;
      sStack_1e2c = sStack_1eec + sStack_1ecc;
      sStack_1e2a = sStack_1eea + sStack_1eca;
      local_bb8 = CONCAT26(sStack_1eca,CONCAT24(sStack_1ecc,CONCAT22(sStack_1ece,sStack_1ed0)));
      local_ba8 = local_1f28;
      uVar87 = local_ba8;
      uStack_ba0 = uStack_1f20;
      uVar88 = uStack_ba0;
      uStack_bb0 = 0;
      local_ba8._0_2_ = (short)local_1f28;
      local_ba8._2_2_ = (short)((ulong)local_1f28 >> 0x10);
      local_ba8._4_2_ = (short)((ulong)local_1f28 >> 0x20);
      local_ba8._6_2_ = (short)((ulong)local_1f28 >> 0x30);
      uStack_ba0._0_2_ = (short)uStack_1f20;
      uStack_ba0._2_2_ = (short)((ulong)uStack_1f20 >> 0x10);
      uStack_ba0._4_2_ = (short)((ulong)uStack_1f20 >> 0x20);
      uStack_ba0._6_2_ = (short)((ulong)uStack_1f20 >> 0x30);
      local_1e98 = (short)local_ba8 + sStack_1ed0;
      uStack_1e96 = local_ba8._2_2_ + sStack_1ece;
      uStack_1e94 = local_ba8._4_2_ + sStack_1ecc;
      uStack_1e92 = local_ba8._6_2_ + sStack_1eca;
      sStack_1e90 = (short)uStack_ba0;
      sStack_1e8e = uStack_ba0._2_2_;
      sStack_1e8c = uStack_ba0._4_2_;
      sStack_1e8a = uStack_ba0._6_2_;
      local_1808 = CONCAT26(uStack_1e42,CONCAT24(uStack_1e44,CONCAT22(uStack_1e46,local_1e48)));
      uStack_1800 = CONCAT26(sStack_1e3a,CONCAT24(sStack_1e3c,CONCAT22(sStack_1e3e,sStack_1e40)));
      local_1818 = CONCAT26(uStack_1ea2,CONCAT24(uStack_1ea4,CONCAT22(uStack_1ea6,local_1ea8)));
      uStack_1810 = CONCAT26(sStack_1e9a,CONCAT24(sStack_1e9c,CONCAT22(sStack_1e9e,sStack_1ea0)));
      local_141c = 4;
      uVar106 = local_1e48 >> 4;
      uVar105 = uStack_1e46 >> 4;
      uVar116 = uStack_1e44 >> 4;
      uVar120 = uStack_1e42 >> 4;
      uVar125 = local_1ea8 >> 4;
      uVar130 = uStack_1ea6 >> 4;
      uVar137 = uStack_1ea4 >> 4;
      uVar141 = uStack_1ea2 >> 4;
      local_1b78._0_4_ = CONCAT22(uVar105,uVar106);
      local_1b78._0_6_ = CONCAT24(uVar116,(undefined4)local_1b78);
      local_1b78 = CONCAT26(uVar120,(undefined6)local_1b78);
      uStack_1b70._0_4_ = CONCAT22(uVar130,uVar125);
      uStack_1b70._0_6_ = CONCAT24(uVar137,(undefined4)uStack_1b70);
      uStack_1b70 = CONCAT26(uVar141,(undefined6)uStack_1b70);
      local_1828 = CONCAT26(uStack_1e32,CONCAT24(uStack_1e34,CONCAT22(uStack_1e36,local_1e38)));
      uStack_1820 = CONCAT26(sStack_1e2a,CONCAT24(sStack_1e2c,CONCAT22(sStack_1e2e,sStack_1e30)));
      local_1838 = CONCAT26(uStack_1e92,CONCAT24(uStack_1e94,CONCAT22(uStack_1e96,local_1e98)));
      uStack_1830 = uStack_1f20;
      local_143c = 4;
      uVar104 = local_1e38 >> 4;
      uVar115 = uStack_1e36 >> 4;
      uVar119 = uStack_1e34 >> 4;
      uVar124 = uStack_1e32 >> 4;
      uVar129 = local_1e98 >> 4;
      uVar136 = uStack_1e96 >> 4;
      uVar140 = uStack_1e94 >> 4;
      uVar145 = uStack_1e92 >> 4;
      local_1b68._0_4_ = CONCAT22(uVar115,uVar104);
      local_1b68._0_6_ = CONCAT24(uVar119,(undefined4)local_1b68);
      local_1b68 = CONCAT26(uVar124,(undefined6)local_1b68);
      uStack_1b60._0_4_ = CONCAT22(uVar136,uVar129);
      uStack_1b60._0_6_ = CONCAT24(uVar140,(undefined4)uStack_1b60);
      uStack_1b60 = CONCAT26(uVar145,(undefined6)uStack_1b60);
      local_b8 = local_1b78;
      uStack_b0 = uStack_1b70;
      local_c8 = local_1b78;
      uStack_c0 = uStack_1b70;
      local_1b78._0_4_ =
           CONCAT13((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120),
                    CONCAT12((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             CONCAT11((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 -
                                      (0xff < uVar105),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      local_1b78._0_6_ =
           CONCAT15((uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130),
                    CONCAT14((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar125 - (0xff < uVar125),
                             (undefined4)local_1b78));
      local_1b78 = CONCAT17((uVar141 != 0) * (uVar141 < 0x100) * (char)uVar141 - (0xff < uVar141),
                            CONCAT16((uVar137 != 0) * (uVar137 < 0x100) * (char)uVar137 -
                                     (0xff < uVar137),(undefined6)local_1b78));
      uStack_1b70._0_4_ =
           CONCAT13((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120),
                    CONCAT12((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             CONCAT11((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 -
                                      (0xff < uVar105),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      uStack_1b70._0_6_ =
           CONCAT15((uVar130 != 0) * (uVar130 < 0x100) * (char)uVar130 - (0xff < uVar130),
                    CONCAT14((uVar125 != 0) * (uVar125 < 0x100) * (char)uVar125 - (0xff < uVar125),
                             (undefined4)uStack_1b70));
      uStack_1b70 = CONCAT17((uVar141 != 0) * (uVar141 < 0x100) * (char)uVar141 - (0xff < uVar141),
                             CONCAT16((uVar137 != 0) * (uVar137 < 0x100) * (char)uVar137 -
                                      (0xff < uVar137),(undefined6)uStack_1b70));
      local_d8 = local_1b68;
      uStack_d0 = uStack_1b60;
      local_e8 = local_1b68;
      uStack_e0 = uStack_1b60;
      local_1b68._0_4_ =
           CONCAT13((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                    CONCAT12((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                             CONCAT11((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 -
                                      (0xff < uVar115),
                                      (uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104))));
      local_1b68._0_6_ =
           CONCAT15((uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136),
                    CONCAT14((uVar129 != 0) * (uVar129 < 0x100) * (char)uVar129 - (0xff < uVar129),
                             (undefined4)local_1b68));
      local_1b68 = CONCAT17((uVar145 != 0) * (uVar145 < 0x100) * (char)uVar145 - (0xff < uVar145),
                            CONCAT16((uVar140 != 0) * (uVar140 < 0x100) * (char)uVar140 -
                                     (0xff < uVar140),(undefined6)local_1b68));
      uStack_1b60._0_4_ =
           CONCAT13((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                    CONCAT12((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                             CONCAT11((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 -
                                      (0xff < uVar115),
                                      (uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104))));
      uStack_1b60._0_6_ =
           CONCAT15((uVar136 != 0) * (uVar136 < 0x100) * (char)uVar136 - (0xff < uVar136),
                    CONCAT14((uVar129 != 0) * (uVar129 < 0x100) * (char)uVar129 - (0xff < uVar129),
                             (undefined4)uStack_1b60));
      uStack_1b60 = CONCAT17((uVar145 != 0) * (uVar145 < 0x100) * (char)uVar145 - (0xff < uVar145),
                             CONCAT16((uVar140 != 0) * (uVar140 < 0x100) * (char)uVar140 -
                                      (0xff < uVar140),(undefined6)uStack_1b60));
      local_6a8 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_6a0 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_6b8 = local_1c98;
      uVar97 = local_6b8;
      uStack_6b0 = uStack_1c90;
      uVar98 = uStack_6b0;
      local_6b8._0_2_ = (short)local_1c98;
      local_6b8._2_2_ = (short)((ulong)local_1c98 >> 0x10);
      local_6b8._4_2_ = (short)((ulong)local_1c98 >> 0x20);
      local_6b8._6_2_ = (short)((ulong)local_1c98 >> 0x30);
      uStack_6b0._0_2_ = (short)uStack_1c90;
      uStack_6b0._2_2_ = (short)((ulong)uStack_1c90 >> 0x10);
      uStack_6b0._4_2_ = (short)((ulong)uStack_1c90 >> 0x20);
      uStack_6b0._6_2_ = (short)((ulong)uStack_1c90 >> 0x30);
      local_1ef8 = local_1ef8 - (short)local_6b8;
      sStack_1ef6 = sStack_1ef6 - local_6b8._2_2_;
      sStack_1ef4 = sStack_1ef4 - local_6b8._4_2_;
      sStack_1ef2 = sStack_1ef2 - local_6b8._6_2_;
      sStack_1ef0 = sStack_1ef0 - (short)uStack_6b0;
      sStack_1eee = sStack_1eee - uStack_6b0._2_2_;
      sStack_1eec = sStack_1eec - uStack_6b0._4_2_;
      sStack_1eea = sStack_1eea - uStack_6b0._6_2_;
      uVar4 = CONCAT13(cStack_1d05,CONCAT12(uStack_1d06,CONCAT11(cStack_1d07,local_1d08)));
      uVar5 = CONCAT15(cStack_1d03,CONCAT14(uStack_1d04,uVar4));
      uVar36 = CONCAT17(cStack_1d01,CONCAT16(uStack_1d02,uVar5));
      uVar9 = CONCAT13(cStack_1cfd,CONCAT12(uStack_1cfe,CONCAT11(cStack_1cff,uStack_1d00)));
      uVar10 = CONCAT15(cStack_1cfb,CONCAT14(uStack_1cfc,uVar9));
      uVar44 = CONCAT17(cStack_1cf9,CONCAT16(uStack_1cfa,uVar10));
      local_6c8 = local_1f28;
      uStack_6c0 = uStack_1f20;
      local_6d8._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_6d8._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_6d8._6_2_ = (short)((ulong)uVar36 >> 0x30);
      uStack_6d0._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_6d0._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_6d0._6_2_ = (short)((ulong)uVar44 >> 0x30);
      local_ba8._0_2_ = (short)local_ba8 - CONCAT11(cStack_1d07,local_1d08);
      local_ba8._2_2_ = local_ba8._2_2_ - local_6d8._2_2_;
      local_ba8._4_2_ = local_ba8._4_2_ - local_6d8._4_2_;
      local_ba8._6_2_ = local_ba8._6_2_ - local_6d8._6_2_;
      sStack_1e80 = (short)uStack_ba0 - CONCAT11(cStack_1cff,uStack_1d00);
      sStack_1e7e = uStack_ba0._2_2_ - uStack_6d0._2_2_;
      sStack_1e7c = uStack_ba0._4_2_ - uStack_6d0._4_2_;
      sStack_1e7a = uStack_ba0._6_2_ - uStack_6d0._6_2_;
      local_1f28._0_4_ = CONCAT22(local_ba8._2_2_,(short)local_ba8);
      local_1f28._0_6_ = CONCAT24(local_ba8._4_2_,(undefined4)local_1f28);
      local_1f28 = CONCAT26(local_ba8._6_2_,(undefined6)local_1f28);
      uStack_1f20._0_4_ = CONCAT22(sStack_1e7e,sStack_1e80);
      uStack_1f20._0_6_ = CONCAT24(sStack_1e7c,(undefined4)uStack_1f20);
      uStack_1f20 = CONCAT26(sStack_1e7a,(undefined6)uStack_1f20);
      local_bc8 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
      uStack_bc0 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
      uVar4 = CONCAT13(cStack_1ce5,CONCAT12(uStack_1ce6,CONCAT11(cStack_1ce7,local_1ce8)));
      uVar5 = CONCAT15(cStack_1ce3,CONCAT14(uStack_1ce4,uVar4));
      uVar54 = CONCAT17(cStack_1ce1,CONCAT16(uStack_1ce2,uVar5));
      uVar9 = CONCAT13(cStack_1cdd,CONCAT12(uStack_1cde,CONCAT11(cStack_1cdf,uStack_1ce0)));
      uVar10 = CONCAT15(cStack_1cdb,CONCAT14(uStack_1cdc,uVar9));
      uVar61 = CONCAT17(cStack_1cd9,CONCAT16(uStack_1cda,uVar10));
      local_bd8._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_bd8._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_bd8._6_2_ = (short)((ulong)uVar54 >> 0x30);
      uStack_bd0._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_bd0._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_bd0._6_2_ = (short)((ulong)uVar61 >> 0x30);
      local_1d78 = local_1d78 + CONCAT11(cStack_1ce7,local_1ce8);
      sStack_1d76 = sStack_1d76 + local_bd8._2_2_;
      sStack_1d74 = sStack_1d74 + local_bd8._4_2_;
      sStack_1d72 = sStack_1d72 + local_bd8._6_2_;
      sStack_1d70 = sStack_1d70 + CONCAT11(cStack_1cdf,uStack_1ce0);
      sStack_1d6e = sStack_1d6e + uStack_bd0._2_2_;
      sStack_1d6c = sStack_1d6c + uStack_bd0._4_2_;
      sStack_1d6a = sStack_1d6a + uStack_bd0._6_2_;
      local_c28 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
      uStack_c20 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
      uVar4 = CONCAT13(cStack_1d35,CONCAT12(uStack_1d36,CONCAT11(cStack_1d37,local_1d38)));
      uVar5 = CONCAT15(cStack_1d33,CONCAT14(uStack_1d34,uVar4));
      uVar6 = CONCAT17(cStack_1d31,CONCAT16(uStack_1d32,uVar5));
      uVar9 = CONCAT13(cStack_1d2d,CONCAT12(uStack_1d2e,CONCAT11(cStack_1d2f,uStack_1d30)));
      uVar10 = CONCAT15(cStack_1d2b,CONCAT14(uStack_1d2c,uVar9));
      uVar8 = CONCAT17(cStack_1d29,CONCAT16(uStack_1d2a,uVar10));
      uVar12 = CONCAT13(cStack_1d25,CONCAT12(uStack_1d26,CONCAT11(cStack_1d27,local_1d28)));
      uVar13 = CONCAT15(cStack_1d23,CONCAT14(uStack_1d24,uVar12));
      uVar14 = CONCAT17(cStack_1d21,CONCAT16(uStack_1d22,uVar13));
      uVar18 = CONCAT13(cStack_1d1d,CONCAT12(uStack_1d1e,CONCAT11(cStack_1d1f,uStack_1d20)));
      uVar19 = CONCAT15(cStack_1d1b,CONCAT14(uStack_1d1c,uVar18));
      uVar17 = CONCAT17(cStack_1d19,CONCAT16(uStack_1d1a,uVar19));
      uVar24 = CONCAT13(cStack_1d15,CONCAT12(uStack_1d16,CONCAT11(cStack_1d17,local_1d18)));
      uVar25 = CONCAT15(cStack_1d13,CONCAT14(uStack_1d14,uVar24));
      uVar22 = CONCAT17(cStack_1d11,CONCAT16(uStack_1d12,uVar25));
      uVar27 = CONCAT13(cStack_1d0d,CONCAT12(uStack_1d0e,CONCAT11(cStack_1d0f,uStack_1d10)));
      uVar28 = CONCAT15(cStack_1d0b,CONCAT14(uStack_1d0c,uVar27));
      uVar30 = CONCAT17(cStack_1d09,CONCAT16(uStack_1d0a,uVar28));
      local_be8._2_2_ = (short)((uint)uVar24 >> 0x10);
      local_be8._4_2_ = (short)((uint6)uVar25 >> 0x20);
      local_be8._6_2_ = (short)((ulong)uVar22 >> 0x30);
      uStack_be0._2_2_ = (short)((uint)uVar27 >> 0x10);
      uStack_be0._4_2_ = (short)((uint6)uVar28 >> 0x20);
      uStack_be0._6_2_ = (short)((ulong)uVar30 >> 0x30);
      local_bf8._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_bf8._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_bf8._6_2_ = (short)((ulong)uVar6 >> 0x30);
      uStack_bf0._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_bf0._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_bf0._6_2_ = (short)((ulong)uVar8 >> 0x30);
      local_c18 = CONCAT11(cStack_1d17,local_1d18) + CONCAT11(cStack_1d37,local_1d38);
      sStack_c16 = local_be8._2_2_ + local_bf8._2_2_;
      sStack_c14 = local_be8._4_2_ + local_bf8._4_2_;
      sStack_c12 = local_be8._6_2_ + local_bf8._6_2_;
      sStack_c10 = CONCAT11(cStack_1d0f,uStack_1d10) + CONCAT11(cStack_1d2f,uStack_1d30);
      sStack_c0e = uStack_be0._2_2_ + uStack_bf0._2_2_;
      sStack_c0c = uStack_be0._4_2_ + uStack_bf0._4_2_;
      sStack_c0a = uStack_be0._6_2_ + uStack_bf0._6_2_;
      local_c08._2_2_ = (short)((uint)uVar12 >> 0x10);
      local_c08._4_2_ = (short)((uint6)uVar13 >> 0x20);
      local_c08._6_2_ = (short)((ulong)uVar14 >> 0x30);
      uStack_c00._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_c00._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_c00._6_2_ = (short)((ulong)uVar17 >> 0x30);
      local_c38 = CONCAT11(cStack_1d27,local_1d28) + local_c18;
      sStack_c36 = local_c08._2_2_ + sStack_c16;
      sStack_c34 = local_c08._4_2_ + sStack_c14;
      sStack_c32 = local_c08._6_2_ + sStack_c12;
      sStack_c30 = CONCAT11(cStack_1d1f,uStack_1d20) + sStack_c10;
      sStack_c2e = uStack_c00._2_2_ + sStack_c0e;
      sStack_c2c = uStack_c00._4_2_ + sStack_c0c;
      sStack_c2a = uStack_c00._6_2_ + sStack_c0a;
      sVar103 = sStack_1d70 + sStack_c30;
      sVar102 = sStack_1d6e + sStack_c2e;
      sVar128 = sStack_1d6c + sStack_c2c;
      sVar147 = sStack_1d6a + sStack_c2a;
      local_c48 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_c40 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_c58 = CONCAT26(sStack_1d72 + sStack_c32,
                           CONCAT24(sStack_1d74 + sStack_c34,
                                    CONCAT22(sStack_1d76 + sStack_c36,local_1d78 + local_c38)));
      uStack_c50 = CONCAT26(sVar147,CONCAT24(sVar128,CONCAT22(sVar102,sVar103)));
      local_1e28 = local_1ef8 + local_1d78 + local_c38;
      uStack_1e26 = sStack_1ef6 + sStack_1d76 + sStack_c36;
      uStack_1e24 = sStack_1ef4 + sStack_1d74 + sStack_c34;
      uStack_1e22 = sStack_1ef2 + sStack_1d72 + sStack_c32;
      sStack_1e20 = sStack_1ef0 + sVar103;
      sStack_1e1e = sStack_1eee + sVar102;
      sStack_1e1c = sStack_1eec + sVar128;
      sStack_1e1a = sStack_1eea + sVar147;
      local_c78 = CONCAT26(sVar147,CONCAT24(sVar128,CONCAT22(sVar102,sVar103)));
      local_c68 = local_1f28;
      uStack_c60 = uStack_1f20;
      uStack_c70 = 0;
      local_1e88 = (short)local_ba8 + sVar103;
      uStack_1e86 = local_ba8._2_2_ + sVar102;
      uStack_1e84 = local_ba8._4_2_ + sVar128;
      uStack_1e82 = local_ba8._6_2_ + sVar147;
      local_1848 = CONCAT26(uStack_1e22,CONCAT24(uStack_1e24,CONCAT22(uStack_1e26,local_1e28)));
      uStack_1840 = CONCAT26(sStack_1e1a,CONCAT24(sStack_1e1c,CONCAT22(sStack_1e1e,sStack_1e20)));
      local_1858 = CONCAT26(uStack_1e82,CONCAT24(uStack_1e84,CONCAT22(uStack_1e86,local_1e88)));
      uStack_1850 = CONCAT26(sStack_1e7a,CONCAT24(sStack_1e7c,CONCAT22(sStack_1e7e,sStack_1e80)));
      local_145c = 4;
      uVar106 = local_1e28 >> 4;
      uVar104 = uStack_1e26 >> 4;
      uVar105 = uStack_1e24 >> 4;
      uVar115 = uStack_1e22 >> 4;
      uVar116 = local_1e88 >> 4;
      uVar119 = uStack_1e86 >> 4;
      uVar120 = uStack_1e84 >> 4;
      uVar124 = uStack_1e82 >> 4;
      local_1b58._0_4_ = CONCAT22(uVar104,uVar106);
      local_1b58._0_6_ = CONCAT24(uVar105,(undefined4)local_1b58);
      local_1b58 = CONCAT26(uVar115,(undefined6)local_1b58);
      uStack_1b50._0_4_ = CONCAT22(uVar119,uVar116);
      uStack_1b50._0_6_ = CONCAT24(uVar120,(undefined4)uStack_1b50);
      uStack_1b50 = CONCAT26(uVar124,(undefined6)uStack_1b50);
      local_f8 = local_1b58;
      uStack_f0 = uStack_1b50;
      local_108 = local_1b58;
      uStack_100 = uStack_1b50;
      local_1b58._0_4_ =
           CONCAT13((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                    CONCAT12((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105),
                             CONCAT11((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      local_1b58._0_6_ =
           CONCAT15((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                    CONCAT14((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             (undefined4)local_1b58));
      local_1b58 = CONCAT17((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                            CONCAT16((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 -
                                     (0xff < uVar120),(undefined6)local_1b58));
      uStack_1b50._0_4_ =
           CONCAT13((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                    CONCAT12((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105),
                             CONCAT11((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      uStack_1b50._0_6_ =
           CONCAT15((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                    CONCAT14((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             (undefined4)uStack_1b50));
      uStack_1b50 = CONCAT17((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                             CONCAT16((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 -
                                      (0xff < uVar120),(undefined6)uStack_1b50));
      local_c88 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
      uStack_c80 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
      uVar4 = CONCAT13(cStack_1ce5,CONCAT12(uStack_1ce6,CONCAT11(cStack_1ce7,local_1ce8)));
      uVar5 = CONCAT15(cStack_1ce3,CONCAT14(uStack_1ce4,uVar4));
      uVar55 = CONCAT17(cStack_1ce1,CONCAT16(uStack_1ce2,uVar5));
      uVar9 = CONCAT13(cStack_1cdd,CONCAT12(uStack_1cde,CONCAT11(cStack_1cdf,uStack_1ce0)));
      uVar10 = CONCAT15(cStack_1cdb,CONCAT14(uStack_1cdc,uVar9));
      uVar62 = CONCAT17(cStack_1cd9,CONCAT16(uStack_1cda,uVar10));
      local_c98._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_c98._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_c98._6_2_ = (short)((ulong)uVar55 >> 0x30);
      uStack_c90._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_c90._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_c90._6_2_ = (short)((ulong)uVar62 >> 0x30);
      local_1d78 = local_1d78 + CONCAT11(cStack_1ce7,local_1ce8);
      sStack_1d76 = sStack_1d76 + local_c98._2_2_;
      sStack_1d74 = sStack_1d74 + local_c98._4_2_;
      sStack_1d72 = sStack_1d72 + local_c98._6_2_;
      sStack_1d70 = sStack_1d70 + CONCAT11(cStack_1cdf,uStack_1ce0);
      sStack_1d6e = sStack_1d6e + uStack_c90._2_2_;
      sStack_1d6c = sStack_1d6c + uStack_c90._4_2_;
      sStack_1d6a = sStack_1d6a + uStack_c90._6_2_;
      local_6e8 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_6e0 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_6f8 = local_1ca8;
      uVar95 = local_6f8;
      uStack_6f0 = uStack_1ca0;
      uVar96 = uStack_6f0;
      local_6f8._0_2_ = (short)local_1ca8;
      local_6f8._2_2_ = (short)((ulong)local_1ca8 >> 0x10);
      local_6f8._4_2_ = (short)((ulong)local_1ca8 >> 0x20);
      local_6f8._6_2_ = (short)((ulong)local_1ca8 >> 0x30);
      uStack_6f0._0_2_ = (short)uStack_1ca0;
      uStack_6f0._2_2_ = (short)((ulong)uStack_1ca0 >> 0x10);
      uStack_6f0._4_2_ = (short)((ulong)uStack_1ca0 >> 0x20);
      uStack_6f0._6_2_ = (short)((ulong)uStack_1ca0 >> 0x30);
      local_1ef8 = local_1ef8 - (short)local_6f8;
      sStack_1ef6 = sStack_1ef6 - local_6f8._2_2_;
      sStack_1ef4 = sStack_1ef4 - local_6f8._4_2_;
      sStack_1ef2 = sStack_1ef2 - local_6f8._6_2_;
      sStack_1ef0 = sStack_1ef0 - (short)uStack_6f0;
      sStack_1eee = sStack_1eee - uStack_6f0._2_2_;
      sStack_1eec = sStack_1eec - uStack_6f0._4_2_;
      sStack_1eea = sStack_1eea - uStack_6f0._6_2_;
      uVar4 = CONCAT13(cStack_1d15,CONCAT12(uStack_1d16,CONCAT11(cStack_1d17,local_1d18)));
      uVar5 = CONCAT15(cStack_1d13,CONCAT14(uStack_1d14,uVar4));
      uVar23 = CONCAT17(cStack_1d11,CONCAT16(uStack_1d12,uVar5));
      uVar9 = CONCAT13(cStack_1d0d,CONCAT12(uStack_1d0e,CONCAT11(cStack_1d0f,uStack_1d10)));
      uVar10 = CONCAT15(cStack_1d0b,CONCAT14(uStack_1d0c,uVar9));
      uVar31 = CONCAT17(cStack_1d09,CONCAT16(uStack_1d0a,uVar10));
      local_708 = local_1f28;
      uStack_700 = uStack_1f20;
      local_718._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_718._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_718._6_2_ = (short)((ulong)uVar23 >> 0x30);
      uStack_710._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_710._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_710._6_2_ = (short)((ulong)uVar31 >> 0x30);
      local_ba8._0_2_ = (short)local_ba8 - CONCAT11(cStack_1d17,local_1d18);
      local_ba8._2_2_ = local_ba8._2_2_ - local_718._2_2_;
      local_ba8._4_2_ = local_ba8._4_2_ - local_718._4_2_;
      local_ba8._6_2_ = local_ba8._6_2_ - local_718._6_2_;
      sStack_1e70 = sStack_1e80 - CONCAT11(cStack_1d0f,uStack_1d10);
      sStack_1e6e = sStack_1e7e - uStack_710._2_2_;
      sStack_1e6c = sStack_1e7c - uStack_710._4_2_;
      sStack_1e6a = sStack_1e7a - uStack_710._6_2_;
      local_1f28._0_4_ = CONCAT22(local_ba8._2_2_,(short)local_ba8);
      local_1f28._0_6_ = CONCAT24(local_ba8._4_2_,(undefined4)local_1f28);
      local_1f28 = CONCAT26(local_ba8._6_2_,(undefined6)local_1f28);
      uStack_1f20._0_4_ = CONCAT22(sStack_1e6e,sStack_1e70);
      uStack_1f20._0_6_ = CONCAT24(sStack_1e6c,(undefined4)uStack_1f20);
      uStack_1f20 = CONCAT26(sStack_1e6a,(undefined6)uStack_1f20);
      local_ce8 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
      uStack_ce0 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
      uVar4 = CONCAT13(cStack_1d25,CONCAT12(uStack_1d26,CONCAT11(cStack_1d27,local_1d28)));
      uVar5 = CONCAT15(cStack_1d23,CONCAT14(uStack_1d24,uVar4));
      uVar15 = CONCAT17(cStack_1d21,CONCAT16(uStack_1d22,uVar5));
      uVar9 = CONCAT13(cStack_1d1d,CONCAT12(uStack_1d1e,CONCAT11(cStack_1d1f,uStack_1d20)));
      uVar10 = CONCAT15(cStack_1d1b,CONCAT14(uStack_1d1c,uVar9));
      uVar20 = CONCAT17(cStack_1d19,CONCAT16(uStack_1d1a,uVar10));
      uVar12 = CONCAT13(cStack_1d15,CONCAT12(uStack_1d16,CONCAT11(cStack_1d17,local_1d18)));
      uVar13 = CONCAT15(cStack_1d13,CONCAT14(uStack_1d14,uVar12));
      uVar26 = CONCAT17(cStack_1d11,CONCAT16(uStack_1d12,uVar13));
      uVar18 = CONCAT13(cStack_1d0d,CONCAT12(uStack_1d0e,CONCAT11(cStack_1d0f,uStack_1d10)));
      uVar19 = CONCAT15(cStack_1d0b,CONCAT14(uStack_1d0c,uVar18));
      uVar32 = CONCAT17(cStack_1d09,CONCAT16(uStack_1d0a,uVar19));
      uVar24 = CONCAT13(cStack_1d05,CONCAT12(uStack_1d06,CONCAT11(cStack_1d07,local_1d08)));
      uVar25 = CONCAT15(cStack_1d03,CONCAT14(uStack_1d04,uVar24));
      uVar37 = CONCAT17(cStack_1d01,CONCAT16(uStack_1d02,uVar25));
      uVar27 = CONCAT13(cStack_1cfd,CONCAT12(uStack_1cfe,CONCAT11(cStack_1cff,uStack_1d00)));
      uVar28 = CONCAT15(cStack_1cfb,CONCAT14(uStack_1cfc,uVar27));
      uVar45 = CONCAT17(cStack_1cf9,CONCAT16(uStack_1cfa,uVar28));
      local_ca8._2_2_ = (short)((uint)uVar24 >> 0x10);
      local_ca8._4_2_ = (short)((uint6)uVar25 >> 0x20);
      local_ca8._6_2_ = (short)((ulong)uVar37 >> 0x30);
      uStack_ca0._2_2_ = (short)((uint)uVar27 >> 0x10);
      uStack_ca0._4_2_ = (short)((uint6)uVar28 >> 0x20);
      uStack_ca0._6_2_ = (short)((ulong)uVar45 >> 0x30);
      local_cb8._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_cb8._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_cb8._6_2_ = (short)((ulong)uVar15 >> 0x30);
      uStack_cb0._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_cb0._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_cb0._6_2_ = (short)((ulong)uVar20 >> 0x30);
      local_cd8 = CONCAT11(cStack_1d07,local_1d08) + CONCAT11(cStack_1d27,local_1d28);
      sStack_cd6 = local_ca8._2_2_ + local_cb8._2_2_;
      sStack_cd4 = local_ca8._4_2_ + local_cb8._4_2_;
      sStack_cd2 = local_ca8._6_2_ + local_cb8._6_2_;
      sStack_cd0 = CONCAT11(cStack_1cff,uStack_1d00) + CONCAT11(cStack_1d1f,uStack_1d20);
      sStack_cce = uStack_ca0._2_2_ + uStack_cb0._2_2_;
      sStack_ccc = uStack_ca0._4_2_ + uStack_cb0._4_2_;
      sStack_cca = uStack_ca0._6_2_ + uStack_cb0._6_2_;
      local_cc8._2_2_ = (short)((uint)uVar12 >> 0x10);
      local_cc8._4_2_ = (short)((uint6)uVar13 >> 0x20);
      local_cc8._6_2_ = (short)((ulong)uVar26 >> 0x30);
      uStack_cc0._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_cc0._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_cc0._6_2_ = (short)((ulong)uVar32 >> 0x30);
      local_cf8 = CONCAT11(cStack_1d17,local_1d18) + local_cd8;
      sStack_cf6 = local_cc8._2_2_ + sStack_cd6;
      sStack_cf4 = local_cc8._4_2_ + sStack_cd4;
      sStack_cf2 = local_cc8._6_2_ + sStack_cd2;
      sStack_cf0 = CONCAT11(cStack_1d0f,uStack_1d10) + sStack_cd0;
      sStack_cee = uStack_cc0._2_2_ + sStack_cce;
      sStack_cec = uStack_cc0._4_2_ + sStack_ccc;
      sStack_cea = uStack_cc0._6_2_ + sStack_cca;
      sVar103 = sStack_1d70 + sStack_cf0;
      sVar102 = sStack_1d6e + sStack_cee;
      sVar128 = sStack_1d6c + sStack_cec;
      sVar147 = sStack_1d6a + sStack_cea;
      local_d08 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_d00 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_d18 = CONCAT26(sStack_1d72 + sStack_cf2,
                           CONCAT24(sStack_1d74 + sStack_cf4,
                                    CONCAT22(sStack_1d76 + sStack_cf6,local_1d78 + local_cf8)));
      uStack_d10 = CONCAT26(sVar147,CONCAT24(sVar128,CONCAT22(sVar102,sVar103)));
      local_1e18 = local_1ef8 + local_1d78 + local_cf8;
      uStack_1e16 = sStack_1ef6 + sStack_1d76 + sStack_cf6;
      uStack_1e14 = sStack_1ef4 + sStack_1d74 + sStack_cf4;
      uStack_1e12 = sStack_1ef2 + sStack_1d72 + sStack_cf2;
      sStack_1e10 = sStack_1ef0 + sVar103;
      sStack_1e0e = sStack_1eee + sVar102;
      sStack_1e0c = sStack_1eec + sVar128;
      sStack_1e0a = sStack_1eea + sVar147;
      local_d38 = CONCAT26(sVar147,CONCAT24(sVar128,CONCAT22(sVar102,sVar103)));
      local_d28 = local_1f28;
      uStack_d20 = uStack_1f20;
      uStack_d30 = 0;
      local_1e78 = (short)local_ba8 + sVar103;
      uStack_1e76 = local_ba8._2_2_ + sVar102;
      uStack_1e74 = local_ba8._4_2_ + sVar128;
      uStack_1e72 = local_ba8._6_2_ + sVar147;
      local_1868 = CONCAT26(uStack_1e12,CONCAT24(uStack_1e14,CONCAT22(uStack_1e16,local_1e18)));
      uStack_1860 = CONCAT26(sStack_1e0a,CONCAT24(sStack_1e0c,CONCAT22(sStack_1e0e,sStack_1e10)));
      local_1878 = CONCAT26(uStack_1e72,CONCAT24(uStack_1e74,CONCAT22(uStack_1e76,local_1e78)));
      uStack_1870 = CONCAT26(sStack_1e6a,CONCAT24(sStack_1e6c,CONCAT22(sStack_1e6e,sStack_1e70)));
      local_147c = 4;
      uVar106 = local_1e18 >> 4;
      uVar104 = uStack_1e16 >> 4;
      uVar105 = uStack_1e14 >> 4;
      uVar115 = uStack_1e12 >> 4;
      uVar116 = local_1e78 >> 4;
      uVar119 = uStack_1e76 >> 4;
      uVar120 = uStack_1e74 >> 4;
      uVar124 = uStack_1e72 >> 4;
      local_1b48._0_4_ = CONCAT22(uVar104,uVar106);
      local_1b48._0_6_ = CONCAT24(uVar105,(undefined4)local_1b48);
      local_1b48 = CONCAT26(uVar115,(undefined6)local_1b48);
      uStack_1b40._0_4_ = CONCAT22(uVar119,uVar116);
      uStack_1b40._0_6_ = CONCAT24(uVar120,(undefined4)uStack_1b40);
      uStack_1b40 = CONCAT26(uVar124,(undefined6)uStack_1b40);
      local_118 = local_1b48;
      uStack_110 = uStack_1b40;
      local_128 = local_1b48;
      uStack_120 = uStack_1b40;
      local_1b48._0_4_ =
           CONCAT13((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                    CONCAT12((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105),
                             CONCAT11((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      local_1b48._0_6_ =
           CONCAT15((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                    CONCAT14((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             (undefined4)local_1b48));
      local_1b48 = CONCAT17((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                            CONCAT16((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 -
                                     (0xff < uVar120),(undefined6)local_1b48));
      uStack_1b40._0_4_ =
           CONCAT13((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                    CONCAT12((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105),
                             CONCAT11((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      uStack_1b40._0_6_ =
           CONCAT15((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                    CONCAT14((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             (undefined4)uStack_1b40));
      uStack_1b40 = CONCAT17((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                             CONCAT16((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 -
                                      (0xff < uVar120),(undefined6)uStack_1b40));
      local_d48 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
      uStack_d40 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
      uVar4 = CONCAT13(cStack_1ce5,CONCAT12(uStack_1ce6,CONCAT11(cStack_1ce7,local_1ce8)));
      uVar5 = CONCAT15(cStack_1ce3,CONCAT14(uStack_1ce4,uVar4));
      uVar56 = CONCAT17(cStack_1ce1,CONCAT16(uStack_1ce2,uVar5));
      uVar9 = CONCAT13(cStack_1cdd,CONCAT12(uStack_1cde,CONCAT11(cStack_1cdf,uStack_1ce0)));
      uVar10 = CONCAT15(cStack_1cdb,CONCAT14(uStack_1cdc,uVar9));
      uVar63 = CONCAT17(cStack_1cd9,CONCAT16(uStack_1cda,uVar10));
      local_d58._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_d58._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_d58._6_2_ = (short)((ulong)uVar56 >> 0x30);
      uStack_d50._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_d50._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_d50._6_2_ = (short)((ulong)uVar63 >> 0x30);
      local_1d78 = local_1d78 + CONCAT11(cStack_1ce7,local_1ce8);
      sStack_1d76 = sStack_1d76 + local_d58._2_2_;
      sStack_1d74 = sStack_1d74 + local_d58._4_2_;
      sStack_1d72 = sStack_1d72 + local_d58._6_2_;
      sStack_1d70 = sStack_1d70 + CONCAT11(cStack_1cdf,uStack_1ce0);
      sStack_1d6e = sStack_1d6e + uStack_d50._2_2_;
      sStack_1d6c = sStack_1d6c + uStack_d50._4_2_;
      sStack_1d6a = sStack_1d6a + uStack_d50._6_2_;
      local_728 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_720 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_738 = local_1cb8;
      uVar93 = local_738;
      uStack_730 = uStack_1cb0;
      uVar94 = uStack_730;
      local_738._0_2_ = (short)local_1cb8;
      local_738._2_2_ = (short)((ulong)local_1cb8 >> 0x10);
      local_738._4_2_ = (short)((ulong)local_1cb8 >> 0x20);
      local_738._6_2_ = (short)((ulong)local_1cb8 >> 0x30);
      uStack_730._0_2_ = (short)uStack_1cb0;
      uStack_730._2_2_ = (short)((ulong)uStack_1cb0 >> 0x10);
      uStack_730._4_2_ = (short)((ulong)uStack_1cb0 >> 0x20);
      uStack_730._6_2_ = (short)((ulong)uStack_1cb0 >> 0x30);
      local_1ef8 = local_1ef8 - (short)local_738;
      sStack_1ef6 = sStack_1ef6 - local_738._2_2_;
      sStack_1ef4 = sStack_1ef4 - local_738._4_2_;
      sStack_1ef2 = sStack_1ef2 - local_738._6_2_;
      sStack_1ef0 = sStack_1ef0 - (short)uStack_730;
      sStack_1eee = sStack_1eee - uStack_730._2_2_;
      sStack_1eec = sStack_1eec - uStack_730._4_2_;
      sStack_1eea = sStack_1eea - uStack_730._6_2_;
      uVar4 = CONCAT13(cStack_1d25,CONCAT12(uStack_1d26,CONCAT11(cStack_1d27,local_1d28)));
      uVar5 = CONCAT15(cStack_1d23,CONCAT14(uStack_1d24,uVar4));
      uVar16 = CONCAT17(cStack_1d21,CONCAT16(uStack_1d22,uVar5));
      uVar9 = CONCAT13(cStack_1d1d,CONCAT12(uStack_1d1e,CONCAT11(cStack_1d1f,uStack_1d20)));
      uVar10 = CONCAT15(cStack_1d1b,CONCAT14(uStack_1d1c,uVar9));
      uVar21 = CONCAT17(cStack_1d19,CONCAT16(uStack_1d1a,uVar10));
      local_748 = local_1f28;
      uStack_740 = uStack_1f20;
      local_758._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_758._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_758._6_2_ = (short)((ulong)uVar16 >> 0x30);
      uStack_750._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_750._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_750._6_2_ = (short)((ulong)uVar21 >> 0x30);
      local_ba8._0_2_ = (short)local_ba8 - CONCAT11(cStack_1d27,local_1d28);
      local_ba8._2_2_ = local_ba8._2_2_ - local_758._2_2_;
      local_ba8._4_2_ = local_ba8._4_2_ - local_758._4_2_;
      local_ba8._6_2_ = local_ba8._6_2_ - local_758._6_2_;
      sStack_1e60 = sStack_1e70 - CONCAT11(cStack_1d1f,uStack_1d20);
      sStack_1e5e = sStack_1e6e - uStack_750._2_2_;
      sStack_1e5c = sStack_1e6c - uStack_750._4_2_;
      sStack_1e5a = sStack_1e6a - uStack_750._6_2_;
      local_1f28._0_4_ = CONCAT22(local_ba8._2_2_,(short)local_ba8);
      local_1f28._0_6_ = CONCAT24(local_ba8._4_2_,(undefined4)local_1f28);
      local_1f28 = CONCAT26(local_ba8._6_2_,(undefined6)local_1f28);
      uStack_1f20._0_4_ = CONCAT22(sStack_1e5e,sStack_1e60);
      uStack_1f20._0_6_ = CONCAT24(sStack_1e5c,(undefined4)uStack_1f20);
      uStack_1f20 = CONCAT26(sStack_1e5a,(undefined6)uStack_1f20);
      local_da8 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
      uStack_da0 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
      uVar4 = CONCAT13(cStack_1d15,CONCAT12(uStack_1d16,CONCAT11(cStack_1d17,local_1d18)));
      uVar5 = CONCAT15(cStack_1d13,CONCAT14(uStack_1d14,uVar4));
      uVar29 = CONCAT17(cStack_1d11,CONCAT16(uStack_1d12,uVar5));
      uVar9 = CONCAT13(cStack_1d0d,CONCAT12(uStack_1d0e,CONCAT11(cStack_1d0f,uStack_1d10)));
      uVar10 = CONCAT15(cStack_1d0b,CONCAT14(uStack_1d0c,uVar9));
      uVar33 = CONCAT17(cStack_1d09,CONCAT16(uStack_1d0a,uVar10));
      uVar12 = CONCAT13(cStack_1d05,CONCAT12(uStack_1d06,CONCAT11(cStack_1d07,local_1d08)));
      uVar13 = CONCAT15(cStack_1d03,CONCAT14(uStack_1d04,uVar12));
      uVar38 = CONCAT17(cStack_1d01,CONCAT16(uStack_1d02,uVar13));
      uVar18 = CONCAT13(cStack_1cfd,CONCAT12(uStack_1cfe,CONCAT11(cStack_1cff,uStack_1d00)));
      uVar19 = CONCAT15(cStack_1cfb,CONCAT14(uStack_1cfc,uVar18));
      uVar46 = CONCAT17(cStack_1cf9,CONCAT16(uStack_1cfa,uVar19));
      uVar24 = CONCAT13(cStack_1cf5,CONCAT12(uStack_1cf6,CONCAT11(cStack_1cf7,local_1cf8)));
      uVar25 = CONCAT15(cStack_1cf3,CONCAT14(uStack_1cf4,uVar24));
      uVar48 = CONCAT17(cStack_1cf1,CONCAT16(uStack_1cf2,uVar25));
      uVar27 = CONCAT13(cStack_1ced,CONCAT12(uStack_1cee,CONCAT11(cStack_1cef,uStack_1cf0)));
      uVar28 = CONCAT15(cStack_1ceb,CONCAT14(uStack_1cec,uVar27));
      uVar52 = CONCAT17(cStack_1ce9,CONCAT16(uStack_1cea,uVar28));
      local_d68._2_2_ = (short)((uint)uVar24 >> 0x10);
      local_d68._4_2_ = (short)((uint6)uVar25 >> 0x20);
      local_d68._6_2_ = (short)((ulong)uVar48 >> 0x30);
      uStack_d60._2_2_ = (short)((uint)uVar27 >> 0x10);
      uStack_d60._4_2_ = (short)((uint6)uVar28 >> 0x20);
      uStack_d60._6_2_ = (short)((ulong)uVar52 >> 0x30);
      local_d78._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_d78._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_d78._6_2_ = (short)((ulong)uVar29 >> 0x30);
      uStack_d70._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_d70._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_d70._6_2_ = (short)((ulong)uVar33 >> 0x30);
      local_d98 = CONCAT11(cStack_1cf7,local_1cf8) + CONCAT11(cStack_1d17,local_1d18);
      sStack_d96 = local_d68._2_2_ + local_d78._2_2_;
      sStack_d94 = local_d68._4_2_ + local_d78._4_2_;
      sStack_d92 = local_d68._6_2_ + local_d78._6_2_;
      sStack_d90 = CONCAT11(cStack_1cef,uStack_1cf0) + CONCAT11(cStack_1d0f,uStack_1d10);
      sStack_d8e = uStack_d60._2_2_ + uStack_d70._2_2_;
      sStack_d8c = uStack_d60._4_2_ + uStack_d70._4_2_;
      sStack_d8a = uStack_d60._6_2_ + uStack_d70._6_2_;
      local_d88._2_2_ = (short)((uint)uVar12 >> 0x10);
      local_d88._4_2_ = (short)((uint6)uVar13 >> 0x20);
      local_d88._6_2_ = (short)((ulong)uVar38 >> 0x30);
      uStack_d80._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_d80._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_d80._6_2_ = (short)((ulong)uVar46 >> 0x30);
      local_db8 = CONCAT11(cStack_1d07,local_1d08) + local_d98;
      sStack_db6 = local_d88._2_2_ + sStack_d96;
      sStack_db4 = local_d88._4_2_ + sStack_d94;
      sStack_db2 = local_d88._6_2_ + sStack_d92;
      sStack_db0 = CONCAT11(cStack_1cff,uStack_1d00) + sStack_d90;
      sStack_dae = uStack_d80._2_2_ + sStack_d8e;
      sStack_dac = uStack_d80._4_2_ + sStack_d8c;
      sStack_daa = uStack_d80._6_2_ + sStack_d8a;
      sVar103 = sStack_1d70 + sStack_db0;
      sVar102 = sStack_1d6e + sStack_dae;
      sVar128 = sStack_1d6c + sStack_dac;
      sVar147 = sStack_1d6a + sStack_daa;
      local_dc8 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_dc0 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_dd8 = CONCAT26(sStack_1d72 + sStack_db2,
                           CONCAT24(sStack_1d74 + sStack_db4,
                                    CONCAT22(sStack_1d76 + sStack_db6,local_1d78 + local_db8)));
      uStack_dd0 = CONCAT26(sVar147,CONCAT24(sVar128,CONCAT22(sVar102,sVar103)));
      local_1e08 = local_1ef8 + local_1d78 + local_db8;
      uStack_1e06 = sStack_1ef6 + sStack_1d76 + sStack_db6;
      uStack_1e04 = sStack_1ef4 + sStack_1d74 + sStack_db4;
      uStack_1e02 = sStack_1ef2 + sStack_1d72 + sStack_db2;
      sStack_1e00 = sStack_1ef0 + sVar103;
      sStack_1dfe = sStack_1eee + sVar102;
      sStack_1dfc = sStack_1eec + sVar128;
      sStack_1dfa = sStack_1eea + sVar147;
      local_df8 = CONCAT26(sVar147,CONCAT24(sVar128,CONCAT22(sVar102,sVar103)));
      local_de8 = local_1f28;
      uStack_de0 = uStack_1f20;
      uStack_df0 = 0;
      local_1e68 = (short)local_ba8 + sVar103;
      uStack_1e66 = local_ba8._2_2_ + sVar102;
      uStack_1e64 = local_ba8._4_2_ + sVar128;
      uStack_1e62 = local_ba8._6_2_ + sVar147;
      local_1888 = CONCAT26(uStack_1e02,CONCAT24(uStack_1e04,CONCAT22(uStack_1e06,local_1e08)));
      uStack_1880 = CONCAT26(sStack_1dfa,CONCAT24(sStack_1dfc,CONCAT22(sStack_1dfe,sStack_1e00)));
      local_1898 = CONCAT26(uStack_1e62,CONCAT24(uStack_1e64,CONCAT22(uStack_1e66,local_1e68)));
      uStack_1890 = CONCAT26(sStack_1e5a,CONCAT24(sStack_1e5c,CONCAT22(sStack_1e5e,sStack_1e60)));
      local_149c = 4;
      uVar106 = local_1e08 >> 4;
      uVar104 = uStack_1e06 >> 4;
      uVar105 = uStack_1e04 >> 4;
      uVar115 = uStack_1e02 >> 4;
      uVar116 = local_1e68 >> 4;
      uVar119 = uStack_1e66 >> 4;
      uVar120 = uStack_1e64 >> 4;
      uVar124 = uStack_1e62 >> 4;
      local_1b38._0_4_ = CONCAT22(uVar104,uVar106);
      local_1b38._0_6_ = CONCAT24(uVar105,(undefined4)local_1b38);
      local_1b38 = CONCAT26(uVar115,(undefined6)local_1b38);
      uStack_1b30._0_4_ = CONCAT22(uVar119,uVar116);
      uStack_1b30._0_6_ = CONCAT24(uVar120,(undefined4)uStack_1b30);
      uStack_1b30 = CONCAT26(uVar124,(undefined6)uStack_1b30);
      local_138 = local_1b38;
      uStack_130 = uStack_1b30;
      local_148 = local_1b38;
      uStack_140 = uStack_1b30;
      local_1b38._0_4_ =
           CONCAT13((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                    CONCAT12((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105),
                             CONCAT11((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      local_1b38._0_6_ =
           CONCAT15((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                    CONCAT14((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             (undefined4)local_1b38));
      local_1b38 = CONCAT17((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                            CONCAT16((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 -
                                     (0xff < uVar120),(undefined6)local_1b38));
      uStack_1b30._0_4_ =
           CONCAT13((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                    CONCAT12((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105),
                             CONCAT11((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      uStack_1b30._0_6_ =
           CONCAT15((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                    CONCAT14((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             (undefined4)uStack_1b30));
      uStack_1b30 = CONCAT17((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                             CONCAT16((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 -
                                      (0xff < uVar120),(undefined6)uStack_1b30));
      local_e08 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
      uStack_e00 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
      uVar4 = CONCAT13(cStack_1ce5,CONCAT12(uStack_1ce6,CONCAT11(cStack_1ce7,local_1ce8)));
      uVar5 = CONCAT15(cStack_1ce3,CONCAT14(uStack_1ce4,uVar4));
      uVar57 = CONCAT17(cStack_1ce1,CONCAT16(uStack_1ce2,uVar5));
      uVar9 = CONCAT13(cStack_1cdd,CONCAT12(uStack_1cde,CONCAT11(cStack_1cdf,uStack_1ce0)));
      uVar10 = CONCAT15(cStack_1cdb,CONCAT14(uStack_1cdc,uVar9));
      uVar64 = CONCAT17(cStack_1cd9,CONCAT16(uStack_1cda,uVar10));
      local_e18._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_e18._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_e18._6_2_ = (short)((ulong)uVar57 >> 0x30);
      uStack_e10._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_e10._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_e10._6_2_ = (short)((ulong)uVar64 >> 0x30);
      local_1d78 = local_1d78 + CONCAT11(cStack_1ce7,local_1ce8);
      sStack_1d76 = sStack_1d76 + local_e18._2_2_;
      sStack_1d74 = sStack_1d74 + local_e18._4_2_;
      sStack_1d72 = sStack_1d72 + local_e18._6_2_;
      sStack_1d70 = sStack_1d70 + CONCAT11(cStack_1cdf,uStack_1ce0);
      sStack_1d6e = sStack_1d6e + uStack_e10._2_2_;
      sStack_1d6c = sStack_1d6c + uStack_e10._4_2_;
      sStack_1d6a = sStack_1d6a + uStack_e10._6_2_;
      local_768 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_760 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_778 = local_1cc8;
      uVar91 = local_778;
      uStack_770 = uStack_1cc0;
      uVar92 = uStack_770;
      local_778._0_2_ = (short)local_1cc8;
      local_778._2_2_ = (short)((ulong)local_1cc8 >> 0x10);
      local_778._4_2_ = (short)((ulong)local_1cc8 >> 0x20);
      local_778._6_2_ = (short)((ulong)local_1cc8 >> 0x30);
      uStack_770._0_2_ = (short)uStack_1cc0;
      uStack_770._2_2_ = (short)((ulong)uStack_1cc0 >> 0x10);
      uStack_770._4_2_ = (short)((ulong)uStack_1cc0 >> 0x20);
      uStack_770._6_2_ = (short)((ulong)uStack_1cc0 >> 0x30);
      local_1ef8 = local_1ef8 - (short)local_778;
      sStack_1ef6 = sStack_1ef6 - local_778._2_2_;
      sStack_1ef4 = sStack_1ef4 - local_778._4_2_;
      sStack_1ef2 = sStack_1ef2 - local_778._6_2_;
      sStack_1ef0 = sStack_1ef0 - (short)uStack_770;
      sStack_1eee = sStack_1eee - uStack_770._2_2_;
      sStack_1eec = sStack_1eec - uStack_770._4_2_;
      sStack_1eea = sStack_1eea - uStack_770._6_2_;
      uVar4 = CONCAT13(cStack_1d35,CONCAT12(uStack_1d36,CONCAT11(cStack_1d37,local_1d38)));
      uVar5 = CONCAT15(cStack_1d33,CONCAT14(uStack_1d34,uVar4));
      uVar7 = CONCAT17(cStack_1d31,CONCAT16(uStack_1d32,uVar5));
      uVar9 = CONCAT13(cStack_1d2d,CONCAT12(uStack_1d2e,CONCAT11(cStack_1d2f,uStack_1d30)));
      uVar10 = CONCAT15(cStack_1d2b,CONCAT14(uStack_1d2c,uVar9));
      uVar11 = CONCAT17(cStack_1d29,CONCAT16(uStack_1d2a,uVar10));
      local_788 = local_1f28;
      uStack_780 = uStack_1f20;
      local_798._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_798._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_798._6_2_ = (short)((ulong)uVar7 >> 0x30);
      uStack_790._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_790._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_790._6_2_ = (short)((ulong)uVar11 >> 0x30);
      local_ba8._0_2_ = (short)local_ba8 - CONCAT11(cStack_1d37,local_1d38);
      sStack_1e50 = sStack_1e60 - CONCAT11(cStack_1d2f,uStack_1d30);
      sStack_1e4e = sStack_1e5e - uStack_790._2_2_;
      sStack_1e4c = sStack_1e5c - uStack_790._4_2_;
      sStack_1e4a = sStack_1e5a - uStack_790._6_2_;
      local_1f28._0_4_ = CONCAT22(local_ba8._2_2_ - local_798._2_2_,(short)local_ba8);
      local_1f28._0_6_ = CONCAT24(local_ba8._4_2_ - local_798._4_2_,(undefined4)local_1f28);
      local_1f28 = CONCAT26(local_ba8._6_2_ - local_798._6_2_,(undefined6)local_1f28);
      uStack_1f20._0_4_ = CONCAT22(sStack_1e4e,sStack_1e50);
      uStack_1f20._0_6_ = CONCAT24(sStack_1e4c,(undefined4)uStack_1f20);
      uStack_1f20 = CONCAT26(sStack_1e4a,(undefined6)uStack_1f20);
      local_e68 = CONCAT26(sStack_1d72,CONCAT24(sStack_1d74,CONCAT22(sStack_1d76,local_1d78)));
      uStack_e60 = CONCAT26(sStack_1d6a,CONCAT24(sStack_1d6c,CONCAT22(sStack_1d6e,sStack_1d70)));
      uVar4 = CONCAT13(cStack_1d05,CONCAT12(uStack_1d06,CONCAT11(cStack_1d07,local_1d08)));
      uVar5 = CONCAT15(cStack_1d03,CONCAT14(uStack_1d04,uVar4));
      uVar41 = CONCAT17(cStack_1d01,CONCAT16(uStack_1d02,uVar5));
      uVar9 = CONCAT13(cStack_1cfd,CONCAT12(uStack_1cfe,CONCAT11(cStack_1cff,uStack_1d00)));
      uVar10 = CONCAT15(cStack_1cfb,CONCAT14(uStack_1cfc,uVar9));
      uVar47 = CONCAT17(cStack_1cf9,CONCAT16(uStack_1cfa,uVar10));
      uVar12 = CONCAT13(cStack_1cf5,CONCAT12(uStack_1cf6,CONCAT11(cStack_1cf7,local_1cf8)));
      uVar13 = CONCAT15(cStack_1cf3,CONCAT14(uStack_1cf4,uVar12));
      uVar49 = CONCAT17(cStack_1cf1,CONCAT16(uStack_1cf2,uVar13));
      uVar18 = CONCAT13(cStack_1ced,CONCAT12(uStack_1cee,CONCAT11(cStack_1cef,uStack_1cf0)));
      uVar19 = CONCAT15(cStack_1ceb,CONCAT14(uStack_1cec,uVar18));
      uVar53 = CONCAT17(cStack_1ce9,CONCAT16(uStack_1cea,uVar19));
      uVar24 = CONCAT13(cStack_1ce5,CONCAT12(uStack_1ce6,CONCAT11(cStack_1ce7,local_1ce8)));
      uVar25 = CONCAT15(cStack_1ce3,CONCAT14(uStack_1ce4,uVar24));
      uVar58 = CONCAT17(cStack_1ce1,CONCAT16(uStack_1ce2,uVar25));
      uVar27 = CONCAT13(cStack_1cdd,CONCAT12(uStack_1cde,CONCAT11(cStack_1cdf,uStack_1ce0)));
      uVar28 = CONCAT15(cStack_1cdb,CONCAT14(uStack_1cdc,uVar27));
      uVar65 = CONCAT17(cStack_1cd9,CONCAT16(uStack_1cda,uVar28));
      local_e28._2_2_ = (short)((uint)uVar24 >> 0x10);
      local_e28._4_2_ = (short)((uint6)uVar25 >> 0x20);
      local_e28._6_2_ = (short)((ulong)uVar58 >> 0x30);
      uStack_e20._2_2_ = (short)((uint)uVar27 >> 0x10);
      uStack_e20._4_2_ = (short)((uint6)uVar28 >> 0x20);
      uStack_e20._6_2_ = (short)((ulong)uVar65 >> 0x30);
      local_e38._2_2_ = (short)((uint)uVar4 >> 0x10);
      local_e38._4_2_ = (short)((uint6)uVar5 >> 0x20);
      local_e38._6_2_ = (short)((ulong)uVar41 >> 0x30);
      uStack_e30._2_2_ = (short)((uint)uVar9 >> 0x10);
      uStack_e30._4_2_ = (short)((uint6)uVar10 >> 0x20);
      uStack_e30._6_2_ = (short)((ulong)uVar47 >> 0x30);
      local_e58 = CONCAT11(cStack_1ce7,local_1ce8) + CONCAT11(cStack_1d07,local_1d08);
      sStack_e56 = local_e28._2_2_ + local_e38._2_2_;
      sStack_e54 = local_e28._4_2_ + local_e38._4_2_;
      sStack_e52 = local_e28._6_2_ + local_e38._6_2_;
      sStack_e50 = CONCAT11(cStack_1cdf,uStack_1ce0) + CONCAT11(cStack_1cff,uStack_1d00);
      sStack_e4e = uStack_e20._2_2_ + uStack_e30._2_2_;
      sStack_e4c = uStack_e20._4_2_ + uStack_e30._4_2_;
      sStack_e4a = uStack_e20._6_2_ + uStack_e30._6_2_;
      local_e48._2_2_ = (short)((uint)uVar12 >> 0x10);
      local_e48._4_2_ = (short)((uint6)uVar13 >> 0x20);
      local_e48._6_2_ = (short)((ulong)uVar49 >> 0x30);
      uStack_e40._2_2_ = (short)((uint)uVar18 >> 0x10);
      uStack_e40._4_2_ = (short)((uint6)uVar19 >> 0x20);
      uStack_e40._6_2_ = (short)((ulong)uVar53 >> 0x30);
      local_e78 = CONCAT11(cStack_1cf7,local_1cf8) + local_e58;
      sStack_e76 = local_e48._2_2_ + sStack_e56;
      sStack_e74 = local_e48._4_2_ + sStack_e54;
      sStack_e72 = local_e48._6_2_ + sStack_e52;
      sStack_e70 = CONCAT11(cStack_1cef,uStack_1cf0) + sStack_e50;
      sStack_e6e = uStack_e40._2_2_ + sStack_e4e;
      sStack_e6c = uStack_e40._4_2_ + sStack_e4c;
      sStack_e6a = uStack_e40._6_2_ + sStack_e4a;
      local_1eb8 = local_1d78 + local_e78;
      sStack_1eb6 = sStack_1d76 + sStack_e76;
      sStack_1eb4 = sStack_1d74 + sStack_e74;
      sStack_1eb2 = sStack_1d72 + sStack_e72;
      sStack_1eb0 = sStack_1d70 + sStack_e70;
      sStack_1eae = sStack_1d6e + sStack_e6e;
      sStack_1eac = sStack_1d6c + sStack_e6c;
      sStack_1eaa = sStack_1d6a + sStack_e6a;
      local_e88 = CONCAT26(sStack_1ef2,CONCAT24(sStack_1ef4,CONCAT22(sStack_1ef6,local_1ef8)));
      uStack_e80 = CONCAT26(sStack_1eea,CONCAT24(sStack_1eec,CONCAT22(sStack_1eee,sStack_1ef0)));
      local_e98 = CONCAT26(sStack_1eb2,CONCAT24(sStack_1eb4,CONCAT22(sStack_1eb6,local_1eb8)));
      uStack_e90 = CONCAT26(sStack_1eaa,CONCAT24(sStack_1eac,CONCAT22(sStack_1eae,sStack_1eb0)));
      local_1df8 = local_1ef8 + local_1eb8;
      uStack_1df6 = sStack_1ef6 + sStack_1eb6;
      uStack_1df4 = sStack_1ef4 + sStack_1eb4;
      uStack_1df2 = sStack_1ef2 + sStack_1eb2;
      sStack_1df0 = sStack_1ef0 + sStack_1eb0;
      sStack_1dee = sStack_1eee + sStack_1eae;
      sStack_1dec = sStack_1eec + sStack_1eac;
      sStack_1dea = sStack_1eea + sStack_1eaa;
      local_eb8 = CONCAT26(sStack_1eaa,CONCAT24(sStack_1eac,CONCAT22(sStack_1eae,sStack_1eb0)));
      local_ea8 = local_1f28;
      uStack_ea0 = uStack_1f20;
      uStack_eb0 = 0;
      local_1e58 = (short)local_ba8 + sStack_1eb0;
      uStack_1e56 = (local_ba8._2_2_ - local_798._2_2_) + sStack_1eae;
      uStack_1e54 = (local_ba8._4_2_ - local_798._4_2_) + sStack_1eac;
      uStack_1e52 = (local_ba8._6_2_ - local_798._6_2_) + sStack_1eaa;
      local_18a8 = CONCAT26(uStack_1df2,CONCAT24(uStack_1df4,CONCAT22(uStack_1df6,local_1df8)));
      uStack_18a0 = CONCAT26(sStack_1dea,CONCAT24(sStack_1dec,CONCAT22(sStack_1dee,sStack_1df0)));
      local_18b8 = CONCAT26(uStack_1e52,CONCAT24(uStack_1e54,CONCAT22(uStack_1e56,local_1e58)));
      uStack_18b0 = CONCAT26(sStack_1e4a,CONCAT24(sStack_1e4c,CONCAT22(sStack_1e4e,sStack_1e50)));
      local_14bc = 4;
      uVar106 = local_1df8 >> 4;
      uVar104 = uStack_1df6 >> 4;
      uVar105 = uStack_1df4 >> 4;
      uVar115 = uStack_1df2 >> 4;
      uVar116 = local_1e58 >> 4;
      uVar119 = uStack_1e56 >> 4;
      uVar120 = uStack_1e54 >> 4;
      uVar124 = uStack_1e52 >> 4;
      local_1b28._0_4_ = CONCAT22(uVar104,uVar106);
      local_1b28._0_6_ = CONCAT24(uVar105,(undefined4)local_1b28);
      local_1b28 = CONCAT26(uVar115,(undefined6)local_1b28);
      uStack_1b20._0_4_ = CONCAT22(uVar119,uVar116);
      uStack_1b20._0_6_ = CONCAT24(uVar120,(undefined4)uStack_1b20);
      uStack_1b20 = CONCAT26(uVar124,(undefined6)uStack_1b20);
      local_158 = local_1b28;
      uStack_150 = uStack_1b20;
      local_168 = local_1b28;
      uStack_160 = uStack_1b20;
      local_1b28._0_4_ =
           CONCAT13((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                    CONCAT12((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105),
                             CONCAT11((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      local_1b28._0_6_ =
           CONCAT15((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                    CONCAT14((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             (undefined4)local_1b28));
      local_1b28 = CONCAT17((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                            CONCAT16((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 -
                                     (0xff < uVar120),(undefined6)local_1b28));
      uStack_1b20._0_4_ =
           CONCAT13((uVar115 != 0) * (uVar115 < 0x100) * (char)uVar115 - (0xff < uVar115),
                    CONCAT12((uVar105 != 0) * (uVar105 < 0x100) * (char)uVar105 - (0xff < uVar105),
                             CONCAT11((uVar104 != 0) * (uVar104 < 0x100) * (char)uVar104 -
                                      (0xff < uVar104),
                                      (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 -
                                      (0xff < uVar106))));
      uStack_1b20._0_6_ =
           CONCAT15((uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119),
                    CONCAT14((uVar116 != 0) * (uVar116 < 0x100) * (char)uVar116 - (0xff < uVar116),
                             (undefined4)uStack_1b20));
      uStack_1b20 = CONCAT17((uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124),
                             CONCAT16((uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 -
                                      (0xff < uVar120),(undefined6)uStack_1b20));
      local_f48 = *local_1aa0;
      uStack_f40 = local_1aa0[1];
      local_f38 = local_1b18._0_8_;
      uStack_f30 = local_1b18._8_8_;
      uVar99 = ~local_1b18._8_8_ & uStack_f40;
      local_14b8 = local_18a8;
      uStack_14b0 = local_18b8;
      local_1498 = local_1888;
      uStack_1490 = local_1898;
      local_1478 = local_1868;
      uStack_1470 = local_1878;
      local_1458 = local_1848;
      uStack_1450 = local_1858;
      local_1438 = local_1828;
      uStack_1430 = local_1838;
      local_1418 = local_1808;
      uStack_1410 = local_1818;
      local_e48 = uVar49;
      uStack_e40 = uVar53;
      local_e38 = uVar41;
      uStack_e30 = uVar47;
      local_e28 = uVar58;
      uStack_e20 = uVar65;
      local_e18 = uVar57;
      uStack_e10 = uVar64;
      local_d88 = uVar38;
      uStack_d80 = uVar46;
      local_d78 = uVar29;
      uStack_d70 = uVar33;
      local_d68 = uVar48;
      uStack_d60 = uVar52;
      local_d58 = uVar56;
      uStack_d50 = uVar63;
      local_cc8 = uVar26;
      uStack_cc0 = uVar32;
      local_cb8 = uVar15;
      uStack_cb0 = uVar20;
      local_ca8 = uVar37;
      uStack_ca0 = uVar45;
      local_c98 = uVar55;
      uStack_c90 = uVar62;
      local_c08 = uVar14;
      uStack_c00 = uVar17;
      local_bf8 = uVar6;
      uStack_bf0 = uVar8;
      local_be8 = uVar22;
      uStack_be0 = uVar30;
      local_bd8 = uVar54;
      uStack_bd0 = uVar61;
      local_ba8 = uVar87;
      uStack_ba0 = uVar88;
      local_b58 = uVar2;
      uStack_b50 = uVar3;
      local_b18 = uVar89;
      uStack_b10 = uVar90;
      local_798 = uVar7;
      uStack_790 = uVar11;
      local_778 = uVar91;
      uStack_770 = uVar92;
      local_758 = uVar16;
      uStack_750 = uVar21;
      local_738 = uVar93;
      uStack_730 = uVar94;
      local_718 = uVar23;
      uStack_710 = uVar31;
      local_6f8 = uVar95;
      uStack_6f0 = uVar96;
      local_6d8 = uVar36;
      uStack_6d0 = uVar44;
      local_6b8 = uVar97;
      uStack_6b0 = uVar98;
      *local_1aa0 = ~local_1b18._0_8_ & local_f48;
      puVar86[1] = uVar99;
      puVar86 = local_1aa0;
      local_12d8 = local_1b18._0_8_;
      uStack_12d0 = local_1b18._8_8_;
      local_12e8 = local_1b78;
      uStack_12e0 = uStack_1b70;
      local_1b78 = local_1b18._0_8_ & local_1b78;
      uStack_1b70 = local_1b18._8_8_ & uStack_1b70;
      local_1058 = *local_1aa0;
      uStack_1050 = local_1aa0[1];
      uVar99 = uStack_1050 | uStack_1b70;
      local_1068 = local_1b78;
      uStack_1060 = uStack_1b70;
      *local_1aa0 = local_1058 | local_1b78;
      puVar86[1] = uVar99;
      puVar86 = local_1a98;
      local_f68 = *local_1a98;
      uStack_f60 = local_1a98[1];
      local_f58 = local_1b18._0_8_;
      uStack_f50 = local_1b18._8_8_;
      uVar99 = ~local_1b18._8_8_ & uStack_f60;
      *local_1a98 = ~local_1b18._0_8_ & local_f68;
      puVar86[1] = uVar99;
      puVar86 = local_1a98;
      local_12f8 = local_1b18._0_8_;
      uStack_12f0 = local_1b18._8_8_;
      local_1308 = local_1b68;
      uStack_1300 = uStack_1b60;
      local_1b68 = local_1b18._0_8_ & local_1b68;
      uStack_1b60 = local_1b18._8_8_ & uStack_1b60;
      local_1078 = *local_1a98;
      uStack_1070 = local_1a98[1];
      uVar99 = uStack_1070 | uStack_1b60;
      local_1088 = local_1b68;
      uStack_1080 = uStack_1b60;
      *local_1a98 = local_1078 | local_1b68;
      puVar86[1] = uVar99;
      puVar86 = local_1a90;
      local_f88 = *local_1a90;
      uStack_f80 = local_1a90[1];
      local_f78 = local_1b18._0_8_;
      uStack_f70 = local_1b18._8_8_;
      uVar99 = ~local_1b18._8_8_ & uStack_f80;
      *local_1a90 = ~local_1b18._0_8_ & local_f88;
      puVar86[1] = uVar99;
      puVar86 = local_1a90;
      local_1318 = local_1b18._0_8_;
      uStack_1310 = local_1b18._8_8_;
      local_1328 = local_1b58;
      uStack_1320 = uStack_1b50;
      local_1b58 = local_1b18._0_8_ & local_1b58;
      uStack_1b50 = local_1b18._8_8_ & uStack_1b50;
      local_1098 = *local_1a90;
      uStack_1090 = local_1a90[1];
      uVar99 = uStack_1090 | uStack_1b50;
      local_10a8 = local_1b58;
      uStack_10a0 = uStack_1b50;
      *local_1a90 = local_1098 | local_1b58;
      puVar86[1] = uVar99;
      puVar86 = local_1a88;
      local_fa8 = *local_1a88;
      uStack_fa0 = local_1a88[1];
      local_f98 = local_1b18._0_8_;
      uStack_f90 = local_1b18._8_8_;
      uVar99 = ~local_1b18._8_8_ & uStack_fa0;
      *local_1a88 = ~local_1b18._0_8_ & local_fa8;
      puVar86[1] = uVar99;
      puVar86 = local_1a88;
      local_1338 = local_1b18._0_8_;
      uStack_1330 = local_1b18._8_8_;
      local_1348 = local_1b48;
      uStack_1340 = uStack_1b40;
      local_1b48 = local_1b18._0_8_ & local_1b48;
      uStack_1b40 = local_1b18._8_8_ & uStack_1b40;
      local_10b8 = *local_1a88;
      uStack_10b0 = local_1a88[1];
      uVar99 = uStack_10b0 | uStack_1b40;
      local_10c8 = local_1b48;
      uStack_10c0 = uStack_1b40;
      *local_1a88 = local_10b8 | local_1b48;
      puVar86[1] = uVar99;
      puVar86 = local_1a80;
      local_fc8 = *local_1a80;
      uStack_fc0 = local_1a80[1];
      local_fb8 = local_1b18._0_8_;
      uStack_fb0 = local_1b18._8_8_;
      uVar99 = ~local_1b18._8_8_ & uStack_fc0;
      *local_1a80 = ~local_1b18._0_8_ & local_fc8;
      puVar86[1] = uVar99;
      puVar86 = local_1a80;
      local_1358 = local_1b18._0_8_;
      uStack_1350 = local_1b18._8_8_;
      local_1368 = local_1b38;
      uStack_1360 = uStack_1b30;
      local_1b38 = local_1b18._0_8_ & local_1b38;
      uStack_1b30 = local_1b18._8_8_ & uStack_1b30;
      local_10d8 = *local_1a80;
      uStack_10d0 = local_1a80[1];
      uVar99 = uStack_10d0 | uStack_1b30;
      local_10e8 = local_1b38;
      uStack_10e0 = uStack_1b30;
      *local_1a80 = local_10d8 | local_1b38;
      puVar86[1] = uVar99;
      puVar86 = local_1a78;
      uVar99 = *local_1a78;
      uVar108 = local_1a78[1];
      local_fd8 = local_1b18._0_8_;
      uVar2 = local_fd8;
      uStack_fd0 = local_1b18._8_8_;
      uVar3 = uStack_fd0;
      local_fd8._0_4_ = local_1b18._0_4_;
      local_fd8._4_4_ = local_1b18._4_4_;
      uStack_fd0._0_4_ = local_1b18._8_4_;
      uStack_fd0._4_4_ = local_1b18._12_4_;
      local_fe8._0_4_ = (uint)uVar99;
      local_fe8._4_4_ = (uint)(uVar99 >> 0x20);
      uStack_fe0._0_4_ = (uint)uVar108;
      uStack_fe0._4_4_ = (uint)(uVar108 >> 0x20);
      uVar107 = ((uint)local_fd8 ^ 0xffffffff) & (uint)local_fe8;
      uVar121 = (local_fd8._4_4_ ^ 0xffffffff) & local_fe8._4_4_;
      uVar131 = ((uint)uStack_fd0 ^ 0xffffffff) & (uint)uStack_fe0;
      uVar142 = (uStack_fd0._4_4_ ^ 0xffffffff) & uStack_fe0._4_4_;
      local_fe8 = uVar99;
      uStack_fe0 = uVar108;
      local_fd8 = uVar2;
      uStack_fd0 = uVar3;
      *(uint *)local_1a78 = uVar107;
      *(uint *)((long)puVar86 + 4) = uVar121;
      *(uint *)(puVar86 + 1) = uVar131;
      *(uint *)((long)puVar86 + 0xc) = uVar142;
      puVar86 = local_1a78;
      local_1378 = local_1b18._0_8_;
      uStack_1370 = local_1b18._8_8_;
      local_1388 = local_1b28;
      uStack_1380 = uStack_1b20;
      local_1b28 = local_1b18._0_8_ & local_1b28;
      uStack_1b20 = local_1b18._8_8_ & uStack_1b20;
      local_10f8 = *local_1a78;
      uStack_10f0 = local_1a78[1];
      uVar99 = uStack_10f0 | uStack_1b20;
      local_1108 = local_1b28;
      uStack_1100 = uStack_1b20;
      *local_1a78 = local_10f8 | local_1b28;
      puVar86[1] = uVar99;
    }
  }
  x[0]._4_2_ = in_stack_ffffffffffffde44;
  x[0]._0_4_ = in_stack_ffffffffffffde40;
  x[0]._6_2_ = in_stack_ffffffffffffde46;
  x[1] = in_stack_ffffffffffffde48;
  store_buffer_horz_8(x,in_stack_ffffffffffffde3c,in_stack_ffffffffffffde38,(uint8_t *)0x3c086a);
  x_00[0]._4_2_ = in_stack_ffffffffffffde44;
  x_00[0]._0_4_ = in_stack_ffffffffffffde40;
  x_00[0]._6_2_ = in_stack_ffffffffffffde46;
  x_00[1] = in_stack_ffffffffffffde48;
  store_buffer_horz_8(x_00,in_stack_ffffffffffffde3c,in_stack_ffffffffffffde38,(uint8_t *)0x3c088c);
  x_01[0]._4_2_ = in_stack_ffffffffffffde44;
  x_01[0]._0_4_ = in_stack_ffffffffffffde40;
  x_01[0]._6_2_ = in_stack_ffffffffffffde46;
  x_01[1] = in_stack_ffffffffffffde48;
  store_buffer_horz_8(x_01,in_stack_ffffffffffffde3c,in_stack_ffffffffffffde38,(uint8_t *)0x3c08ae);
  x_02[0]._4_2_ = in_stack_ffffffffffffde44;
  x_02[0]._0_4_ = in_stack_ffffffffffffde40;
  x_02[0]._6_2_ = in_stack_ffffffffffffde46;
  x_02[1] = in_stack_ffffffffffffde48;
  store_buffer_horz_8(x_02,in_stack_ffffffffffffde3c,in_stack_ffffffffffffde38,(uint8_t *)0x3c08d0);
  x_03[0]._4_2_ = in_stack_ffffffffffffde44;
  x_03[0]._0_4_ = in_stack_ffffffffffffde40;
  x_03[0]._6_2_ = in_stack_ffffffffffffde46;
  x_03[1] = in_stack_ffffffffffffde48;
  store_buffer_horz_8(x_03,in_stack_ffffffffffffde3c,in_stack_ffffffffffffde38,(uint8_t *)0x3c08f2);
  x_04[0]._4_2_ = in_stack_ffffffffffffde44;
  x_04[0]._0_4_ = in_stack_ffffffffffffde40;
  x_04[0]._6_2_ = in_stack_ffffffffffffde46;
  x_04[1] = in_stack_ffffffffffffde48;
  store_buffer_horz_8(x_04,in_stack_ffffffffffffde3c,in_stack_ffffffffffffde38,(uint8_t *)0x3c0914);
  return;
}

Assistant:

void aom_lpf_horizontal_14_sse2(unsigned char *s, int p,
                                const unsigned char *_blimit,
                                const unsigned char *_limit,
                                const unsigned char *_thresh) {
  __m128i q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i blimit = _mm_load_si128((const __m128i *)_blimit);
  __m128i limit = _mm_load_si128((const __m128i *)_limit);
  __m128i thresh = _mm_load_si128((const __m128i *)_thresh);

  q4p4 = _mm_unpacklo_epi32(xx_loadl_32(s - 5 * p), xx_loadl_32(s + 4 * p));
  q3p3 = _mm_unpacklo_epi32(xx_loadl_32(s - 4 * p), xx_loadl_32(s + 3 * p));
  q2p2 = _mm_unpacklo_epi32(xx_loadl_32(s - 3 * p), xx_loadl_32(s + 2 * p));
  q1p1 = _mm_unpacklo_epi32(xx_loadl_32(s - 2 * p), xx_loadl_32(s + 1 * p));

  q0p0 = _mm_unpacklo_epi32(xx_loadl_32(s - 1 * p), xx_loadl_32(s - 0 * p));

  q5p5 = _mm_unpacklo_epi32(xx_loadl_32(s - 6 * p), xx_loadl_32(s + 5 * p));

  q6p6 = _mm_unpacklo_epi32(xx_loadl_32(s - 7 * p), xx_loadl_32(s + 6 * p));

  lpf_internal_14_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0, &blimit,
                       &limit, &thresh);

  store_buffer_horz_8(q0p0, p, 0, s);
  store_buffer_horz_8(q1p1, p, 1, s);
  store_buffer_horz_8(q2p2, p, 2, s);
  store_buffer_horz_8(q3p3, p, 3, s);
  store_buffer_horz_8(q4p4, p, 4, s);
  store_buffer_horz_8(q5p5, p, 5, s);
}